

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O2

void embree::avx::CurveNiIntersectorK<8,8>::
     intersect_t<embree::avx::SweepCurve1IntersectorK<embree::CatmullRomCurveT,8>,embree::avx::Intersect1KEpilog1<8,true>>
               (Precalculations *pre,RayHitK<8> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  undefined4 uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  Primitive PVar5;
  Geometry *pGVar6;
  RTCFilterFunctionN p_Var7;
  long lVar8;
  RTCRayQueryContext *pRVar9;
  long lVar10;
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [16];
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  uint uVar92;
  uint uVar93;
  long lVar94;
  uint uVar95;
  ulong uVar96;
  uint uVar97;
  ulong uVar98;
  ulong uVar99;
  bool bVar100;
  float fVar101;
  float fVar131;
  float fVar132;
  __m128 a;
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  float fVar134;
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  float fVar133;
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  float fVar163;
  float fVar166;
  float fVar172;
  float fVar174;
  float fVar176;
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  float fVar169;
  undefined1 auVar152 [32];
  float fVar164;
  float fVar167;
  float fVar170;
  undefined1 auVar153 [32];
  float fVar165;
  float fVar168;
  float fVar171;
  float fVar173;
  float fVar175;
  float fVar177;
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  undefined1 auVar160 [32];
  undefined1 auVar161 [32];
  undefined1 auVar162 [32];
  float fVar178;
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  float fVar197;
  float fVar198;
  float fVar200;
  float fVar201;
  float fVar202;
  undefined1 auVar186 [32];
  undefined1 auVar187 [32];
  undefined1 auVar188 [32];
  undefined1 auVar189 [32];
  float fVar199;
  float fVar203;
  undefined1 auVar190 [32];
  undefined1 auVar191 [32];
  undefined1 auVar192 [32];
  undefined1 auVar185 [16];
  undefined1 auVar193 [32];
  undefined1 auVar194 [32];
  undefined1 auVar195 [32];
  undefined1 auVar196 [32];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [32];
  undefined1 auVar218 [32];
  undefined1 auVar219 [32];
  undefined1 auVar220 [32];
  undefined1 auVar221 [32];
  undefined1 auVar222 [32];
  undefined1 auVar223 [32];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [28];
  undefined1 auVar235 [32];
  undefined1 auVar236 [32];
  undefined1 auVar237 [32];
  undefined1 auVar238 [32];
  undefined1 auVar239 [32];
  undefined1 auVar240 [32];
  undefined1 auVar241 [32];
  undefined1 auVar242 [32];
  undefined1 auVar243 [32];
  undefined1 auVar244 [32];
  undefined1 auVar245 [32];
  undefined1 auVar246 [64];
  float fVar247;
  float fVar262;
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  float fVar260;
  float fVar261;
  float fVar264;
  float fVar266;
  float fVar268;
  undefined1 auVar253 [32];
  float fVar263;
  float fVar265;
  float fVar267;
  float fVar269;
  undefined1 auVar254 [32];
  undefined1 auVar255 [32];
  undefined1 auVar256 [32];
  undefined1 auVar257 [32];
  undefined1 auVar258 [32];
  undefined1 auVar259 [32];
  float fVar270;
  float fVar271;
  float fVar281;
  float fVar283;
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  undefined1 auVar275 [16];
  float fVar282;
  float fVar284;
  float fVar286;
  float fVar288;
  float fVar290;
  float fVar293;
  undefined1 auVar276 [28];
  float fVar287;
  float fVar289;
  undefined1 auVar277 [32];
  float fVar285;
  float fVar292;
  undefined1 auVar278 [32];
  float fVar291;
  float fVar294;
  undefined1 auVar279 [32];
  undefined1 auVar280 [32];
  float fVar295;
  undefined1 auVar296 [28];
  float fVar302;
  float fVar303;
  float fVar304;
  float fVar305;
  float fVar306;
  undefined1 auVar297 [32];
  undefined1 auVar298 [32];
  float fVar307;
  float fVar308;
  undefined1 auVar299 [32];
  undefined1 auVar300 [32];
  undefined1 auVar301 [32];
  float fVar309;
  float fVar316;
  float fVar317;
  float fVar318;
  float fVar319;
  float fVar320;
  float fVar321;
  undefined1 auVar310 [32];
  undefined1 auVar312 [32];
  undefined1 auVar313 [32];
  undefined1 auVar311 [32];
  undefined1 auVar314 [64];
  undefined1 auVar315 [64];
  float s;
  float fVar322;
  float fVar323;
  float fVar330;
  float fVar332;
  float fVar334;
  float fVar336;
  float fVar338;
  float fVar340;
  undefined1 auVar324 [32];
  undefined1 auVar325 [32];
  undefined1 auVar326 [32];
  float fVar331;
  float fVar333;
  float fVar335;
  float fVar337;
  float fVar339;
  float fVar341;
  float fVar342;
  undefined1 auVar327 [32];
  undefined1 auVar328 [32];
  undefined1 auVar329 [32];
  float fVar343;
  float fVar349;
  float fVar350;
  float fVar351;
  float fVar352;
  float fVar353;
  float fVar354;
  undefined1 auVar344 [32];
  float fVar355;
  undefined1 auVar345 [32];
  undefined1 auVar346 [32];
  undefined1 auVar347 [32];
  undefined1 auVar348 [64];
  undefined1 auVar357 [16];
  float fVar356;
  undefined1 auVar358 [16];
  undefined1 auVar359 [16];
  float fVar365;
  float fVar366;
  float fVar368;
  float fVar369;
  float fVar370;
  undefined1 auVar360 [32];
  float fVar367;
  float fVar371;
  undefined1 auVar361 [32];
  undefined1 auVar362 [32];
  undefined1 auVar363 [32];
  undefined1 auVar364 [64];
  undefined1 auVar375 [16];
  float fVar372;
  float fVar373;
  float fVar374;
  float fVar381;
  float fVar384;
  float fVar390;
  float fVar393;
  float fVar396;
  float in_register_0000151c;
  undefined1 auVar376 [32];
  undefined1 auVar377 [32];
  float fVar382;
  float fVar383;
  float fVar385;
  float fVar386;
  float fVar387;
  float fVar388;
  float fVar389;
  float fVar391;
  float fVar392;
  float fVar394;
  float fVar395;
  float fVar397;
  float fVar398;
  float fVar399;
  undefined1 auVar378 [32];
  undefined1 auVar379 [32];
  float fVar400;
  undefined1 auVar401 [16];
  float fVar405;
  float fVar406;
  float fVar408;
  float fVar409;
  float fVar410;
  undefined1 auVar402 [32];
  undefined1 auVar403 [32];
  float fVar407;
  undefined1 auVar404 [32];
  float in_register_0000159c;
  undefined1 auVar411 [32];
  undefined1 auVar412 [32];
  undefined1 auVar413 [32];
  float in_register_000015dc;
  RTCFilterFunctionNArguments args;
  BBox<embree::vfloat_impl<8>_> tp0;
  BBox<embree::vfloat_impl<8>_> tp1;
  StackEntry stack [3];
  uint local_d24;
  float local_ce0;
  float fStack_cdc;
  float fStack_cd8;
  float fStack_cd4;
  undefined1 local_ca0 [8];
  float fStack_c98;
  float fStack_c94;
  float fStack_c90;
  float fStack_c8c;
  float fStack_c88;
  float local_c20;
  float fStack_c1c;
  float fStack_c18;
  float fStack_c14;
  undefined1 local_b80 [16];
  undefined1 local_b70 [16];
  undefined1 local_b50 [8];
  float fStack_b48;
  float fStack_b44;
  undefined1 local_b40 [8];
  float fStack_b38;
  float fStack_b34;
  undefined1 local_b30 [8];
  float fStack_b28;
  float fStack_b24;
  undefined1 local_b20 [8];
  float fStack_b18;
  float fStack_b14;
  RTCFilterFunctionNArguments local_b10;
  undefined1 local_ae0 [8];
  float fStack_ad8;
  float fStack_ad4;
  float fStack_ad0;
  float fStack_acc;
  float fStack_ac8;
  undefined1 (*local_ab8) [16];
  undefined1 (*local_ab0) [16];
  undefined1 (*local_aa8) [32];
  undefined1 local_aa0 [32];
  undefined1 local_a80 [8];
  float fStack_a78;
  float fStack_a74;
  float fStack_a70;
  float fStack_a6c;
  float fStack_a68;
  float fStack_a64;
  undefined1 local_a60 [32];
  undefined1 local_a40 [32];
  undefined1 local_a20 [32];
  undefined1 local_a00 [16];
  undefined1 local_9f0 [8];
  float fStack_9e8;
  float fStack_9e4;
  undefined1 local_9e0 [8];
  float fStack_9d8;
  float fStack_9d4;
  float fStack_9d0;
  float fStack_9cc;
  float fStack_9c8;
  float fStack_9c4;
  float local_9c0;
  float fStack_9bc;
  float fStack_9b8;
  float fStack_9b4;
  float fStack_9b0;
  float fStack_9ac;
  float fStack_9a8;
  float fStack_9a4;
  undefined1 local_9a0 [16];
  Primitive *local_988;
  ulong local_980;
  undefined1 auStack_978 [24];
  undefined1 local_960 [8];
  float fStack_958;
  float fStack_954;
  float fStack_950;
  float fStack_94c;
  float fStack_948;
  float fStack_944;
  undefined1 local_940 [32];
  undefined1 local_920 [8];
  float fStack_918;
  float fStack_914;
  float fStack_910;
  float fStack_90c;
  float fStack_908;
  float fStack_904;
  undefined1 local_900 [8];
  float fStack_8f8;
  float fStack_8f4;
  float fStack_8f0;
  float fStack_8ec;
  float fStack_8e8;
  float fStack_8e4;
  undefined1 local_8e0 [32];
  undefined1 local_8c0 [32];
  undefined1 local_8a0 [32];
  undefined1 local_880 [32];
  undefined1 local_860 [8];
  float fStack_858;
  float fStack_854;
  float fStack_850;
  float fStack_84c;
  float fStack_848;
  float fStack_844;
  undefined1 local_840 [16];
  undefined1 auStack_830 [16];
  undefined1 local_820 [32];
  undefined1 local_800 [32];
  undefined1 local_7e0 [32];
  undefined1 local_7c0 [32];
  undefined1 local_790 [16];
  RTCHitN local_780 [16];
  undefined1 auStack_770 [16];
  undefined1 local_760 [16];
  undefined1 auStack_750 [16];
  undefined1 local_740 [16];
  undefined1 auStack_730 [16];
  undefined1 local_720 [16];
  undefined1 auStack_710 [16];
  undefined1 local_700 [32];
  undefined8 local_6e0;
  undefined8 uStack_6d8;
  undefined8 uStack_6d0;
  undefined8 uStack_6c8;
  undefined1 local_6c0 [32];
  uint local_6a0;
  uint uStack_69c;
  uint uStack_698;
  uint uStack_694;
  uint uStack_690;
  uint uStack_68c;
  uint uStack_688;
  uint uStack_684;
  uint local_680;
  uint uStack_67c;
  uint uStack_678;
  uint uStack_674;
  uint uStack_670;
  uint uStack_66c;
  uint uStack_668;
  uint uStack_664;
  undefined1 local_660 [32];
  undefined1 local_640 [32];
  undefined1 local_620 [32];
  undefined1 local_600 [32];
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [32];
  undefined1 local_580 [8];
  float fStack_578;
  float fStack_574;
  float fStack_570;
  float fStack_56c;
  float fStack_568;
  undefined1 local_560 [8];
  float fStack_558;
  float fStack_554;
  float fStack_550;
  float fStack_54c;
  float fStack_548;
  undefined1 local_540 [8];
  float fStack_538;
  float fStack_534;
  float fStack_530;
  float fStack_52c;
  float fStack_528;
  undefined1 local_520 [8];
  float fStack_518;
  float fStack_514;
  float fStack_510;
  float fStack_50c;
  float fStack_508;
  undefined1 local_500 [8];
  float fStack_4f8;
  float fStack_4f4;
  float fStack_4f0;
  float fStack_4ec;
  float fStack_4e8;
  undefined1 local_4e0 [8];
  float fStack_4d8;
  float fStack_4d4;
  float fStack_4d0;
  float fStack_4cc;
  float fStack_4c8;
  undefined1 local_4c0 [8];
  float fStack_4b8;
  float fStack_4b4;
  float fStack_4b0;
  float fStack_4ac;
  float fStack_4a8;
  undefined1 local_4a0 [8];
  float fStack_498;
  float fStack_494;
  float fStack_490;
  float fStack_48c;
  float fStack_488;
  undefined1 local_480 [8];
  float fStack_478;
  float fStack_474;
  float fStack_470;
  float fStack_46c;
  float fStack_468;
  undefined1 local_460 [32];
  undefined1 local_440 [32];
  undefined1 local_420 [8];
  float fStack_418;
  float fStack_414;
  float fStack_410;
  float fStack_40c;
  float fStack_408;
  float fStack_404;
  undefined1 local_400 [32];
  undefined1 local_3e0 [8];
  float fStack_3d8;
  float fStack_3d4;
  float fStack_3d0;
  float fStack_3cc;
  float fStack_3c8;
  float fStack_3c4;
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [32];
  float local_380;
  float fStack_37c;
  float fStack_378;
  float fStack_374;
  float fStack_370;
  float fStack_36c;
  float fStack_368;
  float fStack_364;
  float local_360;
  float fStack_35c;
  float fStack_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  float fStack_348;
  float fStack_344;
  undefined1 local_340 [32];
  undefined1 local_320 [32];
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  undefined1 local_260 [32];
  undefined1 local_240 [8];
  float fStack_238;
  float fStack_234;
  float fStack_230;
  float fStack_22c;
  float fStack_228;
  undefined1 local_220 [8];
  float fStack_218;
  float fStack_214;
  float fStack_210;
  float fStack_20c;
  float fStack_208;
  undefined1 local_200 [8];
  float fStack_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  float fStack_1e8;
  float fStack_1e4;
  undefined1 local_1e0 [8];
  float fStack_1d8;
  float fStack_1d4;
  float fStack_1d0;
  float fStack_1cc;
  float fStack_1c8;
  float fStack_1c4;
  float local_1c0 [4];
  float fStack_1b0;
  float fStack_1ac;
  float fStack_1a8;
  float fStack_1a4;
  float local_1a0 [4];
  float fStack_190;
  float fStack_18c;
  float fStack_188;
  float fStack_184;
  undefined1 auStack_180 [32];
  undefined1 auStack_160 [32];
  ulong uStack_140;
  uint auStack_138 [66];
  undefined1 auVar380 [64];
  
  PVar5 = prim[1];
  uVar99 = (ulong)(byte)PVar5;
  fVar309 = *(float *)(prim + uVar99 * 0x19 + 0x12);
  auVar136 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                           0x10);
  auVar136 = vinsertps_avx(auVar136,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x20);
  auVar17 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0xa0)),0x10);
  auVar17 = vinsertps_avx(auVar17,ZEXT416(*(uint *)(ray + k * 4 + 0xc0)),0x20);
  auVar136 = vsubps_avx(auVar136,*(undefined1 (*) [16])(prim + uVar99 * 0x19 + 6));
  auVar107._0_4_ = fVar309 * auVar136._0_4_;
  auVar107._4_4_ = fVar309 * auVar136._4_4_;
  auVar107._8_4_ = fVar309 * auVar136._8_4_;
  auVar107._12_4_ = fVar309 * auVar136._12_4_;
  auVar272._0_4_ = fVar309 * auVar17._0_4_;
  auVar272._4_4_ = fVar309 * auVar17._4_4_;
  auVar272._8_4_ = fVar309 * auVar17._8_4_;
  auVar272._12_4_ = fVar309 * auVar17._12_4_;
  auVar136 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar99 * 4 + 6)));
  auVar17 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar99 * 4 + 10)));
  auVar110._16_16_ = auVar17;
  auVar110._0_16_ = auVar136;
  auVar136 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar99 * 5 + 6)));
  auVar17 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar99 * 5 + 10)));
  auVar110 = vcvtdq2ps_avx(auVar110);
  auVar186._16_16_ = auVar17;
  auVar186._0_16_ = auVar136;
  auVar129 = vcvtdq2ps_avx(auVar186);
  auVar136 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar99 * 6 + 6)));
  auVar17 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar99 * 6 + 10)));
  auVar217._16_16_ = auVar17;
  auVar217._0_16_ = auVar136;
  auVar136 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar99 * 0xb + 6)));
  auVar346 = vcvtdq2ps_avx(auVar217);
  auVar17 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar99 * 0xb + 10)));
  auVar218._16_16_ = auVar17;
  auVar218._0_16_ = auVar136;
  auVar11 = vcvtdq2ps_avx(auVar218);
  auVar136 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar99 * 0xc + 6)));
  auVar17 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar99 * 0xc + 10)));
  auVar235._16_16_ = auVar17;
  auVar235._0_16_ = auVar136;
  auVar136 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar99 * 0xd + 6)));
  auVar17 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar99 * 0xd + 10)));
  auVar12 = vcvtdq2ps_avx(auVar235);
  auVar236._16_16_ = auVar17;
  auVar236._0_16_ = auVar136;
  auVar13 = vcvtdq2ps_avx(auVar236);
  auVar136 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar99 * 0x12 + 6)));
  auVar17 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar99 * 0x12 + 10)));
  auVar237._16_16_ = auVar17;
  auVar237._0_16_ = auVar136;
  auVar136 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar99 * 0x13 + 6)));
  auVar14 = vcvtdq2ps_avx(auVar237);
  auVar17 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar99 * 0x13 + 10)));
  auVar324._16_16_ = auVar17;
  auVar324._0_16_ = auVar136;
  auVar15 = vcvtdq2ps_avx(auVar324);
  auVar136 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar99 * 0x14 + 6)));
  auVar17 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar99 * 0x14 + 10)));
  auVar344._16_16_ = auVar17;
  auVar344._0_16_ = auVar136;
  auVar16 = vcvtdq2ps_avx(auVar344);
  auVar136 = vshufps_avx(auVar272,auVar272,0);
  auVar17 = vshufps_avx(auVar272,auVar272,0x55);
  auVar26 = vshufps_avx(auVar272,auVar272,0xaa);
  fVar309 = auVar26._0_4_;
  fVar316 = auVar26._4_4_;
  fVar317 = auVar26._8_4_;
  fVar318 = auVar26._12_4_;
  fVar319 = auVar17._0_4_;
  fVar320 = auVar17._4_4_;
  fVar321 = auVar17._8_4_;
  fVar247 = auVar17._12_4_;
  fVar260 = auVar136._0_4_;
  fVar261 = auVar136._4_4_;
  fVar262 = auVar136._8_4_;
  fVar264 = auVar136._12_4_;
  auVar376._0_4_ = fVar260 * auVar110._0_4_ + fVar319 * auVar129._0_4_ + fVar309 * auVar346._0_4_;
  auVar376._4_4_ = fVar261 * auVar110._4_4_ + fVar320 * auVar129._4_4_ + fVar316 * auVar346._4_4_;
  auVar376._8_4_ = fVar262 * auVar110._8_4_ + fVar321 * auVar129._8_4_ + fVar317 * auVar346._8_4_;
  auVar376._12_4_ =
       fVar264 * auVar110._12_4_ + fVar247 * auVar129._12_4_ + fVar318 * auVar346._12_4_;
  auVar376._16_4_ =
       fVar260 * auVar110._16_4_ + fVar319 * auVar129._16_4_ + fVar309 * auVar346._16_4_;
  auVar376._20_4_ =
       fVar261 * auVar110._20_4_ + fVar320 * auVar129._20_4_ + fVar316 * auVar346._20_4_;
  auVar376._24_4_ =
       fVar262 * auVar110._24_4_ + fVar321 * auVar129._24_4_ + fVar317 * auVar346._24_4_;
  auVar376._28_4_ = fVar247 + in_register_000015dc + in_register_0000151c;
  auVar360._0_4_ = fVar260 * auVar11._0_4_ + fVar319 * auVar12._0_4_ + auVar13._0_4_ * fVar309;
  auVar360._4_4_ = fVar261 * auVar11._4_4_ + fVar320 * auVar12._4_4_ + auVar13._4_4_ * fVar316;
  auVar360._8_4_ = fVar262 * auVar11._8_4_ + fVar321 * auVar12._8_4_ + auVar13._8_4_ * fVar317;
  auVar360._12_4_ = fVar264 * auVar11._12_4_ + fVar247 * auVar12._12_4_ + auVar13._12_4_ * fVar318;
  auVar360._16_4_ = fVar260 * auVar11._16_4_ + fVar319 * auVar12._16_4_ + auVar13._16_4_ * fVar309;
  auVar360._20_4_ = fVar261 * auVar11._20_4_ + fVar320 * auVar12._20_4_ + auVar13._20_4_ * fVar316;
  auVar360._24_4_ = fVar262 * auVar11._24_4_ + fVar321 * auVar12._24_4_ + auVar13._24_4_ * fVar317;
  auVar360._28_4_ = fVar247 + in_register_000015dc + in_register_0000159c;
  auVar277._0_4_ = fVar260 * auVar14._0_4_ + fVar319 * auVar15._0_4_ + auVar16._0_4_ * fVar309;
  auVar277._4_4_ = fVar261 * auVar14._4_4_ + fVar320 * auVar15._4_4_ + auVar16._4_4_ * fVar316;
  auVar277._8_4_ = fVar262 * auVar14._8_4_ + fVar321 * auVar15._8_4_ + auVar16._8_4_ * fVar317;
  auVar277._12_4_ = fVar264 * auVar14._12_4_ + fVar247 * auVar15._12_4_ + auVar16._12_4_ * fVar318;
  auVar277._16_4_ = fVar260 * auVar14._16_4_ + fVar319 * auVar15._16_4_ + auVar16._16_4_ * fVar309;
  auVar277._20_4_ = fVar261 * auVar14._20_4_ + fVar320 * auVar15._20_4_ + auVar16._20_4_ * fVar316;
  auVar277._24_4_ = fVar262 * auVar14._24_4_ + fVar321 * auVar15._24_4_ + auVar16._24_4_ * fVar317;
  auVar277._28_4_ = fVar264 + fVar247 + fVar318;
  auVar136 = vshufps_avx(auVar107,auVar107,0);
  auVar17 = vshufps_avx(auVar107,auVar107,0x55);
  auVar26 = vshufps_avx(auVar107,auVar107,0xaa);
  fVar309 = auVar26._0_4_;
  fVar316 = auVar26._4_4_;
  fVar317 = auVar26._8_4_;
  fVar318 = auVar26._12_4_;
  fVar260 = auVar17._0_4_;
  fVar261 = auVar17._4_4_;
  fVar262 = auVar17._8_4_;
  fVar264 = auVar17._12_4_;
  fVar319 = auVar136._0_4_;
  fVar320 = auVar136._4_4_;
  fVar321 = auVar136._8_4_;
  fVar247 = auVar136._12_4_;
  auVar148._0_4_ = fVar319 * auVar110._0_4_ + fVar260 * auVar129._0_4_ + fVar309 * auVar346._0_4_;
  auVar148._4_4_ = fVar320 * auVar110._4_4_ + fVar261 * auVar129._4_4_ + fVar316 * auVar346._4_4_;
  auVar148._8_4_ = fVar321 * auVar110._8_4_ + fVar262 * auVar129._8_4_ + fVar317 * auVar346._8_4_;
  auVar148._12_4_ =
       fVar247 * auVar110._12_4_ + fVar264 * auVar129._12_4_ + fVar318 * auVar346._12_4_;
  auVar148._16_4_ =
       fVar319 * auVar110._16_4_ + fVar260 * auVar129._16_4_ + fVar309 * auVar346._16_4_;
  auVar148._20_4_ =
       fVar320 * auVar110._20_4_ + fVar261 * auVar129._20_4_ + fVar316 * auVar346._20_4_;
  auVar148._24_4_ =
       fVar321 * auVar110._24_4_ + fVar262 * auVar129._24_4_ + fVar317 * auVar346._24_4_;
  auVar148._28_4_ = auVar110._28_4_ + auVar129._28_4_ + auVar346._28_4_;
  auVar219._0_4_ = fVar319 * auVar11._0_4_ + auVar13._0_4_ * fVar309 + fVar260 * auVar12._0_4_;
  auVar219._4_4_ = fVar320 * auVar11._4_4_ + auVar13._4_4_ * fVar316 + fVar261 * auVar12._4_4_;
  auVar219._8_4_ = fVar321 * auVar11._8_4_ + auVar13._8_4_ * fVar317 + fVar262 * auVar12._8_4_;
  auVar219._12_4_ = fVar247 * auVar11._12_4_ + auVar13._12_4_ * fVar318 + fVar264 * auVar12._12_4_;
  auVar219._16_4_ = fVar319 * auVar11._16_4_ + auVar13._16_4_ * fVar309 + fVar260 * auVar12._16_4_;
  auVar219._20_4_ = fVar320 * auVar11._20_4_ + auVar13._20_4_ * fVar316 + fVar261 * auVar12._20_4_;
  auVar219._24_4_ = fVar321 * auVar11._24_4_ + auVar13._24_4_ * fVar317 + fVar262 * auVar12._24_4_;
  auVar219._28_4_ = auVar110._28_4_ + auVar13._28_4_ + auVar346._28_4_;
  auVar253._8_4_ = 0x7fffffff;
  auVar253._0_8_ = 0x7fffffff7fffffff;
  auVar253._12_4_ = 0x7fffffff;
  auVar253._16_4_ = 0x7fffffff;
  auVar253._20_4_ = 0x7fffffff;
  auVar253._24_4_ = 0x7fffffff;
  auVar253._28_4_ = 0x7fffffff;
  auVar310._8_4_ = 0x219392ef;
  auVar310._0_8_ = 0x219392ef219392ef;
  auVar310._12_4_ = 0x219392ef;
  auVar310._16_4_ = 0x219392ef;
  auVar310._20_4_ = 0x219392ef;
  auVar310._24_4_ = 0x219392ef;
  auVar310._28_4_ = 0x219392ef;
  auVar110 = vandps_avx(auVar376,auVar253);
  auVar110 = vcmpps_avx(auVar110,auVar310,1);
  auVar129 = vblendvps_avx(auVar376,auVar310,auVar110);
  auVar110 = vandps_avx(auVar360,auVar253);
  auVar110 = vcmpps_avx(auVar110,auVar310,1);
  auVar346 = vblendvps_avx(auVar360,auVar310,auVar110);
  auVar110 = vandps_avx(auVar277,auVar253);
  auVar110 = vcmpps_avx(auVar110,auVar310,1);
  auVar110 = vblendvps_avx(auVar277,auVar310,auVar110);
  auVar11 = vrcpps_avx(auVar129);
  auVar238._0_4_ = fVar319 * auVar14._0_4_ + fVar260 * auVar15._0_4_ + auVar16._0_4_ * fVar309;
  auVar238._4_4_ = fVar320 * auVar14._4_4_ + fVar261 * auVar15._4_4_ + auVar16._4_4_ * fVar316;
  auVar238._8_4_ = fVar321 * auVar14._8_4_ + fVar262 * auVar15._8_4_ + auVar16._8_4_ * fVar317;
  auVar238._12_4_ = fVar247 * auVar14._12_4_ + fVar264 * auVar15._12_4_ + auVar16._12_4_ * fVar318;
  auVar238._16_4_ = fVar319 * auVar14._16_4_ + fVar260 * auVar15._16_4_ + auVar16._16_4_ * fVar309;
  auVar238._20_4_ = fVar320 * auVar14._20_4_ + fVar261 * auVar15._20_4_ + auVar16._20_4_ * fVar316;
  auVar238._24_4_ = fVar321 * auVar14._24_4_ + fVar262 * auVar15._24_4_ + auVar16._24_4_ * fVar317;
  auVar238._28_4_ = auVar14._28_4_ + auVar12._28_4_ + fVar318;
  fVar309 = auVar11._0_4_;
  fVar316 = auVar11._4_4_;
  auVar12._4_4_ = auVar129._4_4_ * fVar316;
  auVar12._0_4_ = auVar129._0_4_ * fVar309;
  fVar317 = auVar11._8_4_;
  auVar12._8_4_ = auVar129._8_4_ * fVar317;
  fVar318 = auVar11._12_4_;
  auVar12._12_4_ = auVar129._12_4_ * fVar318;
  fVar319 = auVar11._16_4_;
  auVar12._16_4_ = auVar129._16_4_ * fVar319;
  fVar320 = auVar11._20_4_;
  auVar12._20_4_ = auVar129._20_4_ * fVar320;
  fVar321 = auVar11._24_4_;
  auVar12._24_4_ = auVar129._24_4_ * fVar321;
  auVar12._28_4_ = auVar129._28_4_;
  auVar325._8_4_ = 0x3f800000;
  auVar325._0_8_ = 0x3f8000003f800000;
  auVar325._12_4_ = 0x3f800000;
  auVar325._16_4_ = 0x3f800000;
  auVar325._20_4_ = 0x3f800000;
  auVar325._24_4_ = 0x3f800000;
  auVar325._28_4_ = 0x3f800000;
  auVar11 = vsubps_avx(auVar325,auVar12);
  auVar129 = vrcpps_avx(auVar346);
  fVar309 = fVar309 + fVar309 * auVar11._0_4_;
  fVar316 = fVar316 + fVar316 * auVar11._4_4_;
  fVar317 = fVar317 + fVar317 * auVar11._8_4_;
  fVar318 = fVar318 + fVar318 * auVar11._12_4_;
  fVar319 = fVar319 + fVar319 * auVar11._16_4_;
  fVar320 = fVar320 + fVar320 * auVar11._20_4_;
  fVar321 = fVar321 + fVar321 * auVar11._24_4_;
  fVar270 = auVar129._0_4_;
  fVar281 = auVar129._4_4_;
  auVar13._4_4_ = fVar281 * auVar346._4_4_;
  auVar13._0_4_ = fVar270 * auVar346._0_4_;
  fVar283 = auVar129._8_4_;
  auVar13._8_4_ = fVar283 * auVar346._8_4_;
  fVar285 = auVar129._12_4_;
  auVar13._12_4_ = fVar285 * auVar346._12_4_;
  fVar287 = auVar129._16_4_;
  auVar13._16_4_ = fVar287 * auVar346._16_4_;
  fVar289 = auVar129._20_4_;
  auVar13._20_4_ = fVar289 * auVar346._20_4_;
  fVar292 = auVar129._24_4_;
  auVar13._24_4_ = fVar292 * auVar346._24_4_;
  auVar13._28_4_ = auVar11._28_4_;
  auVar346 = vsubps_avx(auVar325,auVar13);
  auVar129 = vrcpps_avx(auVar110);
  fVar270 = fVar270 + fVar270 * auVar346._0_4_;
  fVar281 = fVar281 + fVar281 * auVar346._4_4_;
  fVar283 = fVar283 + fVar283 * auVar346._8_4_;
  fVar285 = fVar285 + fVar285 * auVar346._12_4_;
  fVar287 = fVar287 + fVar287 * auVar346._16_4_;
  fVar289 = fVar289 + fVar289 * auVar346._20_4_;
  fVar292 = fVar292 + fVar292 * auVar346._24_4_;
  fVar247 = auVar129._0_4_;
  fVar260 = auVar129._4_4_;
  auVar11._4_4_ = fVar260 * auVar110._4_4_;
  auVar11._0_4_ = fVar247 * auVar110._0_4_;
  fVar261 = auVar129._8_4_;
  auVar11._8_4_ = fVar261 * auVar110._8_4_;
  fVar262 = auVar129._12_4_;
  auVar11._12_4_ = fVar262 * auVar110._12_4_;
  fVar264 = auVar129._16_4_;
  auVar11._16_4_ = fVar264 * auVar110._16_4_;
  fVar266 = auVar129._20_4_;
  auVar11._20_4_ = fVar266 * auVar110._20_4_;
  fVar268 = auVar129._24_4_;
  auVar11._24_4_ = fVar268 * auVar110._24_4_;
  auVar11._28_4_ = auVar346._28_4_;
  auVar110 = vsubps_avx(auVar325,auVar11);
  fVar247 = fVar247 + fVar247 * auVar110._0_4_;
  fVar260 = fVar260 + fVar260 * auVar110._4_4_;
  fVar261 = fVar261 + fVar261 * auVar110._8_4_;
  fVar262 = fVar262 + fVar262 * auVar110._12_4_;
  fVar264 = fVar264 + fVar264 * auVar110._16_4_;
  fVar266 = fVar266 + fVar266 * auVar110._20_4_;
  fVar268 = fVar268 + fVar268 * auVar110._24_4_;
  auVar136._8_8_ = 0;
  auVar136._0_8_ = *(ulong *)(prim + uVar99 * 7 + 6);
  auVar136 = vpmovsxwd_avx(auVar136);
  auVar17._8_8_ = 0;
  auVar17._0_8_ = *(ulong *)(prim + uVar99 * 7 + 0xe);
  auVar17 = vpmovsxwd_avx(auVar17);
  auVar111._16_16_ = auVar17;
  auVar111._0_16_ = auVar136;
  auVar110 = vcvtdq2ps_avx(auVar111);
  auVar110 = vsubps_avx(auVar110,auVar148);
  auVar26._8_8_ = 0;
  auVar26._0_8_ = *(ulong *)(prim + uVar99 * 9 + 6);
  auVar136 = vpmovsxwd_avx(auVar26);
  auVar102._0_4_ = fVar309 * auVar110._0_4_;
  auVar102._4_4_ = fVar316 * auVar110._4_4_;
  auVar102._8_4_ = fVar317 * auVar110._8_4_;
  auVar102._12_4_ = fVar318 * auVar110._12_4_;
  auVar346._16_4_ = fVar319 * auVar110._16_4_;
  auVar346._0_16_ = auVar102;
  auVar346._20_4_ = fVar320 * auVar110._20_4_;
  auVar346._24_4_ = fVar321 * auVar110._24_4_;
  auVar346._28_4_ = auVar110._28_4_;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = *(ulong *)(prim + uVar99 * 9 + 0xe);
  auVar17 = vpmovsxwd_avx(auVar2);
  auVar187._16_16_ = auVar17;
  auVar187._0_16_ = auVar136;
  auVar110 = vcvtdq2ps_avx(auVar187);
  auVar110 = vsubps_avx(auVar110,auVar148);
  auVar135._0_4_ = fVar309 * auVar110._0_4_;
  auVar135._4_4_ = fVar316 * auVar110._4_4_;
  auVar135._8_4_ = fVar317 * auVar110._8_4_;
  auVar135._12_4_ = fVar318 * auVar110._12_4_;
  auVar14._16_4_ = fVar319 * auVar110._16_4_;
  auVar14._0_16_ = auVar135;
  auVar14._20_4_ = fVar320 * auVar110._20_4_;
  auVar14._24_4_ = fVar321 * auVar110._24_4_;
  auVar14._28_4_ = auVar110._28_4_;
  auVar209._8_8_ = 0;
  auVar209._0_8_ = *(ulong *)(prim + uVar99 * 0xe + 6);
  auVar136 = vpmovsxwd_avx(auVar209);
  auVar225._8_8_ = 0;
  auVar225._0_8_ = *(ulong *)(prim + uVar99 * 0xe + 0xe);
  auVar17 = vpmovsxwd_avx(auVar225);
  auVar188._16_16_ = auVar17;
  auVar188._0_16_ = auVar136;
  auVar110 = vcvtdq2ps_avx(auVar188);
  auVar110 = vsubps_avx(auVar110,auVar219);
  auVar179._0_4_ = fVar270 * auVar110._0_4_;
  auVar179._4_4_ = fVar281 * auVar110._4_4_;
  auVar179._8_4_ = fVar283 * auVar110._8_4_;
  auVar179._12_4_ = fVar285 * auVar110._12_4_;
  auVar15._16_4_ = fVar287 * auVar110._16_4_;
  auVar15._0_16_ = auVar179;
  auVar15._20_4_ = fVar289 * auVar110._20_4_;
  auVar15._24_4_ = fVar292 * auVar110._24_4_;
  auVar15._28_4_ = auVar110._28_4_;
  auVar206._8_8_ = 0;
  auVar206._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar5 * 0x10 + 6);
  auVar136 = vpmovsxwd_avx(auVar206);
  auVar105._8_8_ = 0;
  auVar105._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar5 * 0x10 + 0xe);
  auVar17 = vpmovsxwd_avx(auVar105);
  auVar297._16_16_ = auVar17;
  auVar297._0_16_ = auVar136;
  auVar110 = vcvtdq2ps_avx(auVar297);
  auVar110 = vsubps_avx(auVar110,auVar219);
  auVar204._0_4_ = fVar270 * auVar110._0_4_;
  auVar204._4_4_ = fVar281 * auVar110._4_4_;
  auVar204._8_4_ = fVar283 * auVar110._8_4_;
  auVar204._12_4_ = fVar285 * auVar110._12_4_;
  auVar16._16_4_ = fVar287 * auVar110._16_4_;
  auVar16._0_16_ = auVar204;
  auVar16._20_4_ = fVar289 * auVar110._20_4_;
  auVar16._24_4_ = fVar292 * auVar110._24_4_;
  auVar16._28_4_ = auVar110._28_4_;
  auVar137._8_8_ = 0;
  auVar137._0_8_ = *(ulong *)(prim + uVar99 * 0x15 + 6);
  auVar136 = vpmovsxwd_avx(auVar137);
  auVar138._8_8_ = 0;
  auVar138._0_8_ = *(ulong *)(prim + uVar99 * 0x15 + 0xe);
  auVar17 = vpmovsxwd_avx(auVar138);
  auVar278._16_16_ = auVar17;
  auVar278._0_16_ = auVar136;
  auVar110 = vcvtdq2ps_avx(auVar278);
  auVar110 = vsubps_avx(auVar110,auVar238);
  auVar273._0_4_ = fVar247 * auVar110._0_4_;
  auVar273._4_4_ = fVar260 * auVar110._4_4_;
  auVar273._8_4_ = fVar261 * auVar110._8_4_;
  auVar273._12_4_ = fVar262 * auVar110._12_4_;
  auVar27._16_4_ = fVar264 * auVar110._16_4_;
  auVar27._0_16_ = auVar273;
  auVar27._20_4_ = fVar266 * auVar110._20_4_;
  auVar27._24_4_ = fVar268 * auVar110._24_4_;
  auVar27._28_4_ = auVar110._28_4_;
  auVar3._8_8_ = 0;
  auVar3._0_8_ = *(ulong *)(prim + uVar99 * 0x17 + 6);
  auVar136 = vpmovsxwd_avx(auVar3);
  auVar4._8_8_ = 0;
  auVar4._0_8_ = *(ulong *)(prim + uVar99 * 0x17 + 0xe);
  auVar17 = vpmovsxwd_avx(auVar4);
  auVar298._16_16_ = auVar17;
  auVar298._0_16_ = auVar136;
  auVar110 = vcvtdq2ps_avx(auVar298);
  auVar110 = vsubps_avx(auVar110,auVar238);
  auVar224._0_4_ = fVar247 * auVar110._0_4_;
  auVar224._4_4_ = fVar260 * auVar110._4_4_;
  auVar224._8_4_ = fVar261 * auVar110._8_4_;
  auVar224._12_4_ = fVar262 * auVar110._12_4_;
  auVar28._16_4_ = fVar264 * auVar110._16_4_;
  auVar28._0_16_ = auVar224;
  auVar28._20_4_ = fVar266 * auVar110._20_4_;
  auVar28._24_4_ = fVar268 * auVar110._24_4_;
  auVar28._28_4_ = auVar110._28_4_;
  auVar136 = vpminsd_avx(auVar346._16_16_,auVar14._16_16_);
  auVar17 = vpminsd_avx(auVar102,auVar135);
  auVar311._16_16_ = auVar136;
  auVar311._0_16_ = auVar17;
  auVar136 = vpminsd_avx(auVar15._16_16_,auVar16._16_16_);
  auVar17 = vpminsd_avx(auVar179,auVar204);
  auVar326._16_16_ = auVar136;
  auVar326._0_16_ = auVar17;
  auVar110 = vmaxps_avx(auVar311,auVar326);
  auVar136 = vpminsd_avx(auVar27._16_16_,auVar28._16_16_);
  auVar17 = vpminsd_avx(auVar273,auVar224);
  auVar402._16_16_ = auVar136;
  auVar402._0_16_ = auVar17;
  uVar1 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar411._4_4_ = uVar1;
  auVar411._0_4_ = uVar1;
  auVar411._8_4_ = uVar1;
  auVar411._12_4_ = uVar1;
  auVar411._16_4_ = uVar1;
  auVar411._20_4_ = uVar1;
  auVar411._24_4_ = uVar1;
  auVar411._28_4_ = uVar1;
  auVar129 = vmaxps_avx(auVar402,auVar411);
  auVar110 = vmaxps_avx(auVar110,auVar129);
  local_340._4_4_ = auVar110._4_4_ * 0.99999964;
  local_340._0_4_ = auVar110._0_4_ * 0.99999964;
  local_340._8_4_ = auVar110._8_4_ * 0.99999964;
  local_340._12_4_ = auVar110._12_4_ * 0.99999964;
  local_340._16_4_ = auVar110._16_4_ * 0.99999964;
  local_340._20_4_ = auVar110._20_4_ * 0.99999964;
  local_340._24_4_ = auVar110._24_4_ * 0.99999964;
  local_340._28_4_ = auVar110._28_4_;
  auVar136 = vpmaxsd_avx(auVar346._16_16_,auVar14._16_16_);
  auVar17 = vpmaxsd_avx(auVar102,auVar135);
  auVar112._16_16_ = auVar136;
  auVar112._0_16_ = auVar17;
  auVar136 = vpmaxsd_avx(auVar15._16_16_,auVar16._16_16_);
  auVar17 = vpmaxsd_avx(auVar179,auVar204);
  auVar149._16_16_ = auVar136;
  auVar149._0_16_ = auVar17;
  auVar110 = vminps_avx(auVar112,auVar149);
  auVar136 = vpmaxsd_avx(auVar27._16_16_,auVar28._16_16_);
  auVar17 = vpmaxsd_avx(auVar273,auVar224);
  auVar150._16_16_ = auVar136;
  auVar150._0_16_ = auVar17;
  uVar1 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar189._4_4_ = uVar1;
  auVar189._0_4_ = uVar1;
  auVar189._8_4_ = uVar1;
  auVar189._12_4_ = uVar1;
  auVar189._16_4_ = uVar1;
  auVar189._20_4_ = uVar1;
  auVar189._24_4_ = uVar1;
  auVar189._28_4_ = uVar1;
  auVar129 = vminps_avx(auVar150,auVar189);
  auVar110 = vminps_avx(auVar110,auVar129);
  auVar129._4_4_ = auVar110._4_4_ * 1.0000004;
  auVar129._0_4_ = auVar110._0_4_ * 1.0000004;
  auVar129._8_4_ = auVar110._8_4_ * 1.0000004;
  auVar129._12_4_ = auVar110._12_4_ * 1.0000004;
  auVar129._16_4_ = auVar110._16_4_ * 1.0000004;
  auVar129._20_4_ = auVar110._20_4_ * 1.0000004;
  auVar129._24_4_ = auVar110._24_4_ * 1.0000004;
  auVar129._28_4_ = auVar110._28_4_;
  auVar110 = vcmpps_avx(local_340,auVar129,2);
  auVar136 = vpshufd_avx(ZEXT116((byte)PVar5),0);
  auVar151._16_16_ = auVar136;
  auVar151._0_16_ = auVar136;
  auVar129 = vcvtdq2ps_avx(auVar151);
  auVar129 = vcmpps_avx(_DAT_01f7b060,auVar129,1);
  auVar110 = vandps_avx(auVar110,auVar129);
  uVar92 = vmovmskps_avx(auVar110);
  auVar113._16_16_ = mm_lookupmask_ps._240_16_;
  auVar113._0_16_ = mm_lookupmask_ps._240_16_;
  local_5a0 = vblendps_avx(auVar113,ZEXT832(0) << 0x20,0x80);
  uVar97 = 1 << ((byte)k & 0x1f);
  local_aa8 = (undefined1 (*) [32])&local_6a0;
  local_ab0 = (undefined1 (*) [16])(mm_lookupmask_ps + ((uVar97 & 0xf) << 4));
  local_ab8 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)((int)uVar97 >> 4) * 0x10);
  local_988 = prim;
LAB_00a09098:
  uVar99 = (ulong)uVar92;
  if (uVar99 == 0) {
    return;
  }
  lVar94 = 0;
  if (uVar99 != 0) {
    for (; (uVar92 >> lVar94 & 1) == 0; lVar94 = lVar94 + 1) {
    }
  }
  uVar99 = uVar99 - 1 & uVar99;
  uVar92 = *(uint *)(local_988 + 2);
  local_980 = (ulong)*(uint *)(local_988 + lVar94 * 4 + 6);
  pGVar6 = (context->scene->geometries).items[uVar92].ptr;
  uVar96 = (ulong)*(uint *)(*(long *)&pGVar6->field_0x58 +
                           pGVar6[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i * local_980);
  p_Var7 = pGVar6[1].intersectionFilterN;
  lVar8 = *(long *)&pGVar6[1].time_range.upper;
  auVar136 = *(undefined1 (*) [16])(lVar8 + (long)p_Var7 * uVar96);
  auVar17 = *(undefined1 (*) [16])(lVar8 + (uVar96 + 1) * (long)p_Var7);
  lVar10 = 0;
  if (uVar99 != 0) {
    for (; (uVar99 >> lVar10 & 1) == 0; lVar10 = lVar10 + 1) {
    }
  }
  if (((uVar99 != 0) && (uVar98 = uVar99 - 1 & uVar99, uVar98 != 0)) && (lVar10 = 0, uVar98 != 0)) {
    for (; (uVar98 >> lVar10 & 1) == 0; lVar10 = lVar10 + 1) {
    }
  }
  auVar26 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                          0x1c);
  auVar2 = vinsertps_avx(auVar26,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x28);
  fVar309 = *(float *)(ray + k * 4 + 0x80);
  auVar357._4_4_ = fVar309;
  auVar357._0_4_ = fVar309;
  auVar357._8_4_ = fVar309;
  auVar357._12_4_ = fVar309;
  fStack_950 = fVar309;
  _local_960 = auVar357;
  fStack_94c = fVar309;
  fStack_948 = fVar309;
  fStack_944 = fVar309;
  fVar316 = *(float *)(ray + k * 4 + 0xa0);
  auVar375._4_4_ = fVar316;
  auVar375._0_4_ = fVar316;
  auVar375._8_4_ = fVar316;
  auVar375._12_4_ = fVar316;
  auVar26 = vunpcklps_avx(auVar357,auVar375);
  fVar317 = *(float *)(ray + k * 4 + 0xc0);
  auVar401._4_4_ = fVar317;
  auVar401._0_4_ = fVar317;
  auVar401._8_4_ = fVar317;
  auVar401._12_4_ = fVar317;
  fStack_850 = fVar317;
  _local_860 = auVar401;
  fStack_84c = fVar317;
  fStack_848 = fVar317;
  fStack_844 = fVar317;
  _local_9f0 = vinsertps_avx(auVar26,auVar401,0x28);
  auVar103._0_4_ = (auVar136._0_4_ + auVar17._0_4_) * 0.5;
  auVar103._4_4_ = (auVar136._4_4_ + auVar17._4_4_) * 0.5;
  auVar103._8_4_ = (auVar136._8_4_ + auVar17._8_4_) * 0.5;
  auVar103._12_4_ = (auVar136._12_4_ + auVar17._12_4_) * 0.5;
  auVar26 = vsubps_avx(auVar103,auVar2);
  auVar26 = vdpps_avx(auVar26,_local_9f0,0x7f);
  local_a00 = vdpps_avx(_local_9f0,_local_9f0,0x7f);
  auVar348 = ZEXT1664(local_a00);
  auVar209 = vrcpss_avx(local_a00,local_a00);
  fVar318 = auVar26._0_4_ * auVar209._0_4_ * (2.0 - local_a00._0_4_ * auVar209._0_4_);
  auVar209 = vshufps_avx(ZEXT416((uint)fVar318),ZEXT416((uint)fVar318),0);
  auVar248._0_4_ = auVar2._0_4_ + local_9f0._0_4_ * auVar209._0_4_;
  auVar248._4_4_ = auVar2._4_4_ + local_9f0._4_4_ * auVar209._4_4_;
  auVar248._8_4_ = auVar2._8_4_ + local_9f0._8_4_ * auVar209._8_4_;
  auVar248._12_4_ = auVar2._12_4_ + local_9f0._12_4_ * auVar209._12_4_;
  auVar26 = vblendps_avx(auVar248,_DAT_01f45a50,8);
  _local_b20 = vsubps_avx(auVar136,auVar26);
  _local_b30 = vsubps_avx(*(undefined1 (*) [16])(lVar8 + (uVar96 + 2) * (long)p_Var7),auVar26);
  _local_b40 = vsubps_avx(auVar17,auVar26);
  auVar314 = ZEXT1664(_local_b40);
  _local_b50 = vsubps_avx(*(undefined1 (*) [16])(lVar8 + (uVar96 + 3) * (long)p_Var7),auVar26);
  auVar136 = vshufps_avx(_local_b20,_local_b20,0);
  register0x00001250 = auVar136;
  _local_480 = auVar136;
  auVar136 = vshufps_avx(_local_b20,_local_b20,0x55);
  register0x00001250 = auVar136;
  _local_1e0 = auVar136;
  auVar136 = vshufps_avx(_local_b20,_local_b20,0xaa);
  register0x00001250 = auVar136;
  _local_200 = auVar136;
  auVar136 = vshufps_avx(_local_b20,_local_b20,0xff);
  register0x00001290 = auVar136;
  _local_220 = auVar136;
  auVar136 = vshufps_avx(_local_b40,_local_b40,0);
  register0x00001290 = auVar136;
  _local_4a0 = auVar136;
  auVar136 = vshufps_avx(_local_b40,_local_b40,0x55);
  register0x00001290 = auVar136;
  _local_4c0 = auVar136;
  auVar136 = vshufps_avx(_local_b40,_local_b40,0xaa);
  register0x00001290 = auVar136;
  _local_4e0 = auVar136;
  auVar136 = vshufps_avx(_local_b40,_local_b40,0xff);
  register0x00001290 = auVar136;
  _local_500 = auVar136;
  auVar17 = vshufps_avx(_local_b30,_local_b30,0);
  auVar403._16_16_ = auVar17;
  auVar403._0_16_ = auVar17;
  auVar136 = vshufps_avx(_local_b30,_local_b30,0x55);
  register0x00001290 = auVar136;
  _local_520 = auVar136;
  auVar136 = vshufps_avx(_local_b30,_local_b30,0xaa);
  register0x00001290 = auVar136;
  _local_540 = auVar136;
  auVar136 = vshufps_avx(_local_b30,_local_b30,0xff);
  register0x00001290 = auVar136;
  _local_560 = auVar136;
  auVar136 = vshufps_avx(_local_b50,_local_b50,0);
  local_aa0._16_16_ = auVar136;
  local_aa0._0_16_ = auVar136;
  auVar364 = ZEXT3264(local_aa0);
  auVar26 = vshufps_avx(_local_b50,_local_b50,0x55);
  auVar377._16_16_ = auVar26;
  auVar377._0_16_ = auVar26;
  auVar380 = ZEXT3264(auVar377);
  auVar136 = vshufps_avx(_local_b50,_local_b50,0xaa);
  register0x00001290 = auVar136;
  _local_580 = auVar136;
  auVar136 = vshufps_avx(_local_b50,_local_b50,0xff);
  register0x00001290 = auVar136;
  _local_240 = auVar136;
  auVar136 = ZEXT416((uint)(fVar309 * fVar309 + fVar316 * fVar316 + fVar317 * fVar317));
  auVar136 = vshufps_avx(auVar136,auVar136,0);
  local_260._16_16_ = auVar136;
  local_260._0_16_ = auVar136;
  fVar309 = *(float *)(ray + k * 4 + 0x60);
  local_9a0 = ZEXT416((uint)fVar318);
  auVar136 = vshufps_avx(ZEXT416((uint)(fVar309 - fVar318)),ZEXT416((uint)(fVar309 - fVar318)),0);
  local_320._16_16_ = auVar136;
  local_320._0_16_ = auVar136;
  auVar136 = vpshufd_avx(ZEXT416(uVar92),0);
  local_5e0._16_16_ = auVar136;
  local_5e0._0_16_ = auVar136;
  auVar136 = vpshufd_avx(ZEXT416(*(uint *)(local_988 + lVar94 * 4 + 6)),0);
  local_600._16_16_ = auVar136;
  local_600._0_16_ = auVar136;
  register0x00001210 = auVar209;
  _local_9e0 = auVar209;
  uVar96 = 0;
  local_d24 = 1;
  auVar114._8_4_ = 0x7fffffff;
  auVar114._0_8_ = 0x7fffffff7fffffff;
  auVar114._12_4_ = 0x7fffffff;
  auVar114._16_4_ = 0x7fffffff;
  auVar114._20_4_ = 0x7fffffff;
  auVar114._24_4_ = 0x7fffffff;
  auVar114._28_4_ = 0x7fffffff;
  local_5c0 = vandps_avx(local_260,auVar114);
  auVar136 = vsqrtss_avx(local_a00,local_a00);
  auVar2 = vsqrtss_avx(local_a00,local_a00);
  local_790 = ZEXT816(0x3f80000000000000);
  auVar246 = ZEXT3264(CONCAT428(0x3f800000,
                                CONCAT424(0x3f800000,
                                          CONCAT420(0x3f800000,
                                                    CONCAT416(0x3f800000,
                                                              CONCAT412(0x3f800000,
                                                                        CONCAT48(0x3f800000,
                                                                                 0x3f8000003f800000)
                                                                       ))))));
  auVar110 = auVar403;
  do {
    auVar209 = vmovshdup_avx(local_790);
    auVar206 = vsubps_avx(auVar209,local_790);
    auVar209 = vshufps_avx(local_790,local_790,0);
    local_a60._16_16_ = auVar209;
    local_a60._0_16_ = auVar209;
    auVar225 = vshufps_avx(auVar206,auVar206,0);
    local_8c0._16_16_ = auVar225;
    local_8c0._0_16_ = auVar225;
    fVar133 = auVar225._0_4_;
    fVar163 = auVar225._4_4_;
    fVar166 = auVar225._8_4_;
    fVar169 = auVar225._12_4_;
    fVar101 = auVar209._0_4_;
    auVar220._0_4_ = fVar101 + fVar133 * 0.0;
    fVar131 = auVar209._4_4_;
    auVar220._4_4_ = fVar131 + fVar163 * 0.14285715;
    fVar132 = auVar209._8_4_;
    auVar220._8_4_ = fVar132 + fVar166 * 0.2857143;
    fStack_a64 = auVar209._12_4_;
    auVar220._12_4_ = fStack_a64 + fVar169 * 0.42857146;
    auVar220._16_4_ = fVar101 + fVar133 * 0.5714286;
    auVar220._20_4_ = fVar131 + fVar163 * 0.71428573;
    auVar220._24_4_ = fVar132 + fVar166 * 0.8571429;
    auVar220._28_4_ = fStack_a64 + fVar169;
    auVar129 = vsubps_avx(auVar246._0_32_,auVar220);
    local_a80._4_4_ = auVar220._4_4_ * auVar220._4_4_;
    local_a80._0_4_ = auVar220._0_4_ * auVar220._0_4_;
    fStack_a78 = auVar220._8_4_ * auVar220._8_4_;
    fStack_a74 = auVar220._12_4_ * auVar220._12_4_;
    fStack_a70 = auVar220._16_4_ * auVar220._16_4_;
    fStack_a6c = auVar220._20_4_ * auVar220._20_4_;
    fStack_a68 = auVar220._24_4_ * auVar220._24_4_;
    fVar264 = auVar220._0_4_ * 3.0;
    fVar266 = auVar220._4_4_ * 3.0;
    fVar268 = auVar220._8_4_ * 3.0;
    fVar270 = auVar220._12_4_ * 3.0;
    fVar281 = auVar220._16_4_ * 3.0;
    fVar283 = auVar220._20_4_ * 3.0;
    fVar285 = auVar220._24_4_ * 3.0;
    fVar308 = auVar246._28_4_ + -5.0;
    fVar317 = auVar129._0_4_;
    auVar315._0_4_ = fVar317 * fVar317;
    fVar318 = auVar129._4_4_;
    auVar315._4_4_ = fVar318 * fVar318;
    fVar319 = auVar129._8_4_;
    auVar315._8_4_ = fVar319 * fVar319;
    fVar320 = auVar129._12_4_;
    auVar315._12_4_ = fVar320 * fVar320;
    fVar321 = auVar129._16_4_;
    auVar315._16_4_ = fVar321 * fVar321;
    fVar247 = auVar129._20_4_;
    auVar315._20_4_ = fVar247 * fVar247;
    fVar260 = auVar129._24_4_;
    auVar315._28_36_ = auVar314._28_36_;
    auVar315._24_4_ = fVar260 * fVar260;
    fVar261 = auVar129._28_4_;
    fVar287 = (auVar315._0_4_ * (fVar317 * 3.0 + -5.0) + 2.0) * 0.5;
    fVar289 = (auVar315._4_4_ * (fVar318 * 3.0 + -5.0) + 2.0) * 0.5;
    fVar292 = (auVar315._8_4_ * (fVar319 * 3.0 + -5.0) + 2.0) * 0.5;
    fVar263 = (auVar315._12_4_ * (fVar320 * 3.0 + -5.0) + 2.0) * 0.5;
    fVar265 = (auVar315._16_4_ * (fVar321 * 3.0 + -5.0) + 2.0) * 0.5;
    fVar267 = (auVar315._20_4_ * (fVar247 * 3.0 + -5.0) + 2.0) * 0.5;
    fVar269 = (auVar315._24_4_ * (fVar260 * 3.0 + -5.0) + 2.0) * 0.5;
    fVar322 = -fVar317 * auVar220._0_4_ * auVar220._0_4_ * 0.5;
    fVar330 = -fVar318 * auVar220._4_4_ * auVar220._4_4_ * 0.5;
    fVar332 = -fVar319 * auVar220._8_4_ * auVar220._8_4_ * 0.5;
    fVar334 = -fVar320 * auVar220._12_4_ * auVar220._12_4_ * 0.5;
    fVar336 = -fVar321 * auVar220._16_4_ * auVar220._16_4_ * 0.5;
    fVar338 = -fVar247 * auVar220._20_4_ * auVar220._20_4_ * 0.5;
    fVar340 = -fVar260 * auVar220._24_4_ * auVar220._24_4_ * 0.5;
    fVar262 = auVar110._28_4_;
    fVar355 = auVar348._28_4_ + fVar262;
    fVar371 = auVar364._28_4_ + fVar262;
    fVar400 = (auVar220._0_4_ * auVar220._0_4_ * (fVar264 + -5.0) + 2.0) * 0.5;
    fVar405 = (auVar220._4_4_ * auVar220._4_4_ * (fVar266 + -5.0) + 2.0) * 0.5;
    fVar406 = (auVar220._8_4_ * auVar220._8_4_ * (fVar268 + -5.0) + 2.0) * 0.5;
    fVar407 = (auVar220._12_4_ * auVar220._12_4_ * (fVar270 + -5.0) + 2.0) * 0.5;
    fVar408 = (auVar220._16_4_ * auVar220._16_4_ * (fVar281 + -5.0) + 2.0) * 0.5;
    fVar409 = (auVar220._20_4_ * auVar220._20_4_ * (fVar283 + -5.0) + 2.0) * 0.5;
    fVar410 = (auVar220._24_4_ * auVar220._24_4_ * (fVar285 + -5.0) + 2.0) * 0.5;
    fVar399 = -auVar220._28_4_;
    fVar372 = -auVar220._0_4_ * fVar317 * fVar317 * 0.5;
    fVar381 = -auVar220._4_4_ * fVar318 * fVar318 * 0.5;
    fVar384 = -auVar220._8_4_ * fVar319 * fVar319 * 0.5;
    fVar387 = -auVar220._12_4_ * fVar320 * fVar320 * 0.5;
    fVar390 = -auVar220._16_4_ * fVar321 * fVar321 * 0.5;
    fVar393 = -auVar220._20_4_ * fVar247 * fVar247 * 0.5;
    fVar396 = -auVar220._24_4_ * fVar260 * fVar260 * 0.5;
    fVar323 = fVar372 * (float)local_480._0_4_ +
              fVar400 * (float)local_4a0._0_4_ + auVar364._0_4_ * fVar322 + auVar110._0_4_ * fVar287
    ;
    fVar331 = fVar381 * (float)local_480._4_4_ +
              fVar405 * (float)local_4a0._4_4_ + auVar364._4_4_ * fVar330 + auVar110._4_4_ * fVar289
    ;
    fVar333 = fVar384 * fStack_478 +
              fVar406 * fStack_498 + auVar364._8_4_ * fVar332 + auVar110._8_4_ * fVar292;
    fVar335 = fVar387 * fStack_474 +
              fVar407 * fStack_494 + auVar364._12_4_ * fVar334 + auVar110._12_4_ * fVar263;
    fVar337 = fVar390 * fStack_470 +
              fVar408 * fStack_490 + auVar364._16_4_ * fVar336 + auVar110._16_4_ * fVar265;
    fVar339 = fVar393 * fStack_46c +
              fVar409 * fStack_48c + auVar364._20_4_ * fVar338 + auVar110._20_4_ * fVar267;
    fVar341 = fVar396 * fStack_468 +
              fVar410 * fStack_488 + auVar364._24_4_ * fVar340 + auVar110._24_4_ * fVar269;
    fVar342 = fVar262 + 2.0 + -fVar261 + fVar355;
    local_9c0 = (float)local_1e0._0_4_ * fVar372 +
                fVar400 * (float)local_4c0._0_4_ +
                auVar380._0_4_ * fVar322 + fVar287 * (float)local_520._0_4_;
    fStack_9bc = (float)local_1e0._4_4_ * fVar381 +
                 fVar405 * (float)local_4c0._4_4_ +
                 auVar380._4_4_ * fVar330 + fVar289 * (float)local_520._4_4_;
    fStack_9b8 = fStack_1d8 * fVar384 +
                 fVar406 * fStack_4b8 + auVar380._8_4_ * fVar332 + fVar292 * fStack_518;
    fStack_9b4 = fStack_1d4 * fVar387 +
                 fVar407 * fStack_4b4 + auVar380._12_4_ * fVar334 + fVar263 * fStack_514;
    fStack_9b0 = fStack_1d0 * fVar390 +
                 fVar408 * fStack_4b0 + auVar380._16_4_ * fVar336 + fVar265 * fStack_510;
    fStack_9ac = fStack_1cc * fVar393 +
                 fVar409 * fStack_4ac + auVar380._20_4_ * fVar338 + fVar267 * fStack_50c;
    fStack_9a8 = fStack_1c8 * fVar396 +
                 fVar410 * fStack_4a8 + auVar380._24_4_ * fVar340 + fVar269 * fStack_508;
    fStack_9a4 = fVar342 + fVar355 + fVar371;
    fVar178 = (float)local_200._0_4_ * fVar372 +
              fVar400 * (float)local_4e0._0_4_ +
              fVar322 * (float)local_580._0_4_ + fVar287 * (float)local_540._0_4_;
    fVar197 = (float)local_200._4_4_ * fVar381 +
              fVar405 * (float)local_4e0._4_4_ +
              fVar330 * (float)local_580._4_4_ + fVar289 * (float)local_540._4_4_;
    fVar198 = fStack_1f8 * fVar384 +
              fVar406 * fStack_4d8 + fVar332 * fStack_578 + fVar292 * fStack_538;
    fVar199 = fStack_1f4 * fVar387 +
              fVar407 * fStack_4d4 + fVar334 * fStack_574 + fVar263 * fStack_534;
    fVar200 = fStack_1f0 * fVar390 +
              fVar408 * fStack_4d0 + fVar336 * fStack_570 + fVar265 * fStack_530;
    fVar201 = fStack_1ec * fVar393 +
              fVar409 * fStack_4cc + fVar338 * fStack_56c + fVar267 * fStack_52c;
    fVar202 = fStack_1e8 * fVar396 +
              fVar410 * fStack_4c8 + fVar340 * fStack_568 + fVar269 * fStack_528;
    fVar203 = fStack_9a4 + fVar371 + auVar380._28_4_ + fVar262;
    local_8e0._0_4_ =
         (float)local_220._0_4_ * fVar372 +
         fVar400 * (float)local_500._0_4_ +
         fVar322 * (float)local_240._0_4_ + fVar287 * (float)local_560._0_4_;
    local_8e0._4_4_ =
         (float)local_220._4_4_ * fVar381 +
         fVar405 * (float)local_500._4_4_ +
         fVar330 * (float)local_240._4_4_ + fVar289 * (float)local_560._4_4_;
    local_8e0._8_4_ =
         fStack_218 * fVar384 + fVar406 * fStack_4f8 + fVar332 * fStack_238 + fVar292 * fStack_558;
    local_8e0._12_4_ =
         fStack_214 * fVar387 + fVar407 * fStack_4f4 + fVar334 * fStack_234 + fVar263 * fStack_554;
    local_8e0._16_4_ =
         fStack_210 * fVar390 + fVar408 * fStack_4f0 + fVar336 * fStack_230 + fVar265 * fStack_550;
    local_8e0._20_4_ =
         fStack_20c * fVar393 + fVar409 * fStack_4ec + fVar338 * fStack_22c + fVar267 * fStack_54c;
    local_8e0._24_4_ =
         fStack_208 * fVar396 + fVar410 * fStack_4e8 + fVar340 * fStack_228 + fVar269 * fStack_548;
    local_8e0._28_4_ = fStack_9a4 + fVar262 + 2.0 + -fVar261 + -3.0;
    auVar29._4_4_ = (fVar318 + fVar318) * auVar220._4_4_;
    auVar29._0_4_ = (fVar317 + fVar317) * auVar220._0_4_;
    auVar29._8_4_ = (fVar319 + fVar319) * auVar220._8_4_;
    auVar29._12_4_ = (fVar320 + fVar320) * auVar220._12_4_;
    auVar29._16_4_ = (fVar321 + fVar321) * auVar220._16_4_;
    auVar29._20_4_ = (fVar247 + fVar247) * auVar220._20_4_;
    auVar29._24_4_ = (fVar260 + fVar260) * auVar220._24_4_;
    auVar29._28_4_ = auVar220._28_4_ + auVar220._28_4_;
    auVar110 = vsubps_avx(auVar29,auVar315._0_32_);
    fVar322 = auVar246._28_4_ + 2.0;
    auVar30._4_4_ = (fVar318 + fVar318) * (fVar266 + 2.0);
    auVar30._0_4_ = (fVar317 + fVar317) * (fVar264 + 2.0);
    auVar30._8_4_ = (fVar319 + fVar319) * (fVar268 + 2.0);
    auVar30._12_4_ = (fVar320 + fVar320) * (fVar270 + 2.0);
    auVar30._16_4_ = (fVar321 + fVar321) * (fVar281 + 2.0);
    auVar30._20_4_ = (fVar247 + fVar247) * (fVar283 + 2.0);
    auVar30._24_4_ = (fVar260 + fVar260) * (fVar285 + 2.0);
    auVar30._28_4_ = fVar322;
    auVar31._4_4_ = fVar318 * fVar318 * 3.0;
    auVar31._0_4_ = fVar317 * fVar317 * 3.0;
    auVar31._8_4_ = fVar319 * fVar319 * 3.0;
    auVar31._12_4_ = fVar320 * fVar320 * 3.0;
    auVar31._16_4_ = fVar321 * fVar321 * 3.0;
    auVar31._20_4_ = fVar247 * fVar247 * 3.0;
    auVar31._24_4_ = fVar260 * fVar260 * 3.0;
    auVar31._28_4_ = fVar261;
    auVar129 = vsubps_avx(auVar30,auVar31);
    auVar346 = vsubps_avx(_local_a80,auVar29);
    fVar336 = auVar110._0_4_ * 0.5;
    fVar338 = auVar110._4_4_ * 0.5;
    fVar340 = auVar110._8_4_ * 0.5;
    fVar355 = auVar110._12_4_ * 0.5;
    fVar371 = auVar110._16_4_ * 0.5;
    fVar372 = auVar110._20_4_ * 0.5;
    fVar381 = auVar110._24_4_ * 0.5;
    fVar292 = (auVar220._0_4_ * fVar264 + (auVar220._0_4_ + auVar220._0_4_) * (fVar264 + -5.0)) *
              0.5;
    fVar263 = (auVar220._4_4_ * fVar266 + (auVar220._4_4_ + auVar220._4_4_) * (fVar266 + -5.0)) *
              0.5;
    fVar265 = (auVar220._8_4_ * fVar268 + (auVar220._8_4_ + auVar220._8_4_) * (fVar268 + -5.0)) *
              0.5;
    fVar267 = (auVar220._12_4_ * fVar270 + (auVar220._12_4_ + auVar220._12_4_) * (fVar270 + -5.0)) *
              0.5;
    fVar330 = (auVar220._16_4_ * fVar281 + (auVar220._16_4_ + auVar220._16_4_) * (fVar281 + -5.0)) *
              0.5;
    fVar332 = (auVar220._20_4_ * fVar283 + (auVar220._20_4_ + auVar220._20_4_) * (fVar283 + -5.0)) *
              0.5;
    fVar334 = (auVar220._24_4_ * fVar285 + (auVar220._24_4_ + auVar220._24_4_) * (fVar285 + -5.0)) *
              0.5;
    fVar317 = auVar129._0_4_ * 0.5;
    fVar318 = auVar129._4_4_ * 0.5;
    fVar319 = auVar129._8_4_ * 0.5;
    fVar320 = auVar129._12_4_ * 0.5;
    fVar321 = auVar129._16_4_ * 0.5;
    fVar247 = auVar129._20_4_ * 0.5;
    fVar264 = auVar129._24_4_ * 0.5;
    fVar260 = auVar346._0_4_ * 0.5;
    fVar262 = auVar346._4_4_ * 0.5;
    fVar266 = auVar346._8_4_ * 0.5;
    fVar268 = auVar346._12_4_ * 0.5;
    fVar270 = auVar346._16_4_ * 0.5;
    fVar281 = auVar346._20_4_ * 0.5;
    fVar289 = auVar346._24_4_ * 0.5;
    local_c20 = auVar26._0_4_;
    fStack_c1c = auVar26._4_4_;
    fStack_c18 = auVar26._8_4_;
    fStack_c14 = auVar26._12_4_;
    local_ce0 = auVar17._0_4_;
    fStack_cdc = auVar17._4_4_;
    fStack_cd8 = auVar17._8_4_;
    fStack_cd4 = auVar17._12_4_;
    fVar322 = fVar322 + auVar220._28_4_ + fVar308 + auVar129._28_4_ + auVar346._28_4_;
    auVar209 = vpermilps_avx(ZEXT416((uint)(auVar206._0_4_ * 0.04761905)),0);
    fVar285 = auVar209._0_4_;
    fVar295 = fVar285 * (fVar336 * (float)local_480._0_4_ +
                        fVar292 * (float)local_4a0._0_4_ +
                        fVar317 * local_ce0 + auVar364._0_4_ * fVar260);
    fVar287 = auVar209._4_4_;
    fVar302 = fVar287 * (fVar338 * (float)local_480._4_4_ +
                        fVar263 * (float)local_4a0._4_4_ +
                        fVar318 * fStack_cdc + auVar364._4_4_ * fVar262);
    auVar32._4_4_ = fVar302;
    auVar32._0_4_ = fVar295;
    fVar269 = auVar209._8_4_;
    fVar303 = fVar269 * (fVar340 * fStack_478 +
                        fVar265 * fStack_498 + fVar319 * fStack_cd8 + auVar364._8_4_ * fVar266);
    auVar32._8_4_ = fVar303;
    fVar283 = auVar209._12_4_;
    fVar304 = fVar283 * (fVar355 * fStack_474 +
                        fVar267 * fStack_494 + fVar320 * fStack_cd4 + auVar364._12_4_ * fVar268);
    auVar32._12_4_ = fVar304;
    fVar305 = fVar285 * (fVar371 * fStack_470 +
                        fVar330 * fStack_490 + fVar321 * local_ce0 + auVar364._16_4_ * fVar270);
    auVar32._16_4_ = fVar305;
    fVar306 = fVar287 * (fVar372 * fStack_46c +
                        fVar332 * fStack_48c + fVar247 * fStack_cdc + auVar364._20_4_ * fVar281);
    auVar32._20_4_ = fVar306;
    fVar307 = fVar269 * (fVar381 * fStack_468 +
                        fVar334 * fStack_488 + fVar264 * fStack_cd8 + auVar364._24_4_ * fVar289);
    auVar32._24_4_ = fVar307;
    auVar32._28_4_ = fVar261 + fVar261 + auVar110._28_4_ + fVar261 + fVar261 + fVar308;
    fVar356 = fVar285 * ((float)local_1e0._0_4_ * fVar336 +
                        fVar292 * (float)local_4c0._0_4_ +
                        fVar317 * (float)local_520._0_4_ + fVar260 * local_c20);
    fVar365 = fVar287 * ((float)local_1e0._4_4_ * fVar338 +
                        fVar263 * (float)local_4c0._4_4_ +
                        fVar318 * (float)local_520._4_4_ + fVar262 * fStack_c1c);
    auVar33._4_4_ = fVar365;
    auVar33._0_4_ = fVar356;
    fVar366 = fVar269 * (fStack_1d8 * fVar340 +
                        fVar265 * fStack_4b8 + fVar319 * fStack_518 + fVar266 * fStack_c18);
    auVar33._8_4_ = fVar366;
    fVar367 = fVar283 * (fStack_1d4 * fVar355 +
                        fVar267 * fStack_4b4 + fVar320 * fStack_514 + fVar268 * fStack_c14);
    auVar33._12_4_ = fVar367;
    fVar368 = fVar285 * (fStack_1d0 * fVar371 +
                        fVar330 * fStack_4b0 + fVar321 * fStack_510 + fVar270 * local_c20);
    auVar33._16_4_ = fVar368;
    fVar369 = fVar287 * (fStack_1cc * fVar372 +
                        fVar332 * fStack_4ac + fVar247 * fStack_50c + fVar281 * fStack_c1c);
    auVar33._20_4_ = fVar369;
    fVar370 = fVar269 * (fStack_1c8 * fVar381 +
                        fVar334 * fStack_4a8 + fVar264 * fStack_508 + fVar289 * fStack_c18);
    auVar33._24_4_ = fVar370;
    auVar33._28_4_ = fStack_1e4;
    fVar373 = fVar285 * ((float)local_200._0_4_ * fVar336 +
                        fVar317 * (float)local_540._0_4_ + fVar260 * (float)local_580._0_4_ +
                        fVar292 * (float)local_4e0._0_4_);
    fVar382 = fVar287 * ((float)local_200._4_4_ * fVar338 +
                        fVar318 * (float)local_540._4_4_ + fVar262 * (float)local_580._4_4_ +
                        fVar263 * (float)local_4e0._4_4_);
    auVar34._4_4_ = fVar382;
    auVar34._0_4_ = fVar373;
    fVar385 = fVar269 * (fStack_1f8 * fVar340 +
                        fVar319 * fStack_538 + fVar266 * fStack_578 + fVar265 * fStack_4d8);
    auVar34._8_4_ = fVar385;
    fVar388 = fVar283 * (fStack_1f4 * fVar355 +
                        fVar320 * fStack_534 + fVar268 * fStack_574 + fVar267 * fStack_4d4);
    auVar34._12_4_ = fVar388;
    fVar391 = fVar285 * (fStack_1f0 * fVar371 +
                        fVar321 * fStack_530 + fVar270 * fStack_570 + fVar330 * fStack_4d0);
    auVar34._16_4_ = fVar391;
    fVar394 = fVar287 * (fStack_1ec * fVar372 +
                        fVar247 * fStack_52c + fVar281 * fStack_56c + fVar332 * fStack_4cc);
    auVar34._20_4_ = fVar394;
    fVar397 = fVar269 * (fStack_1e8 * fVar381 +
                        fVar264 * fStack_528 + fVar289 * fStack_568 + fVar334 * fStack_4c8);
    auVar34._24_4_ = fVar397;
    auVar34._28_4_ = fVar399;
    fVar260 = fVar285 * ((float)local_220._0_4_ * fVar336 +
                        fVar292 * (float)local_500._0_4_ +
                        fVar317 * (float)local_560._0_4_ + (float)local_240._0_4_ * fVar260);
    fVar261 = fVar287 * ((float)local_220._4_4_ * fVar338 +
                        fVar263 * (float)local_500._4_4_ +
                        fVar318 * (float)local_560._4_4_ + (float)local_240._4_4_ * fVar262);
    auVar35._4_4_ = fVar261;
    auVar35._0_4_ = fVar260;
    fVar262 = fVar269 * (fStack_218 * fVar340 +
                        fVar265 * fStack_4f8 + fVar319 * fStack_558 + fStack_238 * fVar266);
    auVar35._8_4_ = fVar262;
    fVar283 = fVar283 * (fStack_214 * fVar355 +
                        fVar267 * fStack_4f4 + fVar320 * fStack_554 + fStack_234 * fVar268);
    auVar35._12_4_ = fVar283;
    fVar285 = fVar285 * (fStack_210 * fVar371 +
                        fVar330 * fStack_4f0 + fVar321 * fStack_550 + fStack_230 * fVar270);
    auVar35._16_4_ = fVar285;
    fVar287 = fVar287 * (fStack_20c * fVar372 +
                        fVar332 * fStack_4ec + fVar247 * fStack_54c + fStack_22c * fVar281);
    auVar35._20_4_ = fVar287;
    fVar269 = fVar269 * (fStack_208 * fVar381 +
                        fVar334 * fStack_4e8 + fVar264 * fStack_548 + fStack_228 * fVar289);
    auVar35._24_4_ = fVar269;
    auVar35._28_4_ = fVar322;
    auVar89._4_4_ = fStack_9bc;
    auVar89._0_4_ = local_9c0;
    auVar89._8_4_ = fStack_9b8;
    auVar89._12_4_ = fStack_9b4;
    auVar89._16_4_ = fStack_9b0;
    auVar89._20_4_ = fStack_9ac;
    auVar89._24_4_ = fStack_9a8;
    auVar89._28_4_ = fStack_9a4;
    auVar110 = vperm2f128_avx(auVar89,auVar89,1);
    auVar110 = vshufps_avx(auVar110,auVar89,0x30);
    auVar11 = vshufps_avx(auVar89,auVar110,0x29);
    auVar85._4_4_ = fVar197;
    auVar85._0_4_ = fVar178;
    auVar85._8_4_ = fVar198;
    auVar85._12_4_ = fVar199;
    auVar85._16_4_ = fVar200;
    auVar85._20_4_ = fVar201;
    auVar85._24_4_ = fVar202;
    auVar85._28_4_ = fVar203;
    auVar110 = vperm2f128_avx(auVar85,auVar85,1);
    auVar110 = vshufps_avx(auVar110,auVar85,0x30);
    auVar12 = vshufps_avx(auVar85,auVar110,0x29);
    auVar129 = vsubps_avx(local_8e0,auVar35);
    auVar110 = vperm2f128_avx(auVar129,auVar129,1);
    auVar110 = vshufps_avx(auVar110,auVar129,0x30);
    auVar13 = vshufps_avx(auVar129,auVar110,0x29);
    auVar16 = vsubps_avx(auVar11,auVar89);
    auVar346 = vsubps_avx(auVar12,auVar85);
    fVar318 = auVar16._0_4_;
    fVar264 = auVar16._4_4_;
    auVar36._4_4_ = fVar382 * fVar264;
    auVar36._0_4_ = fVar373 * fVar318;
    fVar289 = auVar16._8_4_;
    auVar36._8_4_ = fVar385 * fVar289;
    fVar332 = auVar16._12_4_;
    auVar36._12_4_ = fVar388 * fVar332;
    fVar381 = auVar16._16_4_;
    auVar36._16_4_ = fVar391 * fVar381;
    fVar405 = auVar16._20_4_;
    auVar36._20_4_ = fVar394 * fVar405;
    fVar19 = auVar16._24_4_;
    auVar36._24_4_ = fVar397 * fVar19;
    auVar36._28_4_ = auVar129._28_4_;
    fVar319 = auVar346._0_4_;
    fVar266 = auVar346._4_4_;
    auVar37._4_4_ = fVar365 * fVar266;
    auVar37._0_4_ = fVar356 * fVar319;
    fVar292 = auVar346._8_4_;
    auVar37._8_4_ = fVar366 * fVar292;
    fVar334 = auVar346._12_4_;
    auVar37._12_4_ = fVar367 * fVar334;
    fVar308 = auVar346._16_4_;
    auVar37._16_4_ = fVar368 * fVar308;
    fVar406 = auVar346._20_4_;
    auVar37._20_4_ = fVar369 * fVar406;
    fVar20 = auVar346._24_4_;
    auVar37._24_4_ = fVar370 * fVar20;
    auVar37._28_4_ = auVar110._28_4_;
    auVar27 = vsubps_avx(auVar37,auVar36);
    auVar87._4_4_ = fVar331;
    auVar87._0_4_ = fVar323;
    auVar87._8_4_ = fVar333;
    auVar87._12_4_ = fVar335;
    auVar87._16_4_ = fVar337;
    auVar87._20_4_ = fVar339;
    auVar87._24_4_ = fVar341;
    auVar87._28_4_ = fVar342;
    auVar110 = vperm2f128_avx(auVar87,auVar87,1);
    auVar110 = vshufps_avx(auVar110,auVar87,0x30);
    auVar14 = vshufps_avx(auVar87,auVar110,0x29);
    local_280 = vsubps_avx(auVar14,auVar87);
    auVar38._4_4_ = fVar266 * fVar302;
    auVar38._0_4_ = fVar319 * fVar295;
    auVar38._8_4_ = fVar292 * fVar303;
    auVar38._12_4_ = fVar334 * fVar304;
    auVar38._16_4_ = fVar308 * fVar305;
    auVar38._20_4_ = fVar406 * fVar306;
    auVar38._24_4_ = fVar20 * fVar307;
    auVar38._28_4_ = auVar110._28_4_;
    fVar320 = local_280._0_4_;
    fVar268 = local_280._4_4_;
    auVar39._4_4_ = fVar382 * fVar268;
    auVar39._0_4_ = fVar373 * fVar320;
    fVar263 = local_280._8_4_;
    auVar39._8_4_ = fVar385 * fVar263;
    fVar336 = local_280._12_4_;
    auVar39._12_4_ = fVar388 * fVar336;
    fVar384 = local_280._16_4_;
    auVar39._16_4_ = fVar391 * fVar384;
    fVar407 = local_280._20_4_;
    auVar39._20_4_ = fVar394 * fVar407;
    fVar21 = local_280._24_4_;
    auVar39._24_4_ = fVar397 * fVar21;
    auVar39._28_4_ = fStack_9a4;
    auVar28 = vsubps_avx(auVar39,auVar38);
    auVar40._4_4_ = fVar365 * fVar268;
    auVar40._0_4_ = fVar356 * fVar320;
    auVar40._8_4_ = fVar366 * fVar263;
    auVar40._12_4_ = fVar367 * fVar336;
    auVar40._16_4_ = fVar368 * fVar384;
    auVar40._20_4_ = fVar369 * fVar407;
    auVar40._24_4_ = fVar370 * fVar21;
    auVar40._28_4_ = fStack_9a4;
    auVar41._4_4_ = fVar264 * fVar302;
    auVar41._0_4_ = fVar318 * fVar295;
    auVar41._8_4_ = fVar289 * fVar303;
    auVar41._12_4_ = fVar332 * fVar304;
    auVar41._16_4_ = fVar381 * fVar305;
    auVar41._20_4_ = fVar405 * fVar306;
    auVar41._24_4_ = fVar19 * fVar307;
    auVar41._28_4_ = fVar342;
    auVar111 = vsubps_avx(auVar41,auVar40);
    fVar317 = auVar111._28_4_;
    auVar221._0_4_ = fVar320 * fVar320 + fVar318 * fVar318 + fVar319 * fVar319;
    auVar221._4_4_ = fVar268 * fVar268 + fVar264 * fVar264 + fVar266 * fVar266;
    auVar221._8_4_ = fVar263 * fVar263 + fVar289 * fVar289 + fVar292 * fVar292;
    auVar221._12_4_ = fVar336 * fVar336 + fVar332 * fVar332 + fVar334 * fVar334;
    auVar221._16_4_ = fVar384 * fVar384 + fVar381 * fVar381 + fVar308 * fVar308;
    auVar221._20_4_ = fVar407 * fVar407 + fVar405 * fVar405 + fVar406 * fVar406;
    auVar221._24_4_ = fVar21 * fVar21 + fVar19 * fVar19 + fVar20 * fVar20;
    auVar221._28_4_ = fVar317 + fVar317 + auVar27._28_4_;
    auVar110 = vrcpps_avx(auVar221);
    fVar330 = auVar110._0_4_;
    fVar355 = auVar110._4_4_;
    auVar42._4_4_ = fVar355 * auVar221._4_4_;
    auVar42._0_4_ = fVar330 * auVar221._0_4_;
    fVar371 = auVar110._8_4_;
    auVar42._8_4_ = fVar371 * auVar221._8_4_;
    fVar372 = auVar110._12_4_;
    auVar42._12_4_ = fVar372 * auVar221._12_4_;
    fVar393 = auVar110._16_4_;
    auVar42._16_4_ = fVar393 * auVar221._16_4_;
    fVar396 = auVar110._20_4_;
    auVar42._20_4_ = fVar396 * auVar221._20_4_;
    fVar400 = auVar110._24_4_;
    auVar42._24_4_ = fVar400 * auVar221._24_4_;
    auVar42._28_4_ = fVar342;
    auVar190._8_4_ = 0x3f800000;
    auVar190._0_8_ = 0x3f8000003f800000;
    auVar190._12_4_ = 0x3f800000;
    auVar190._16_4_ = 0x3f800000;
    auVar190._20_4_ = 0x3f800000;
    auVar190._24_4_ = 0x3f800000;
    auVar190._28_4_ = 0x3f800000;
    auVar112 = vsubps_avx(auVar190,auVar42);
    fVar330 = fVar330 + fVar330 * auVar112._0_4_;
    fVar355 = fVar355 + fVar355 * auVar112._4_4_;
    fVar371 = fVar371 + fVar371 * auVar112._8_4_;
    fVar372 = fVar372 + fVar372 * auVar112._12_4_;
    fVar393 = fVar393 + fVar393 * auVar112._16_4_;
    fVar396 = fVar396 + fVar396 * auVar112._20_4_;
    fVar400 = fVar400 + fVar400 * auVar112._24_4_;
    auVar129 = vperm2f128_avx(auVar33,auVar33,1);
    auVar129 = vshufps_avx(auVar129,auVar33,0x30);
    local_8a0 = vshufps_avx(auVar33,auVar129,0x29);
    auVar129 = vperm2f128_avx(auVar34,auVar34,1);
    auVar129 = vshufps_avx(auVar129,auVar34,0x30);
    auVar346 = vshufps_avx(auVar34,auVar129,0x29);
    fVar374 = auVar346._0_4_;
    fVar383 = auVar346._4_4_;
    auVar43._4_4_ = fVar383 * fVar264;
    auVar43._0_4_ = fVar374 * fVar318;
    fVar386 = auVar346._8_4_;
    auVar43._8_4_ = fVar386 * fVar289;
    fVar389 = auVar346._12_4_;
    auVar43._12_4_ = fVar389 * fVar332;
    fVar392 = auVar346._16_4_;
    auVar43._16_4_ = fVar392 * fVar381;
    fVar395 = auVar346._20_4_;
    auVar43._20_4_ = fVar395 * fVar405;
    fVar398 = auVar346._24_4_;
    auVar43._24_4_ = fVar398 * fVar19;
    auVar43._28_4_ = auVar129._28_4_;
    fVar321 = local_8a0._0_4_;
    fVar270 = local_8a0._4_4_;
    auVar44._4_4_ = fVar266 * fVar270;
    auVar44._0_4_ = fVar319 * fVar321;
    fVar265 = local_8a0._8_4_;
    auVar44._8_4_ = fVar292 * fVar265;
    fVar338 = local_8a0._12_4_;
    auVar44._12_4_ = fVar334 * fVar338;
    fVar387 = local_8a0._16_4_;
    auVar44._16_4_ = fVar308 * fVar387;
    fVar408 = local_8a0._20_4_;
    auVar44._20_4_ = fVar406 * fVar408;
    fVar22 = local_8a0._24_4_;
    auVar44._24_4_ = fVar20 * fVar22;
    auVar44._28_4_ = fStack_1e4;
    auVar113 = vsubps_avx(auVar44,auVar43);
    auVar129 = vperm2f128_avx(auVar32,auVar32,1);
    auVar129 = vshufps_avx(auVar129,auVar32,0x30);
    auVar15 = vshufps_avx(auVar32,auVar129,0x29);
    fVar247 = auVar15._0_4_;
    fVar281 = auVar15._4_4_;
    auVar45._4_4_ = fVar266 * fVar281;
    auVar45._0_4_ = fVar319 * fVar247;
    fVar267 = auVar15._8_4_;
    auVar45._8_4_ = fVar292 * fVar267;
    fVar340 = auVar15._12_4_;
    auVar45._12_4_ = fVar334 * fVar340;
    fVar390 = auVar15._16_4_;
    auVar45._16_4_ = fVar308 * fVar390;
    fVar409 = auVar15._20_4_;
    auVar45._20_4_ = fVar406 * fVar409;
    fVar23 = auVar15._24_4_;
    auVar45._24_4_ = fVar20 * fVar23;
    auVar45._28_4_ = auVar129._28_4_;
    auVar46._4_4_ = fVar383 * fVar268;
    auVar46._0_4_ = fVar374 * fVar320;
    auVar46._8_4_ = fVar386 * fVar263;
    auVar46._12_4_ = fVar389 * fVar336;
    auVar46._16_4_ = fVar392 * fVar384;
    auVar46._20_4_ = fVar395 * fVar407;
    uVar97 = auVar346._28_4_;
    auVar46._24_4_ = fVar398 * fVar21;
    auVar46._28_4_ = uVar97;
    auVar129 = vsubps_avx(auVar46,auVar45);
    auVar47._4_4_ = fVar268 * fVar270;
    auVar47._0_4_ = fVar320 * fVar321;
    auVar47._8_4_ = fVar263 * fVar265;
    auVar47._12_4_ = fVar336 * fVar338;
    auVar47._16_4_ = fVar384 * fVar387;
    auVar47._20_4_ = fVar407 * fVar408;
    auVar47._24_4_ = fVar21 * fVar22;
    auVar47._28_4_ = uVar97;
    auVar48._4_4_ = fVar264 * fVar281;
    auVar48._0_4_ = fVar318 * fVar247;
    auVar48._8_4_ = fVar289 * fVar267;
    auVar48._12_4_ = fVar332 * fVar340;
    auVar48._16_4_ = fVar381 * fVar390;
    auVar48._20_4_ = fVar405 * fVar409;
    auVar48._24_4_ = fVar19 * fVar23;
    auVar48._28_4_ = fStack_1c4;
    auVar148 = vsubps_avx(auVar48,auVar47);
    auVar49._4_4_ =
         fVar355 * (auVar27._4_4_ * auVar27._4_4_ +
                   auVar111._4_4_ * auVar111._4_4_ + auVar28._4_4_ * auVar28._4_4_);
    auVar49._0_4_ =
         fVar330 * (auVar27._0_4_ * auVar27._0_4_ +
                   auVar111._0_4_ * auVar111._0_4_ + auVar28._0_4_ * auVar28._0_4_);
    auVar49._8_4_ =
         fVar371 * (auVar27._8_4_ * auVar27._8_4_ +
                   auVar111._8_4_ * auVar111._8_4_ + auVar28._8_4_ * auVar28._8_4_);
    auVar49._12_4_ =
         fVar372 * (auVar27._12_4_ * auVar27._12_4_ +
                   auVar111._12_4_ * auVar111._12_4_ + auVar28._12_4_ * auVar28._12_4_);
    auVar49._16_4_ =
         fVar393 * (auVar27._16_4_ * auVar27._16_4_ +
                   auVar111._16_4_ * auVar111._16_4_ + auVar28._16_4_ * auVar28._16_4_);
    auVar49._20_4_ =
         fVar396 * (auVar27._20_4_ * auVar27._20_4_ +
                   auVar111._20_4_ * auVar111._20_4_ + auVar28._20_4_ * auVar28._20_4_);
    auVar49._24_4_ =
         fVar400 * (auVar27._24_4_ * auVar27._24_4_ +
                   auVar111._24_4_ * auVar111._24_4_ + auVar28._24_4_ * auVar28._24_4_);
    auVar49._28_4_ = auVar27._28_4_ + fVar317 + auVar28._28_4_;
    auVar50._4_4_ =
         (auVar113._4_4_ * auVar113._4_4_ +
         auVar129._4_4_ * auVar129._4_4_ + auVar148._4_4_ * auVar148._4_4_) * fVar355;
    auVar50._0_4_ =
         (auVar113._0_4_ * auVar113._0_4_ +
         auVar129._0_4_ * auVar129._0_4_ + auVar148._0_4_ * auVar148._0_4_) * fVar330;
    auVar50._8_4_ =
         (auVar113._8_4_ * auVar113._8_4_ +
         auVar129._8_4_ * auVar129._8_4_ + auVar148._8_4_ * auVar148._8_4_) * fVar371;
    auVar50._12_4_ =
         (auVar113._12_4_ * auVar113._12_4_ +
         auVar129._12_4_ * auVar129._12_4_ + auVar148._12_4_ * auVar148._12_4_) * fVar372;
    auVar50._16_4_ =
         (auVar113._16_4_ * auVar113._16_4_ +
         auVar129._16_4_ * auVar129._16_4_ + auVar148._16_4_ * auVar148._16_4_) * fVar393;
    auVar50._20_4_ =
         (auVar113._20_4_ * auVar113._20_4_ +
         auVar129._20_4_ * auVar129._20_4_ + auVar148._20_4_ * auVar148._20_4_) * fVar396;
    auVar50._24_4_ =
         (auVar113._24_4_ * auVar113._24_4_ +
         auVar129._24_4_ * auVar129._24_4_ + auVar148._24_4_ * auVar148._24_4_) * fVar400;
    auVar50._28_4_ = auVar110._28_4_ + auVar112._28_4_;
    auVar110 = vmaxps_avx(auVar49,auVar50);
    auVar129 = vperm2f128_avx(local_8e0,local_8e0,1);
    auVar129 = vshufps_avx(auVar129,local_8e0,0x30);
    auVar15 = vshufps_avx(local_8e0,auVar129,0x29);
    auVar152._0_4_ = (float)local_8e0._0_4_ + fVar260;
    auVar152._4_4_ = local_8e0._4_4_ + fVar261;
    auVar152._8_4_ = local_8e0._8_4_ + fVar262;
    auVar152._12_4_ = local_8e0._12_4_ + fVar283;
    auVar152._16_4_ = local_8e0._16_4_ + fVar285;
    auVar152._20_4_ = local_8e0._20_4_ + fVar287;
    auVar152._24_4_ = local_8e0._24_4_ + fVar269;
    auVar152._28_4_ = local_8e0._28_4_ + fVar322;
    auVar129 = vmaxps_avx(local_8e0,auVar152);
    auVar346 = vmaxps_avx(auVar13,auVar15);
    auVar129 = vmaxps_avx(auVar129,auVar346);
    auVar346 = vrsqrtps_avx(auVar221);
    fVar317 = auVar346._0_4_;
    fVar260 = auVar346._4_4_;
    fVar261 = auVar346._8_4_;
    fVar262 = auVar346._12_4_;
    fVar283 = auVar346._16_4_;
    fVar285 = auVar346._20_4_;
    fVar287 = auVar346._24_4_;
    auVar51._4_4_ = fVar260 * fVar260 * fVar260 * auVar221._4_4_ * 0.5;
    auVar51._0_4_ = fVar317 * fVar317 * fVar317 * auVar221._0_4_ * 0.5;
    auVar51._8_4_ = fVar261 * fVar261 * fVar261 * auVar221._8_4_ * 0.5;
    auVar51._12_4_ = fVar262 * fVar262 * fVar262 * auVar221._12_4_ * 0.5;
    auVar51._16_4_ = fVar283 * fVar283 * fVar283 * auVar221._16_4_ * 0.5;
    auVar51._20_4_ = fVar285 * fVar285 * fVar285 * auVar221._20_4_ * 0.5;
    auVar51._24_4_ = fVar287 * fVar287 * fVar287 * auVar221._24_4_ * 0.5;
    auVar51._28_4_ = auVar221._28_4_;
    auVar52._4_4_ = fVar260 * 1.5;
    auVar52._0_4_ = fVar317 * 1.5;
    auVar52._8_4_ = fVar261 * 1.5;
    auVar52._12_4_ = fVar262 * 1.5;
    auVar52._16_4_ = fVar283 * 1.5;
    auVar52._20_4_ = fVar285 * 1.5;
    auVar52._24_4_ = fVar287 * 1.5;
    auVar52._28_4_ = auVar346._28_4_;
    local_620 = vsubps_avx(auVar52,auVar51);
    local_a20 = vsubps_avx(ZEXT832(0) << 0x20,auVar89);
    auVar86._4_4_ = fVar197;
    auVar86._0_4_ = fVar178;
    auVar86._8_4_ = fVar198;
    auVar86._12_4_ = fVar199;
    auVar86._16_4_ = fVar200;
    auVar86._20_4_ = fVar201;
    auVar86._24_4_ = fVar202;
    auVar86._28_4_ = fVar203;
    local_a40 = vsubps_avx(ZEXT832(0) << 0x20,auVar86);
    fVar260 = local_a40._0_4_;
    fVar283 = local_a40._4_4_;
    fVar269 = local_a40._8_4_;
    fVar355 = local_a40._12_4_;
    fVar393 = local_a40._16_4_;
    fVar410 = local_a40._20_4_;
    fVar24 = local_a40._24_4_;
    fVar343 = local_a20._0_4_;
    fVar349 = local_a20._4_4_;
    fVar350 = local_a20._8_4_;
    fVar351 = local_a20._12_4_;
    fVar352 = local_a20._16_4_;
    fVar353 = local_a20._20_4_;
    fVar354 = local_a20._24_4_;
    auVar88._4_4_ = fVar331;
    auVar88._0_4_ = fVar323;
    auVar88._8_4_ = fVar333;
    auVar88._12_4_ = fVar335;
    auVar88._16_4_ = fVar337;
    auVar88._20_4_ = fVar339;
    auVar88._24_4_ = fVar341;
    auVar88._28_4_ = fVar342;
    auVar27 = vsubps_avx(ZEXT832(0) << 0x20,auVar88);
    fVar261 = auVar27._0_4_;
    fVar285 = auVar27._4_4_;
    fVar322 = auVar27._8_4_;
    fVar371 = auVar27._12_4_;
    fVar396 = auVar27._16_4_;
    fVar18 = auVar27._20_4_;
    fVar25 = auVar27._24_4_;
    auVar327._0_4_ =
         (float)local_960._0_4_ * fVar261 + fVar343 * fVar316 + (float)local_860._0_4_ * fVar260;
    auVar327._4_4_ =
         (float)local_960._4_4_ * fVar285 + fVar349 * fVar316 + (float)local_860._4_4_ * fVar283;
    auVar327._8_4_ = fStack_958 * fVar322 + fVar350 * fVar316 + fStack_858 * fVar269;
    auVar327._12_4_ = fStack_954 * fVar371 + fVar351 * fVar316 + fStack_854 * fVar355;
    auVar327._16_4_ = fStack_950 * fVar396 + fVar352 * fVar316 + fStack_850 * fVar393;
    auVar327._20_4_ = fStack_94c * fVar18 + fVar353 * fVar316 + fStack_84c * fVar410;
    auVar327._24_4_ = fStack_948 * fVar25 + fVar354 * fVar316 + fStack_848 * fVar24;
    auVar327._28_4_ = auVar148._28_4_ + auVar346._28_4_ + auVar221._28_4_;
    auVar378._0_4_ = fVar261 * fVar261 + fVar343 * fVar343 + fVar260 * fVar260;
    auVar378._4_4_ = fVar285 * fVar285 + fVar349 * fVar349 + fVar283 * fVar283;
    auVar378._8_4_ = fVar322 * fVar322 + fVar350 * fVar350 + fVar269 * fVar269;
    auVar378._12_4_ = fVar371 * fVar371 + fVar351 * fVar351 + fVar355 * fVar355;
    auVar378._16_4_ = fVar396 * fVar396 + fVar352 * fVar352 + fVar393 * fVar393;
    auVar378._20_4_ = fVar18 * fVar18 + fVar353 * fVar353 + fVar410 * fVar410;
    auVar378._24_4_ = fVar25 * fVar25 + fVar354 * fVar354 + fVar24 * fVar24;
    auVar378._28_4_ = fStack_1c4 + fStack_1c4 + auVar148._28_4_;
    fVar262 = local_620._0_4_;
    fVar287 = local_620._4_4_;
    fVar330 = local_620._8_4_;
    fVar372 = local_620._12_4_;
    fVar400 = local_620._16_4_;
    fVar291 = local_620._20_4_;
    fVar294 = local_620._24_4_;
    auVar112 = local_280;
    local_640._0_4_ =
         (float)local_960._0_4_ * fVar320 * fVar262 +
         fVar318 * fVar262 * fVar316 + fVar319 * fVar262 * (float)local_860._0_4_;
    local_640._4_4_ =
         (float)local_960._4_4_ * fVar268 * fVar287 +
         fVar264 * fVar287 * fVar316 + fVar266 * fVar287 * (float)local_860._4_4_;
    local_640._8_4_ =
         fStack_958 * fVar263 * fVar330 +
         fVar289 * fVar330 * fVar316 + fVar292 * fVar330 * fStack_858;
    local_640._12_4_ =
         fStack_954 * fVar336 * fVar372 +
         fVar332 * fVar372 * fVar316 + fVar334 * fVar372 * fStack_854;
    local_640._16_4_ =
         fStack_950 * fVar384 * fVar400 +
         fVar381 * fVar400 * fVar316 + fVar308 * fVar400 * fStack_850;
    local_640._20_4_ =
         fStack_94c * fVar407 * fVar291 +
         fVar405 * fVar291 * fVar316 + fVar406 * fVar291 * fStack_84c;
    local_640._24_4_ =
         fStack_948 * fVar21 * fVar294 + fVar19 * fVar294 * fVar316 + fVar20 * fVar294 * fStack_848;
    local_640._28_4_ = fStack_944 + fVar316 + fStack_844;
    fVar317 = fStack_944 + fVar316 + fStack_844;
    local_660._0_4_ =
         fVar261 * fVar320 * fVar262 + fVar343 * fVar318 * fVar262 + fVar319 * fVar262 * fVar260;
    local_660._4_4_ =
         fVar285 * fVar268 * fVar287 + fVar349 * fVar264 * fVar287 + fVar266 * fVar287 * fVar283;
    local_660._8_4_ =
         fVar322 * fVar263 * fVar330 + fVar350 * fVar289 * fVar330 + fVar292 * fVar330 * fVar269;
    local_660._12_4_ =
         fVar371 * fVar336 * fVar372 + fVar351 * fVar332 * fVar372 + fVar334 * fVar372 * fVar355;
    local_660._16_4_ =
         fVar396 * fVar384 * fVar400 + fVar352 * fVar381 * fVar400 + fVar308 * fVar400 * fVar393;
    local_660._20_4_ =
         fVar18 * fVar407 * fVar291 + fVar353 * fVar405 * fVar291 + fVar406 * fVar291 * fVar410;
    local_660._24_4_ =
         fVar25 * fVar21 * fVar294 + fVar354 * fVar19 * fVar294 + fVar20 * fVar294 * fVar24;
    local_660._28_4_ = fVar316 + fVar317;
    auVar53._4_4_ = local_640._4_4_ * local_660._4_4_;
    auVar53._0_4_ = local_640._0_4_ * local_660._0_4_;
    auVar53._8_4_ = local_640._8_4_ * local_660._8_4_;
    auVar53._12_4_ = local_640._12_4_ * local_660._12_4_;
    auVar53._16_4_ = local_640._16_4_ * local_660._16_4_;
    auVar53._20_4_ = local_640._20_4_ * local_660._20_4_;
    auVar53._24_4_ = local_640._24_4_ * local_660._24_4_;
    auVar53._28_4_ = fVar317;
    auVar27 = vsubps_avx(auVar327,auVar53);
    auVar54._4_4_ = local_660._4_4_ * local_660._4_4_;
    auVar54._0_4_ = local_660._0_4_ * local_660._0_4_;
    auVar54._8_4_ = local_660._8_4_ * local_660._8_4_;
    auVar54._12_4_ = local_660._12_4_ * local_660._12_4_;
    auVar54._16_4_ = local_660._16_4_ * local_660._16_4_;
    auVar54._20_4_ = local_660._20_4_ * local_660._20_4_;
    auVar54._24_4_ = local_660._24_4_ * local_660._24_4_;
    auVar54._28_4_ = fVar316;
    auVar28 = vsubps_avx(auVar378,auVar54);
    auVar346 = vsqrtps_avx(auVar110);
    fVar317 = (auVar346._0_4_ + auVar129._0_4_) * 1.0000002;
    fVar164 = (auVar346._4_4_ + auVar129._4_4_) * 1.0000002;
    fVar167 = (auVar346._8_4_ + auVar129._8_4_) * 1.0000002;
    fVar170 = (auVar346._12_4_ + auVar129._12_4_) * 1.0000002;
    fVar172 = (auVar346._16_4_ + auVar129._16_4_) * 1.0000002;
    fVar174 = (auVar346._20_4_ + auVar129._20_4_) * 1.0000002;
    fVar176 = (auVar346._24_4_ + auVar129._24_4_) * 1.0000002;
    auVar55._4_4_ = fVar164 * fVar164;
    auVar55._0_4_ = fVar317 * fVar317;
    auVar55._8_4_ = fVar167 * fVar167;
    auVar55._12_4_ = fVar170 * fVar170;
    auVar55._16_4_ = fVar172 * fVar172;
    auVar55._20_4_ = fVar174 * fVar174;
    auVar55._24_4_ = fVar176 * fVar176;
    auVar55._28_4_ = auVar346._28_4_ + auVar129._28_4_;
    local_3a0._0_4_ = auVar27._0_4_ + auVar27._0_4_;
    local_3a0._4_4_ = auVar27._4_4_ + auVar27._4_4_;
    local_3a0._8_4_ = auVar27._8_4_ + auVar27._8_4_;
    local_3a0._12_4_ = auVar27._12_4_ + auVar27._12_4_;
    local_3a0._16_4_ = auVar27._16_4_ + auVar27._16_4_;
    local_3a0._20_4_ = auVar27._20_4_ + auVar27._20_4_;
    local_3a0._24_4_ = auVar27._24_4_ + auVar27._24_4_;
    fVar317 = auVar27._28_4_;
    local_3a0._28_4_ = fVar317 + fVar317;
    auVar129 = vsubps_avx(auVar28,auVar55);
    auVar56._4_4_ = local_640._4_4_ * local_640._4_4_;
    auVar56._0_4_ = local_640._0_4_ * local_640._0_4_;
    auVar56._8_4_ = local_640._8_4_ * local_640._8_4_;
    auVar56._12_4_ = local_640._12_4_ * local_640._12_4_;
    auVar56._16_4_ = local_640._16_4_ * local_640._16_4_;
    auVar56._20_4_ = local_640._20_4_ * local_640._20_4_;
    auVar56._24_4_ = local_640._24_4_ * local_640._24_4_;
    auVar56._28_4_ = fVar317;
    auVar27 = vsubps_avx(local_260,auVar56);
    auVar57._4_4_ = local_3a0._4_4_ * local_3a0._4_4_;
    auVar57._0_4_ = local_3a0._0_4_ * local_3a0._0_4_;
    auVar57._8_4_ = local_3a0._8_4_ * local_3a0._8_4_;
    auVar57._12_4_ = local_3a0._12_4_ * local_3a0._12_4_;
    auVar57._16_4_ = local_3a0._16_4_ * local_3a0._16_4_;
    auVar57._20_4_ = local_3a0._20_4_ * local_3a0._20_4_;
    auVar57._24_4_ = local_3a0._24_4_ * local_3a0._24_4_;
    auVar57._28_4_ = local_260._28_4_;
    fVar317 = auVar27._0_4_;
    fVar164 = auVar27._4_4_;
    fVar167 = auVar27._8_4_;
    fVar170 = auVar27._12_4_;
    fVar172 = auVar27._16_4_;
    fVar174 = auVar27._20_4_;
    fVar176 = auVar27._24_4_;
    auVar58._4_4_ = auVar129._4_4_ * fVar164 * 4.0;
    auVar58._0_4_ = auVar129._0_4_ * fVar317 * 4.0;
    auVar58._8_4_ = auVar129._8_4_ * fVar167 * 4.0;
    auVar58._12_4_ = auVar129._12_4_ * fVar170 * 4.0;
    auVar58._16_4_ = auVar129._16_4_ * fVar172 * 4.0;
    auVar58._20_4_ = auVar129._20_4_ * fVar174 * 4.0;
    auVar58._24_4_ = auVar129._24_4_ * fVar176 * 4.0;
    auVar58._28_4_ = 0x40800000;
    auVar111 = vsubps_avx(auVar57,auVar58);
    auVar110 = vcmpps_avx(auVar111,ZEXT832(0) << 0x20,5);
    auVar115._8_4_ = 0x7fffffff;
    auVar115._0_8_ = 0x7fffffff7fffffff;
    auVar115._12_4_ = 0x7fffffff;
    auVar115._16_4_ = 0x7fffffff;
    auVar115._20_4_ = 0x7fffffff;
    auVar115._24_4_ = 0x7fffffff;
    auVar115._28_4_ = 0x7fffffff;
    local_2a0 = vandps_avx(auVar56,auVar115);
    local_300._0_4_ = fVar317 + fVar317;
    local_300._4_4_ = fVar164 + fVar164;
    local_300._8_4_ = fVar167 + fVar167;
    local_300._12_4_ = fVar170 + fVar170;
    local_300._16_4_ = fVar172 + fVar172;
    local_300._20_4_ = fVar174 + fVar174;
    local_300._24_4_ = fVar176 + fVar176;
    local_300._28_4_ = auVar27._28_4_ + auVar27._28_4_;
    local_2c0 = vandps_avx(auVar27,auVar115);
    uVar98 = CONCAT44(local_3a0._4_4_,local_3a0._0_4_);
    local_2e0._0_8_ = uVar98 ^ 0x8000000080000000;
    local_2e0._8_4_ = -local_3a0._8_4_;
    local_2e0._12_4_ = -local_3a0._12_4_;
    local_2e0._16_4_ = -local_3a0._16_4_;
    local_2e0._20_4_ = -local_3a0._20_4_;
    local_2e0._24_4_ = -local_3a0._24_4_;
    local_2e0._28_4_ = -local_3a0._28_4_;
    if ((((((((auVar110 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar110 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar110 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar110 >> 0x7f,0) == '\0') &&
          (auVar110 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar110 >> 0xbf,0) == '\0') &&
        (auVar110 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar110[0x1f])
    {
      auVar239._8_4_ = 0x7f800000;
      auVar239._0_8_ = 0x7f8000007f800000;
      auVar239._12_4_ = 0x7f800000;
      auVar239._16_4_ = 0x7f800000;
      auVar239._20_4_ = 0x7f800000;
      auVar239._24_4_ = 0x7f800000;
      auVar239._28_4_ = 0x7f800000;
      auVar153._8_4_ = 0xff800000;
      auVar153._0_8_ = 0xff800000ff800000;
      auVar153._12_4_ = 0xff800000;
      auVar153._16_4_ = 0xff800000;
      auVar153._20_4_ = 0xff800000;
      auVar153._24_4_ = 0xff800000;
      auVar153._28_4_ = 0xff800000;
    }
    else {
      auVar148 = vsqrtps_avx(auVar111);
      auVar113 = vrcpps_avx(local_300);
      auVar27 = vcmpps_avx(auVar111,ZEXT832(0) << 0x20,5);
      fVar134 = auVar113._0_4_;
      fVar165 = auVar113._4_4_;
      auVar59._4_4_ = local_300._4_4_ * fVar165;
      auVar59._0_4_ = local_300._0_4_ * fVar134;
      fVar168 = auVar113._8_4_;
      auVar59._8_4_ = local_300._8_4_ * fVar168;
      fVar171 = auVar113._12_4_;
      auVar59._12_4_ = local_300._12_4_ * fVar171;
      fVar173 = auVar113._16_4_;
      auVar59._16_4_ = local_300._16_4_ * fVar173;
      fVar175 = auVar113._20_4_;
      auVar59._20_4_ = local_300._20_4_ * fVar175;
      fVar177 = auVar113._24_4_;
      auVar59._24_4_ = local_300._24_4_ * fVar177;
      auVar59._28_4_ = auVar111._28_4_;
      auVar116._8_4_ = 0x3f800000;
      auVar116._0_8_ = 0x3f8000003f800000;
      auVar116._12_4_ = 0x3f800000;
      auVar116._16_4_ = 0x3f800000;
      auVar116._20_4_ = 0x3f800000;
      auVar116._24_4_ = 0x3f800000;
      auVar116._28_4_ = 0x3f800000;
      auVar111 = vsubps_avx(auVar116,auVar59);
      fVar134 = fVar134 + fVar134 * auVar111._0_4_;
      fVar165 = fVar165 + fVar165 * auVar111._4_4_;
      fVar168 = fVar168 + fVar168 * auVar111._8_4_;
      fVar171 = fVar171 + fVar171 * auVar111._12_4_;
      fVar173 = fVar173 + fVar173 * auVar111._16_4_;
      fVar175 = fVar175 + fVar175 * auVar111._20_4_;
      fVar177 = fVar177 + fVar177 * auVar111._24_4_;
      auVar149 = vsubps_avx(local_2e0,auVar148);
      fVar271 = auVar149._0_4_ * fVar134;
      fVar282 = auVar149._4_4_ * fVar165;
      auVar60._4_4_ = fVar282;
      auVar60._0_4_ = fVar271;
      fVar284 = auVar149._8_4_ * fVar168;
      auVar60._8_4_ = fVar284;
      fVar286 = auVar149._12_4_ * fVar171;
      auVar60._12_4_ = fVar286;
      fVar288 = auVar149._16_4_ * fVar173;
      auVar60._16_4_ = fVar288;
      fVar290 = auVar149._20_4_ * fVar175;
      auVar60._20_4_ = fVar290;
      fVar293 = auVar149._24_4_ * fVar177;
      auVar60._24_4_ = fVar293;
      auVar60._28_4_ = auVar149._28_4_;
      auVar148 = vsubps_avx(auVar148,local_3a0);
      fVar134 = auVar148._0_4_ * fVar134;
      fVar165 = auVar148._4_4_ * fVar165;
      auVar61._4_4_ = fVar165;
      auVar61._0_4_ = fVar134;
      fVar168 = auVar148._8_4_ * fVar168;
      auVar61._8_4_ = fVar168;
      fVar171 = auVar148._12_4_ * fVar171;
      auVar61._12_4_ = fVar171;
      fVar173 = auVar148._16_4_ * fVar173;
      auVar61._16_4_ = fVar173;
      fVar175 = auVar148._20_4_ * fVar175;
      auVar61._20_4_ = fVar175;
      fVar177 = auVar148._24_4_ * fVar177;
      auVar61._24_4_ = fVar177;
      auVar61._28_4_ = auVar113._28_4_ + auVar111._28_4_;
      local_360 = fVar262 * (local_660._0_4_ + local_640._0_4_ * fVar271);
      fStack_35c = fVar287 * (local_660._4_4_ + local_640._4_4_ * fVar282);
      fStack_358 = fVar330 * (local_660._8_4_ + local_640._8_4_ * fVar284);
      fStack_354 = fVar372 * (local_660._12_4_ + local_640._12_4_ * fVar286);
      fStack_350 = fVar400 * (local_660._16_4_ + local_640._16_4_ * fVar288);
      fStack_34c = fVar291 * (local_660._20_4_ + local_640._20_4_ * fVar290);
      fStack_348 = fVar294 * (local_660._24_4_ + local_640._24_4_ * fVar293);
      fStack_344 = local_2e0._28_4_;
      local_380 = fVar262 * (local_660._0_4_ + local_640._0_4_ * fVar134);
      fStack_37c = fVar287 * (local_660._4_4_ + local_640._4_4_ * fVar165);
      fStack_378 = fVar330 * (local_660._8_4_ + local_640._8_4_ * fVar168);
      fStack_374 = fVar372 * (local_660._12_4_ + local_640._12_4_ * fVar171);
      fStack_370 = fVar400 * (local_660._16_4_ + local_640._16_4_ * fVar173);
      fStack_36c = fVar291 * (local_660._20_4_ + local_640._20_4_ * fVar175);
      fStack_368 = fVar294 * (local_660._24_4_ + local_640._24_4_ * fVar177);
      fStack_364 = local_2e0._28_4_;
      auVar254._8_4_ = 0x7f800000;
      auVar254._0_8_ = 0x7f8000007f800000;
      auVar254._12_4_ = 0x7f800000;
      auVar254._16_4_ = 0x7f800000;
      auVar254._20_4_ = 0x7f800000;
      auVar254._24_4_ = 0x7f800000;
      auVar254._28_4_ = 0x7f800000;
      auVar239 = vblendvps_avx(auVar254,auVar60,auVar27);
      auVar255._8_4_ = 0xff800000;
      auVar255._0_8_ = 0xff800000ff800000;
      auVar255._12_4_ = 0xff800000;
      auVar255._16_4_ = 0xff800000;
      auVar255._20_4_ = 0xff800000;
      auVar255._24_4_ = 0xff800000;
      auVar255._28_4_ = 0xff800000;
      auVar153 = vblendvps_avx(auVar255,auVar61,auVar27);
      auVar111 = vmaxps_avx(local_5c0,local_2a0);
      auVar62._4_4_ = auVar111._4_4_ * 1.9073486e-06;
      auVar62._0_4_ = auVar111._0_4_ * 1.9073486e-06;
      auVar62._8_4_ = auVar111._8_4_ * 1.9073486e-06;
      auVar62._12_4_ = auVar111._12_4_ * 1.9073486e-06;
      auVar62._16_4_ = auVar111._16_4_ * 1.9073486e-06;
      auVar62._20_4_ = auVar111._20_4_ * 1.9073486e-06;
      auVar62._24_4_ = auVar111._24_4_ * 1.9073486e-06;
      auVar62._28_4_ = auVar111._28_4_;
      auVar111 = vcmpps_avx(local_2c0,auVar62,1);
      auVar113 = auVar27 & auVar111;
      if ((((((((auVar113 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar113 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar113 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar113 >> 0x7f,0) != '\0') ||
            (auVar113 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar113 >> 0xbf,0) != '\0') ||
          (auVar113 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar113[0x1f] < '\0') {
        auVar110 = vandps_avx(auVar111,auVar27);
        auVar209 = vpackssdw_avx(auVar110._0_16_,auVar110._16_16_);
        auVar111 = vcmpps_avx(auVar129,ZEXT432(0) << 0x20,2);
        auVar301._8_4_ = 0xff800000;
        auVar301._0_8_ = 0xff800000ff800000;
        auVar301._12_4_ = 0xff800000;
        auVar301._16_4_ = 0xff800000;
        auVar301._20_4_ = 0xff800000;
        auVar301._24_4_ = 0xff800000;
        auVar301._28_4_ = 0xff800000;
        auVar379._8_4_ = 0x7f800000;
        auVar379._0_8_ = 0x7f8000007f800000;
        auVar379._12_4_ = 0x7f800000;
        auVar379._16_4_ = 0x7f800000;
        auVar379._20_4_ = 0x7f800000;
        auVar379._24_4_ = 0x7f800000;
        auVar379._28_4_ = 0x7f800000;
        auVar129 = vblendvps_avx(auVar379,auVar301,auVar111);
        auVar225 = vpmovsxwd_avx(auVar209);
        auVar209 = vpunpckhwd_avx(auVar209,auVar209);
        auVar259._16_16_ = auVar209;
        auVar259._0_16_ = auVar225;
        auVar239 = vblendvps_avx(auVar239,auVar129,auVar259);
        auVar129 = vblendvps_avx(auVar301,auVar379,auVar111);
        auVar153 = vblendvps_avx(auVar153,auVar129,auVar259);
        auVar245._0_8_ = auVar110._0_8_ ^ 0xffffffffffffffff;
        auVar245._8_4_ = auVar110._8_4_ ^ 0xffffffff;
        auVar245._12_4_ = auVar110._12_4_ ^ 0xffffffff;
        auVar245._16_4_ = auVar110._16_4_ ^ 0xffffffff;
        auVar245._20_4_ = auVar110._20_4_ ^ 0xffffffff;
        auVar245._24_4_ = auVar110._24_4_ ^ 0xffffffff;
        auVar245._28_4_ = auVar110._28_4_ ^ 0xffffffff;
        auVar110 = vorps_avx(auVar111,auVar245);
        auVar110 = vandps_avx(auVar27,auVar110);
      }
    }
    auVar314 = ZEXT3264(local_660);
    auVar348 = ZEXT3264(auVar403);
    auVar380 = ZEXT3264(auVar377);
    auVar129 = local_5a0 & auVar110;
    auVar364 = ZEXT3264(local_aa0);
    fVar134 = (float)local_9e0._0_4_;
    fVar165 = (float)local_9e0._4_4_;
    fVar168 = fStack_9d8;
    fVar171 = fStack_9d4;
    fVar173 = fStack_9d0;
    fVar175 = fStack_9cc;
    fVar177 = fStack_9c8;
    fVar271 = fStack_9c4;
    if ((((((((auVar129 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar129 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar129 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar129 >> 0x7f,0) == '\0') &&
          (auVar129 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar129 >> 0xbf,0) == '\0') &&
        (auVar129 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar129[0x1f])
    {
      auVar246 = ZEXT3264(CONCAT428(0x3f800000,
                                    CONCAT424(0x3f800000,
                                              CONCAT420(0x3f800000,
                                                        CONCAT416(0x3f800000,
                                                                  CONCAT412(0x3f800000,
                                                                            CONCAT48(0x3f800000,
                                                                                                                                                                          
                                                  0x3f8000003f800000)))))));
    }
    else {
      auVar246 = ZEXT464((uint)*(float *)(ray + k * 4 + 0x100));
      auVar209 = ZEXT416((uint)(*(float *)(ray + k * 4 + 0x100) - (float)local_9a0._0_4_));
      auVar209 = vshufps_avx(auVar209,auVar209,0);
      auVar256._16_16_ = auVar209;
      auVar256._0_16_ = auVar209;
      auVar113 = vminps_avx(auVar256,auVar153);
      auVar117._0_4_ =
           (float)local_960._0_4_ * fVar295 + fVar316 * fVar356 + (float)local_860._0_4_ * fVar373;
      auVar117._4_4_ =
           (float)local_960._4_4_ * fVar302 + fVar316 * fVar365 + (float)local_860._4_4_ * fVar382;
      auVar117._8_4_ = fStack_958 * fVar303 + fVar316 * fVar366 + fStack_858 * fVar385;
      auVar117._12_4_ = fStack_954 * fVar304 + fVar316 * fVar367 + fStack_854 * fVar388;
      auVar117._16_4_ = fStack_950 * fVar305 + fVar316 * fVar368 + fStack_850 * fVar391;
      auVar117._20_4_ = fStack_94c * fVar306 + fVar316 * fVar369 + fStack_84c * fVar394;
      auVar117._24_4_ = fStack_948 * fVar307 + fVar316 * fVar370 + fStack_848 * fVar397;
      auVar117._28_4_ = fVar399 + fStack_1e4 + fVar399;
      auVar111 = vrcpps_avx(auVar117);
      fVar399 = auVar111._0_4_;
      fVar282 = auVar111._4_4_;
      auVar63._4_4_ = auVar117._4_4_ * fVar282;
      auVar63._0_4_ = auVar117._0_4_ * fVar399;
      fVar284 = auVar111._8_4_;
      auVar63._8_4_ = auVar117._8_4_ * fVar284;
      fVar286 = auVar111._12_4_;
      auVar63._12_4_ = auVar117._12_4_ * fVar286;
      fVar288 = auVar111._16_4_;
      auVar63._16_4_ = auVar117._16_4_ * fVar288;
      fVar290 = auVar111._20_4_;
      auVar63._20_4_ = auVar117._20_4_ * fVar290;
      fVar293 = auVar111._24_4_;
      auVar63._24_4_ = auVar117._24_4_ * fVar293;
      auVar63._28_4_ = fStack_9c4 + auVar209._12_4_;
      auVar361._8_4_ = 0x3f800000;
      auVar361._0_8_ = 0x3f8000003f800000;
      auVar361._12_4_ = 0x3f800000;
      auVar361._16_4_ = 0x3f800000;
      auVar361._20_4_ = 0x3f800000;
      auVar361._24_4_ = 0x3f800000;
      auVar361._28_4_ = 0x3f800000;
      auVar148 = vsubps_avx(auVar361,auVar63);
      auVar299._8_4_ = 0x7fffffff;
      auVar299._0_8_ = 0x7fffffff7fffffff;
      auVar299._12_4_ = 0x7fffffff;
      auVar299._16_4_ = 0x7fffffff;
      auVar299._20_4_ = 0x7fffffff;
      auVar299._24_4_ = 0x7fffffff;
      auVar299._28_4_ = 0x7fffffff;
      auVar129 = vandps_avx(auVar117,auVar299);
      auVar345._8_4_ = 0x219392ef;
      auVar345._0_8_ = 0x219392ef219392ef;
      auVar345._12_4_ = 0x219392ef;
      auVar345._16_4_ = 0x219392ef;
      auVar345._20_4_ = 0x219392ef;
      auVar345._24_4_ = 0x219392ef;
      auVar345._28_4_ = 0x219392ef;
      auVar27 = vcmpps_avx(auVar129,auVar345,1);
      auVar64._4_4_ =
           (fVar282 + fVar282 * auVar148._4_4_) *
           -(fVar302 * fVar285 + fVar365 * fVar349 + fVar382 * fVar283);
      auVar64._0_4_ =
           (fVar399 + fVar399 * auVar148._0_4_) *
           -(fVar295 * fVar261 + fVar356 * fVar343 + fVar373 * fVar260);
      auVar64._8_4_ =
           (fVar284 + fVar284 * auVar148._8_4_) *
           -(fVar303 * fVar322 + fVar366 * fVar350 + fVar385 * fVar269);
      auVar64._12_4_ =
           (fVar286 + fVar286 * auVar148._12_4_) *
           -(fVar304 * fVar371 + fVar367 * fVar351 + fVar388 * fVar355);
      auVar64._16_4_ =
           (fVar288 + fVar288 * auVar148._16_4_) *
           -(fVar305 * fVar396 + fVar368 * fVar352 + fVar391 * fVar393);
      auVar64._20_4_ =
           (fVar290 + fVar290 * auVar148._20_4_) *
           -(fVar306 * fVar18 + fVar369 * fVar353 + fVar394 * fVar410);
      auVar64._24_4_ =
           (fVar293 + fVar293 * auVar148._24_4_) *
           -(fVar307 * fVar25 + fVar370 * fVar354 + fVar397 * fVar24);
      auVar64._28_4_ = auVar111._28_4_ + auVar148._28_4_;
      auVar209 = ZEXT816(0) << 0x40;
      auVar129 = vcmpps_avx(auVar117,ZEXT1632(auVar209),1);
      auVar129 = vorps_avx(auVar27,auVar129);
      auVar404._8_4_ = 0xff800000;
      auVar404._0_8_ = 0xff800000ff800000;
      auVar404._12_4_ = 0xff800000;
      auVar404._16_4_ = 0xff800000;
      auVar404._20_4_ = 0xff800000;
      auVar404._24_4_ = 0xff800000;
      auVar404._28_4_ = 0xff800000;
      auVar129 = vblendvps_avx(auVar64,auVar404,auVar129);
      auVar111 = vcmpps_avx(auVar117,ZEXT1632(auVar209),6);
      auVar27 = vorps_avx(auVar27,auVar111);
      auVar412._8_4_ = 0x7f800000;
      auVar412._0_8_ = 0x7f8000007f800000;
      auVar412._12_4_ = 0x7f800000;
      auVar412._16_4_ = 0x7f800000;
      auVar412._20_4_ = 0x7f800000;
      auVar412._24_4_ = 0x7f800000;
      auVar412._28_4_ = 0x7f800000;
      auVar27 = vblendvps_avx(auVar64,auVar412,auVar27);
      auVar111 = vmaxps_avx(local_320,auVar239);
      auVar111 = vmaxps_avx(auVar111,auVar129);
      auVar27 = vminps_avx(auVar113,auVar27);
      auVar314 = ZEXT3264(auVar27);
      auVar148 = ZEXT1632(auVar209);
      auVar129 = vsubps_avx(auVar148,auVar11);
      auVar11 = vsubps_avx(auVar148,auVar12);
      auVar65._4_4_ = auVar11._4_4_ * -fVar383;
      auVar65._0_4_ = auVar11._0_4_ * -fVar374;
      auVar65._8_4_ = auVar11._8_4_ * -fVar386;
      auVar65._12_4_ = auVar11._12_4_ * -fVar389;
      auVar65._16_4_ = auVar11._16_4_ * -fVar392;
      auVar65._20_4_ = auVar11._20_4_ * -fVar395;
      auVar65._24_4_ = auVar11._24_4_ * -fVar398;
      auVar65._28_4_ = auVar11._28_4_;
      auVar66._4_4_ = fVar270 * auVar129._4_4_;
      auVar66._0_4_ = fVar321 * auVar129._0_4_;
      auVar66._8_4_ = fVar265 * auVar129._8_4_;
      auVar66._12_4_ = fVar338 * auVar129._12_4_;
      auVar66._16_4_ = fVar387 * auVar129._16_4_;
      auVar66._20_4_ = fVar408 * auVar129._20_4_;
      auVar66._24_4_ = fVar22 * auVar129._24_4_;
      auVar66._28_4_ = auVar129._28_4_;
      auVar129 = vsubps_avx(auVar65,auVar66);
      auVar11 = vsubps_avx(auVar148,auVar14);
      auVar67._4_4_ = fVar281 * auVar11._4_4_;
      auVar67._0_4_ = fVar247 * auVar11._0_4_;
      auVar67._8_4_ = fVar267 * auVar11._8_4_;
      auVar67._12_4_ = fVar340 * auVar11._12_4_;
      auVar67._16_4_ = fVar390 * auVar11._16_4_;
      auVar67._20_4_ = fVar409 * auVar11._20_4_;
      uVar1 = auVar11._28_4_;
      auVar67._24_4_ = fVar23 * auVar11._24_4_;
      auVar67._28_4_ = uVar1;
      auVar12 = vsubps_avx(auVar129,auVar67);
      auVar68._4_4_ = (float)local_860._4_4_ * -fVar383;
      auVar68._0_4_ = (float)local_860._0_4_ * -fVar374;
      auVar68._8_4_ = fStack_858 * -fVar386;
      auVar68._12_4_ = fStack_854 * -fVar389;
      auVar68._16_4_ = fStack_850 * -fVar392;
      auVar68._20_4_ = fStack_84c * -fVar395;
      auVar68._24_4_ = fStack_848 * -fVar398;
      auVar68._28_4_ = uVar97 ^ 0x80000000;
      auVar69._4_4_ = fVar316 * fVar270;
      auVar69._0_4_ = fVar316 * fVar321;
      auVar69._8_4_ = fVar316 * fVar265;
      auVar69._12_4_ = fVar316 * fVar338;
      auVar69._16_4_ = fVar316 * fVar387;
      auVar69._20_4_ = fVar316 * fVar408;
      auVar69._24_4_ = fVar316 * fVar22;
      auVar69._28_4_ = uVar1;
      auVar129 = vsubps_avx(auVar68,auVar69);
      auVar70._4_4_ = (float)local_960._4_4_ * fVar281;
      auVar70._0_4_ = (float)local_960._0_4_ * fVar247;
      auVar70._8_4_ = fStack_958 * fVar267;
      auVar70._12_4_ = fStack_954 * fVar340;
      auVar70._16_4_ = fStack_950 * fVar390;
      auVar70._20_4_ = fStack_94c * fVar409;
      auVar70._24_4_ = fStack_948 * fVar23;
      auVar70._28_4_ = uVar1;
      auVar14 = vsubps_avx(auVar129,auVar70);
      auVar129 = vrcpps_avx(auVar14);
      fVar321 = auVar129._0_4_;
      fVar247 = auVar129._4_4_;
      auVar71._4_4_ = auVar14._4_4_ * fVar247;
      auVar71._0_4_ = auVar14._0_4_ * fVar321;
      fVar260 = auVar129._8_4_;
      auVar71._8_4_ = auVar14._8_4_ * fVar260;
      fVar261 = auVar129._12_4_;
      auVar71._12_4_ = auVar14._12_4_ * fVar261;
      fVar270 = auVar129._16_4_;
      auVar71._16_4_ = auVar14._16_4_ * fVar270;
      fVar281 = auVar129._20_4_;
      auVar71._20_4_ = auVar14._20_4_ * fVar281;
      fVar283 = auVar129._24_4_;
      auVar71._24_4_ = auVar14._24_4_ * fVar283;
      auVar71._28_4_ = fStack_944;
      auVar113 = vsubps_avx(auVar361,auVar71);
      auVar118._8_4_ = 0x7fffffff;
      auVar118._0_8_ = 0x7fffffff7fffffff;
      auVar118._12_4_ = 0x7fffffff;
      auVar118._16_4_ = 0x7fffffff;
      auVar118._20_4_ = 0x7fffffff;
      auVar118._24_4_ = 0x7fffffff;
      auVar118._28_4_ = 0x7fffffff;
      auVar129 = vandps_avx(auVar14,auVar118);
      auVar119._8_4_ = 0x219392ef;
      auVar119._0_8_ = 0x219392ef219392ef;
      auVar119._12_4_ = 0x219392ef;
      auVar119._16_4_ = 0x219392ef;
      auVar119._20_4_ = 0x219392ef;
      auVar119._24_4_ = 0x219392ef;
      auVar119._28_4_ = 0x219392ef;
      auVar11 = vcmpps_avx(auVar129,auVar119,1);
      auVar72._4_4_ = (fVar247 + fVar247 * auVar113._4_4_) * -auVar12._4_4_;
      auVar72._0_4_ = (fVar321 + fVar321 * auVar113._0_4_) * -auVar12._0_4_;
      auVar72._8_4_ = (fVar260 + fVar260 * auVar113._8_4_) * -auVar12._8_4_;
      auVar72._12_4_ = (fVar261 + fVar261 * auVar113._12_4_) * -auVar12._12_4_;
      auVar72._16_4_ = (fVar270 + fVar270 * auVar113._16_4_) * -auVar12._16_4_;
      auVar72._20_4_ = (fVar281 + fVar281 * auVar113._20_4_) * -auVar12._20_4_;
      auVar72._24_4_ = (fVar283 + fVar283 * auVar113._24_4_) * -auVar12._24_4_;
      auVar72._28_4_ = auVar12._28_4_ ^ 0x80000000;
      auVar129 = vcmpps_avx(auVar14,auVar148,1);
      auVar129 = vorps_avx(auVar11,auVar129);
      auVar129 = vblendvps_avx(auVar72,auVar404,auVar129);
      local_880 = vmaxps_avx(auVar111,auVar129);
      auVar129 = vcmpps_avx(auVar14,ZEXT1632(auVar209),6);
      auVar129 = vorps_avx(auVar11,auVar129);
      auVar129 = vblendvps_avx(auVar72,auVar412,auVar129);
      auVar110 = vandps_avx(local_5a0,auVar110);
      local_3c0 = vminps_avx(auVar27,auVar129);
      auVar129 = vcmpps_avx(local_880,local_3c0,2);
      auVar11 = auVar110 & auVar129;
      if ((((((((auVar11 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar11 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar11 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar11 >> 0x7f,0) == '\0') &&
            (auVar11 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar11 >> 0xbf,0) == '\0') &&
          (auVar11 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar11[0x1f])
      {
        auVar246 = ZEXT3264(auVar361);
        auVar348 = ZEXT3264(auVar403);
        auVar364 = ZEXT3264(local_aa0);
        auVar380 = ZEXT3264(auVar377);
      }
      else {
        auVar11 = vminps_avx(local_8e0,auVar152);
        auVar12 = vminps_avx(auVar13,auVar15);
        auVar11 = vminps_avx(auVar11,auVar12);
        auVar346 = vsubps_avx(auVar11,auVar346);
        auVar110 = vandps_avx(auVar129,auVar110);
        auVar91._4_4_ = fStack_35c;
        auVar91._0_4_ = local_360;
        auVar91._8_4_ = fStack_358;
        auVar91._12_4_ = fStack_354;
        auVar91._16_4_ = fStack_350;
        auVar91._20_4_ = fStack_34c;
        auVar91._24_4_ = fStack_348;
        auVar91._28_4_ = fStack_344;
        auVar129 = vminps_avx(auVar91,auVar361);
        auVar234 = SUB6428(ZEXT864(0),0) << 0x20;
        auVar129 = vmaxps_avx(auVar129,ZEXT832(0) << 0x20);
        local_1a0[0] = fVar101 + fVar133 * (auVar129._0_4_ + 0.0) * 0.125;
        local_1a0[1] = fVar131 + fVar163 * (auVar129._4_4_ + 1.0) * 0.125;
        local_1a0[2] = fVar132 + fVar166 * (auVar129._8_4_ + 2.0) * 0.125;
        local_1a0[3] = fStack_a64 + fVar169 * (auVar129._12_4_ + 3.0) * 0.125;
        fStack_190 = fVar101 + fVar133 * (auVar129._16_4_ + 4.0) * 0.125;
        fStack_18c = fVar131 + fVar163 * (auVar129._20_4_ + 5.0) * 0.125;
        fStack_188 = fVar132 + fVar166 * (auVar129._24_4_ + 6.0) * 0.125;
        fStack_184 = fStack_a64 + auVar129._28_4_ + 7.0;
        auVar90._4_4_ = fStack_37c;
        auVar90._0_4_ = local_380;
        auVar90._8_4_ = fStack_378;
        auVar90._12_4_ = fStack_374;
        auVar90._16_4_ = fStack_370;
        auVar90._20_4_ = fStack_36c;
        auVar90._24_4_ = fStack_368;
        auVar90._28_4_ = fStack_364;
        auVar129 = vminps_avx(auVar90,auVar361);
        auVar129 = vmaxps_avx(auVar129,ZEXT832(0) << 0x20);
        local_1c0[0] = fVar101 + fVar133 * (auVar129._0_4_ + 0.0) * 0.125;
        local_1c0[1] = fVar131 + fVar163 * (auVar129._4_4_ + 1.0) * 0.125;
        local_1c0[2] = fVar132 + fVar166 * (auVar129._8_4_ + 2.0) * 0.125;
        local_1c0[3] = fStack_a64 + fVar169 * (auVar129._12_4_ + 3.0) * 0.125;
        fStack_1b0 = fVar101 + fVar133 * (auVar129._16_4_ + 4.0) * 0.125;
        fStack_1ac = fVar131 + fVar163 * (auVar129._20_4_ + 5.0) * 0.125;
        fStack_1a8 = fVar132 + fVar166 * (auVar129._24_4_ + 6.0) * 0.125;
        fStack_1a4 = fStack_a64 + auVar129._28_4_ + 7.0;
        auVar73._4_4_ = auVar346._4_4_ * 0.99999976;
        auVar73._0_4_ = auVar346._0_4_ * 0.99999976;
        auVar73._8_4_ = auVar346._8_4_ * 0.99999976;
        auVar73._12_4_ = auVar346._12_4_ * 0.99999976;
        auVar73._16_4_ = auVar346._16_4_ * 0.99999976;
        auVar73._20_4_ = auVar346._20_4_ * 0.99999976;
        auVar73._24_4_ = auVar346._24_4_ * 0.99999976;
        auVar73._28_4_ = 0x3f7ffffc;
        auVar129 = vmaxps_avx(ZEXT832(0) << 0x20,auVar73);
        auVar74._4_4_ = auVar129._4_4_ * auVar129._4_4_;
        auVar74._0_4_ = auVar129._0_4_ * auVar129._0_4_;
        auVar74._8_4_ = auVar129._8_4_ * auVar129._8_4_;
        auVar74._12_4_ = auVar129._12_4_ * auVar129._12_4_;
        auVar74._16_4_ = auVar129._16_4_ * auVar129._16_4_;
        auVar74._20_4_ = auVar129._20_4_ * auVar129._20_4_;
        auVar74._24_4_ = auVar129._24_4_ * auVar129._24_4_;
        auVar74._28_4_ = auVar129._28_4_;
        auVar346 = vsubps_avx(auVar28,auVar74);
        auVar75._4_4_ = auVar346._4_4_ * fVar164 * 4.0;
        auVar75._0_4_ = auVar346._0_4_ * fVar317 * 4.0;
        auVar75._8_4_ = auVar346._8_4_ * fVar167 * 4.0;
        auVar75._12_4_ = auVar346._12_4_ * fVar170 * 4.0;
        auVar75._16_4_ = auVar346._16_4_ * fVar172 * 4.0;
        auVar75._20_4_ = auVar346._20_4_ * fVar174 * 4.0;
        auVar75._24_4_ = auVar346._24_4_ * fVar176 * 4.0;
        auVar75._28_4_ = auVar129._28_4_;
        auVar11 = vsubps_avx(auVar57,auVar75);
        auVar129 = vcmpps_avx(auVar11,ZEXT832(0) << 0x20,5);
        if ((((((((auVar129 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar129 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar129 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar129 >> 0x7f,0) == '\0') &&
              (auVar129 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar129 >> 0xbf,0) == '\0') &&
            (auVar129 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar129[0x1f]) {
          auVar296 = SUB6428(ZEXT864(0),0) << 0x20;
          auVar276 = ZEXT828(0) << 0x20;
          _local_ae0 = ZEXT832(0) << 0x20;
          _local_ca0 = local_ae0._0_28_;
          _local_a80 = ZEXT832(0) << 0x20;
          auVar312._8_4_ = 0x7f800000;
          auVar312._0_8_ = 0x7f8000007f800000;
          auVar312._12_4_ = 0x7f800000;
          auVar312._16_4_ = 0x7f800000;
          auVar312._20_4_ = 0x7f800000;
          auVar312._24_4_ = 0x7f800000;
          auVar312._28_4_ = 0x7f800000;
          auVar362._8_4_ = 0xff800000;
          auVar362._0_8_ = 0xff800000ff800000;
          auVar362._12_4_ = 0xff800000;
          auVar362._16_4_ = 0xff800000;
          auVar362._20_4_ = 0xff800000;
          auVar362._24_4_ = 0xff800000;
          auVar362._28_4_ = 0xff800000;
        }
        else {
          auVar12 = vrcpps_avx(local_300);
          fVar317 = auVar12._0_4_;
          auVar240._0_4_ = local_300._0_4_ * fVar317;
          fVar321 = auVar12._4_4_;
          auVar240._4_4_ = local_300._4_4_ * fVar321;
          fVar247 = auVar12._8_4_;
          auVar240._8_4_ = local_300._8_4_ * fVar247;
          fVar260 = auVar12._12_4_;
          auVar240._12_4_ = local_300._12_4_ * fVar260;
          fVar261 = auVar12._16_4_;
          auVar240._16_4_ = local_300._16_4_ * fVar261;
          fVar270 = auVar12._20_4_;
          auVar240._20_4_ = local_300._20_4_ * fVar270;
          fVar281 = auVar12._24_4_;
          auVar240._24_4_ = local_300._24_4_ * fVar281;
          auVar240._28_4_ = 0;
          auVar14 = vsubps_avx(auVar361,auVar240);
          auVar13 = vsqrtps_avx(auVar11);
          fVar317 = fVar317 + fVar317 * auVar14._0_4_;
          fVar321 = fVar321 + fVar321 * auVar14._4_4_;
          fVar247 = fVar247 + fVar247 * auVar14._8_4_;
          fVar260 = fVar260 + fVar260 * auVar14._12_4_;
          fVar261 = fVar261 + fVar261 * auVar14._16_4_;
          fVar270 = fVar270 + fVar270 * auVar14._20_4_;
          fVar281 = fVar281 + fVar281 * auVar14._24_4_;
          auVar27 = vsubps_avx(local_2e0,auVar13);
          fVar340 = auVar27._0_4_ * fVar317;
          fVar355 = auVar27._4_4_ * fVar321;
          auVar76._4_4_ = fVar355;
          auVar76._0_4_ = fVar340;
          fVar371 = auVar27._8_4_ * fVar247;
          auVar76._8_4_ = fVar371;
          fVar387 = auVar27._12_4_ * fVar260;
          auVar76._12_4_ = fVar387;
          fVar390 = auVar27._16_4_ * fVar261;
          auVar76._16_4_ = fVar390;
          fVar393 = auVar27._20_4_ * fVar270;
          auVar76._20_4_ = fVar393;
          fVar396 = auVar27._24_4_ * fVar281;
          auVar76._24_4_ = fVar396;
          auVar76._28_4_ = fVar316;
          auVar27 = vsubps_avx(auVar13,local_3a0);
          fVar317 = auVar27._0_4_ * fVar317;
          fVar321 = auVar27._4_4_ * fVar321;
          auVar77._4_4_ = fVar321;
          auVar77._0_4_ = fVar317;
          fVar247 = auVar27._8_4_ * fVar247;
          auVar77._8_4_ = fVar247;
          fVar260 = auVar27._12_4_ * fVar260;
          auVar77._12_4_ = fVar260;
          fVar261 = auVar27._16_4_ * fVar261;
          auVar77._16_4_ = fVar261;
          fVar270 = auVar27._20_4_ * fVar270;
          auVar77._20_4_ = fVar270;
          fVar281 = auVar27._24_4_ * fVar281;
          auVar77._24_4_ = fVar281;
          auVar77._28_4_ = 0x7f800000;
          fVar283 = (fVar340 * local_640._0_4_ + local_660._0_4_) * fVar262;
          fVar285 = (fVar355 * local_640._4_4_ + local_660._4_4_) * fVar287;
          fVar265 = (fVar371 * local_640._8_4_ + local_660._8_4_) * fVar330;
          fVar267 = (fVar387 * local_640._12_4_ + local_660._12_4_) * fVar372;
          fVar269 = (fVar390 * local_640._16_4_ + local_660._16_4_) * fVar400;
          fVar322 = (fVar393 * local_640._20_4_ + local_660._20_4_) * fVar291;
          fVar338 = (fVar396 * local_640._24_4_ + local_660._24_4_) * fVar294;
          auVar154._0_4_ = fVar323 + fVar320 * fVar283;
          auVar154._4_4_ = fVar331 + fVar268 * fVar285;
          auVar154._8_4_ = fVar333 + fVar263 * fVar265;
          auVar154._12_4_ = fVar335 + fVar336 * fVar267;
          auVar154._16_4_ = fVar337 + fVar384 * fVar269;
          auVar154._20_4_ = fVar339 + fVar407 * fVar322;
          auVar154._24_4_ = fVar341 + fVar21 * fVar338;
          auVar154._28_4_ = fVar342 + auVar12._28_4_ + auVar14._28_4_ + local_660._28_4_;
          auVar78._4_4_ = fVar355 * (float)local_960._4_4_;
          auVar78._0_4_ = fVar340 * (float)local_960._0_4_;
          auVar78._8_4_ = fVar371 * fStack_958;
          auVar78._12_4_ = fVar387 * fStack_954;
          auVar78._16_4_ = fVar390 * fStack_950;
          auVar78._20_4_ = fVar393 * fStack_94c;
          auVar78._24_4_ = fVar396 * fStack_948;
          auVar78._28_4_ = auVar13._28_4_;
          _local_ae0 = vsubps_avx(auVar78,auVar154);
          auVar257._0_4_ = local_9c0 + fVar318 * fVar283;
          auVar257._4_4_ = fStack_9bc + fVar264 * fVar285;
          auVar257._8_4_ = fStack_9b8 + fVar289 * fVar265;
          auVar257._12_4_ = fStack_9b4 + fVar332 * fVar267;
          auVar257._16_4_ = fStack_9b0 + fVar381 * fVar269;
          auVar257._20_4_ = fStack_9ac + fVar405 * fVar322;
          auVar257._24_4_ = fStack_9a8 + fVar19 * fVar338;
          auVar257._28_4_ = fStack_9a4 + auVar13._28_4_;
          auVar79._4_4_ = fVar316 * fVar355;
          auVar79._0_4_ = fVar316 * fVar340;
          auVar79._8_4_ = fVar316 * fVar371;
          auVar79._12_4_ = fVar316 * fVar387;
          auVar79._16_4_ = fVar316 * fVar390;
          auVar79._20_4_ = fVar316 * fVar393;
          auVar79._24_4_ = fVar316 * fVar396;
          auVar79._28_4_ = 0x3e000000;
          auVar12 = vsubps_avx(auVar79,auVar257);
          _local_ca0 = auVar12._0_28_;
          auVar241._0_4_ = fVar178 + fVar319 * fVar283;
          auVar241._4_4_ = fVar197 + fVar266 * fVar285;
          auVar241._8_4_ = fVar198 + fVar292 * fVar265;
          auVar241._12_4_ = fVar199 + fVar334 * fVar267;
          auVar241._16_4_ = fVar200 + fVar308 * fVar269;
          auVar241._20_4_ = fVar201 + fVar406 * fVar322;
          auVar241._24_4_ = fVar202 + fVar20 * fVar338;
          auVar241._28_4_ = fVar203 + auVar27._28_4_;
          auVar80._4_4_ = (float)local_860._4_4_ * fVar355;
          auVar80._0_4_ = (float)local_860._0_4_ * fVar340;
          auVar80._8_4_ = fStack_858 * fVar371;
          auVar80._12_4_ = fStack_854 * fVar387;
          auVar80._16_4_ = fStack_850 * fVar390;
          auVar80._20_4_ = fStack_84c * fVar393;
          auVar80._24_4_ = fStack_848 * fVar396;
          auVar80._28_4_ = 0x3e000000;
          _local_a80 = vsubps_avx(auVar80,auVar241);
          fVar262 = (fVar317 * local_640._0_4_ + local_660._0_4_) * fVar262;
          fVar287 = (fVar321 * local_640._4_4_ + local_660._4_4_) * fVar287;
          fVar330 = (fVar247 * local_640._8_4_ + local_660._8_4_) * fVar330;
          fVar372 = (fVar260 * local_640._12_4_ + local_660._12_4_) * fVar372;
          fVar400 = (fVar261 * local_640._16_4_ + local_660._16_4_) * fVar400;
          fVar291 = (fVar270 * local_640._20_4_ + local_660._20_4_) * fVar291;
          fVar294 = (fVar281 * local_640._24_4_ + local_660._24_4_) * fVar294;
          auVar242._0_4_ = fVar323 + fVar320 * fVar262;
          auVar242._4_4_ = fVar331 + fVar268 * fVar287;
          auVar242._8_4_ = fVar333 + fVar263 * fVar330;
          auVar242._12_4_ = fVar335 + fVar336 * fVar372;
          auVar242._16_4_ = fVar337 + fVar384 * fVar400;
          auVar242._20_4_ = fVar339 + fVar407 * fVar291;
          auVar242._24_4_ = fVar341 + fVar21 * fVar294;
          auVar242._28_4_ = fVar342 + local_a80._28_4_ + local_660._28_4_;
          auVar81._4_4_ = fVar321 * (float)local_960._4_4_;
          auVar81._0_4_ = fVar317 * (float)local_960._0_4_;
          auVar81._8_4_ = fVar247 * fStack_958;
          auVar81._12_4_ = fVar260 * fStack_954;
          auVar81._16_4_ = fVar261 * fStack_950;
          auVar81._20_4_ = fVar270 * fStack_94c;
          auVar81._24_4_ = fVar281 * fStack_948;
          auVar81._28_4_ = fStack_944;
          auVar12 = vsubps_avx(auVar81,auVar242);
          auVar234 = auVar12._0_28_;
          auVar300._0_4_ = local_9c0 + fVar318 * fVar262;
          auVar300._4_4_ = fStack_9bc + fVar264 * fVar287;
          auVar300._8_4_ = fStack_9b8 + fVar289 * fVar330;
          auVar300._12_4_ = fStack_9b4 + fVar332 * fVar372;
          auVar300._16_4_ = fStack_9b0 + fVar381 * fVar400;
          auVar300._20_4_ = fStack_9ac + fVar405 * fVar291;
          auVar300._24_4_ = fStack_9a8 + fVar19 * fVar294;
          auVar300._28_4_ = fStack_9a4 + fStack_944;
          auVar82._4_4_ = fVar316 * fVar321;
          auVar82._0_4_ = fVar316 * fVar317;
          auVar82._8_4_ = fVar316 * fVar247;
          auVar82._12_4_ = fVar316 * fVar260;
          auVar82._16_4_ = fVar316 * fVar261;
          auVar82._20_4_ = fVar316 * fVar270;
          auVar82._24_4_ = fVar316 * fVar281;
          auVar82._28_4_ = local_280._28_4_;
          auVar12 = vsubps_avx(auVar82,auVar300);
          auVar296 = auVar12._0_28_;
          auVar279._0_4_ = fVar178 + fVar319 * fVar262;
          auVar279._4_4_ = fVar197 + fVar266 * fVar287;
          auVar279._8_4_ = fVar198 + fVar292 * fVar330;
          auVar279._12_4_ = fVar199 + fVar334 * fVar372;
          auVar279._16_4_ = fVar200 + fVar308 * fVar400;
          auVar279._20_4_ = fVar201 + fVar406 * fVar291;
          auVar279._24_4_ = fVar202 + fVar20 * fVar294;
          auVar279._28_4_ = fVar203 + 0.125;
          auVar83._4_4_ = (float)local_860._4_4_ * fVar321;
          auVar83._0_4_ = (float)local_860._0_4_ * fVar317;
          auVar83._8_4_ = fStack_858 * fVar247;
          auVar83._12_4_ = fStack_854 * fVar260;
          auVar83._16_4_ = fStack_850 * fVar261;
          auVar83._20_4_ = fStack_84c * fVar270;
          auVar83._24_4_ = fStack_848 * fVar281;
          auVar83._28_4_ = local_280._28_4_;
          auVar12 = vsubps_avx(auVar83,auVar279);
          auVar276 = auVar12._0_28_;
          auVar11 = vcmpps_avx(auVar11,_DAT_01f7b000,5);
          auVar313._8_4_ = 0x7f800000;
          auVar313._0_8_ = 0x7f8000007f800000;
          auVar313._12_4_ = 0x7f800000;
          auVar313._16_4_ = 0x7f800000;
          auVar313._20_4_ = 0x7f800000;
          auVar313._24_4_ = 0x7f800000;
          auVar313._28_4_ = 0x7f800000;
          auVar312 = vblendvps_avx(auVar313,auVar76,auVar11);
          auVar12 = vmaxps_avx(local_5c0,local_2a0);
          auVar84._4_4_ = auVar12._4_4_ * 1.9073486e-06;
          auVar84._0_4_ = auVar12._0_4_ * 1.9073486e-06;
          auVar84._8_4_ = auVar12._8_4_ * 1.9073486e-06;
          auVar84._12_4_ = auVar12._12_4_ * 1.9073486e-06;
          auVar84._16_4_ = auVar12._16_4_ * 1.9073486e-06;
          auVar84._20_4_ = auVar12._20_4_ * 1.9073486e-06;
          auVar84._24_4_ = auVar12._24_4_ * 1.9073486e-06;
          auVar84._28_4_ = auVar12._28_4_;
          auVar12 = vcmpps_avx(local_2c0,auVar84,1);
          auVar363._8_4_ = 0xff800000;
          auVar363._0_8_ = 0xff800000ff800000;
          auVar363._12_4_ = 0xff800000;
          auVar363._16_4_ = 0xff800000;
          auVar363._20_4_ = 0xff800000;
          auVar363._24_4_ = 0xff800000;
          auVar363._28_4_ = 0xff800000;
          auVar362 = vblendvps_avx(auVar363,auVar77,auVar11);
          auVar13 = auVar11 & auVar12;
          if ((((((((auVar13 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar13 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar13 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar13 >> 0x7f,0) != '\0') ||
                (auVar13 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar13 >> 0xbf,0) != '\0') ||
              (auVar13 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar13[0x1f] < '\0') {
            auVar129 = vandps_avx(auVar12,auVar11);
            auVar209 = vpackssdw_avx(auVar129._0_16_,auVar129._16_16_);
            auVar12 = vcmpps_avx(auVar346,_DAT_01f7b000,2);
            auVar162._8_4_ = 0xff800000;
            auVar162._0_8_ = 0xff800000ff800000;
            auVar162._12_4_ = 0xff800000;
            auVar162._16_4_ = 0xff800000;
            auVar162._20_4_ = 0xff800000;
            auVar162._24_4_ = 0xff800000;
            auVar162._28_4_ = 0xff800000;
            auVar347._8_4_ = 0x7f800000;
            auVar347._0_8_ = 0x7f8000007f800000;
            auVar347._12_4_ = 0x7f800000;
            auVar347._16_4_ = 0x7f800000;
            auVar347._20_4_ = 0x7f800000;
            auVar347._24_4_ = 0x7f800000;
            auVar347._28_4_ = 0x7f800000;
            auVar346 = vblendvps_avx(auVar347,auVar162,auVar12);
            auVar225 = vpmovsxwd_avx(auVar209);
            auVar209 = vpunpckhwd_avx(auVar209,auVar209);
            auVar413._16_16_ = auVar209;
            auVar413._0_16_ = auVar225;
            auVar312 = vblendvps_avx(auVar312,auVar346,auVar413);
            auVar346 = vblendvps_avx(auVar162,auVar347,auVar12);
            auVar362 = vblendvps_avx(auVar362,auVar346,auVar413);
            auVar223._0_8_ = auVar129._0_8_ ^ 0xffffffffffffffff;
            auVar223._8_4_ = auVar129._8_4_ ^ 0xffffffff;
            auVar223._12_4_ = auVar129._12_4_ ^ 0xffffffff;
            auVar223._16_4_ = auVar129._16_4_ ^ 0xffffffff;
            auVar223._20_4_ = auVar129._20_4_ ^ 0xffffffff;
            auVar223._24_4_ = auVar129._24_4_ ^ 0xffffffff;
            auVar223._28_4_ = auVar129._28_4_ ^ 0xffffffff;
            auVar129 = vorps_avx(auVar12,auVar223);
            auVar129 = vandps_avx(auVar11,auVar129);
          }
        }
        _local_420 = local_880;
        local_400 = vminps_avx(local_3c0,auVar312);
        _local_920 = vmaxps_avx(local_880,auVar362);
        _local_3e0 = _local_920;
        auVar346 = vcmpps_avx(local_880,local_400,2);
        auVar314 = ZEXT3264(auVar346);
        local_7c0 = vandps_avx(auVar346,auVar110);
        auVar346 = vcmpps_avx(_local_920,local_3c0,2);
        local_940 = vandps_avx(auVar346,auVar110);
        auVar346 = vorps_avx(local_7c0,local_940);
        if ((((((((auVar346 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar346 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar346 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar346 >> 0x7f,0) == '\0') &&
              (auVar346 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar346 >> 0xbf,0) == '\0') &&
            (auVar346 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar346[0x1f]) {
          auVar246 = ZEXT3264(CONCAT428(0x3f800000,
                                        CONCAT424(0x3f800000,
                                                  CONCAT420(0x3f800000,
                                                            CONCAT416(0x3f800000,
                                                                      CONCAT412(0x3f800000,
                                                                                CONCAT48(0x3f800000,
                                                                                                                                                                                  
                                                  0x3f8000003f800000)))))));
          auVar364 = ZEXT3264(local_aa0);
          auVar348 = ZEXT3264(auVar403);
          auVar380 = ZEXT3264(auVar377);
        }
        else {
          auStack_978 = auVar15._8_24_;
          auVar314 = ZEXT3264(_local_860);
          auVar191._0_8_ = auVar129._0_8_ ^ 0xffffffffffffffff;
          auVar191._8_4_ = auVar129._8_4_ ^ 0xffffffff;
          auVar191._12_4_ = auVar129._12_4_ ^ 0xffffffff;
          auVar191._16_4_ = auVar129._16_4_ ^ 0xffffffff;
          auVar191._20_4_ = auVar129._20_4_ ^ 0xffffffff;
          auVar191._24_4_ = auVar129._24_4_ ^ 0xffffffff;
          auVar191._28_4_ = auVar129._28_4_ ^ 0xffffffff;
          auVar120._0_4_ =
               (float)local_960._0_4_ * auVar234._0_4_ +
               fVar316 * auVar296._0_4_ + (float)local_860._0_4_ * auVar276._0_4_;
          auVar120._4_4_ =
               (float)local_960._4_4_ * auVar234._4_4_ +
               fVar316 * auVar296._4_4_ + (float)local_860._4_4_ * auVar276._4_4_;
          auVar120._8_4_ =
               fStack_958 * auVar234._8_4_ + fVar316 * auVar296._8_4_ + fStack_858 * auVar276._8_4_;
          auVar120._12_4_ =
               fStack_954 * auVar234._12_4_ +
               fVar316 * auVar296._12_4_ + fStack_854 * auVar276._12_4_;
          auVar120._16_4_ =
               fStack_950 * auVar234._16_4_ +
               fVar316 * auVar296._16_4_ + fStack_850 * auVar276._16_4_;
          auVar120._20_4_ =
               fStack_94c * auVar234._20_4_ +
               fVar316 * auVar296._20_4_ + fStack_84c * auVar276._20_4_;
          auVar120._24_4_ =
               fStack_948 * auVar234._24_4_ +
               fVar316 * auVar296._24_4_ + fStack_848 * auVar276._24_4_;
          auVar120._28_4_ = local_920._28_4_ + local_940._28_4_ + auVar346._28_4_;
          auVar243._8_4_ = 0x7fffffff;
          auVar243._0_8_ = 0x7fffffff7fffffff;
          auVar243._12_4_ = 0x7fffffff;
          auVar243._16_4_ = 0x7fffffff;
          auVar243._20_4_ = 0x7fffffff;
          auVar243._24_4_ = 0x7fffffff;
          auVar243._28_4_ = 0x7fffffff;
          auVar129 = vandps_avx(auVar120,auVar243);
          auVar280._8_4_ = 0x3e99999a;
          auVar280._0_8_ = 0x3e99999a3e99999a;
          auVar280._12_4_ = 0x3e99999a;
          auVar280._16_4_ = 0x3e99999a;
          auVar280._20_4_ = 0x3e99999a;
          auVar280._24_4_ = 0x3e99999a;
          auVar280._28_4_ = 0x3e99999a;
          auVar129 = vcmpps_avx(auVar129,auVar280,1);
          local_800 = vorps_avx(auVar129,auVar191);
          auVar121._0_4_ =
               (float)local_960._0_4_ * (float)local_ae0._0_4_ +
               fVar316 * (float)local_ca0._0_4_ + (float)local_860._0_4_ * (float)local_a80._0_4_;
          auVar121._4_4_ =
               (float)local_960._4_4_ * (float)local_ae0._4_4_ +
               fVar316 * (float)local_ca0._4_4_ + (float)local_860._4_4_ * (float)local_a80._4_4_;
          auVar121._8_4_ = fStack_958 * fStack_ad8 + fVar316 * fStack_c98 + fStack_858 * fStack_a78;
          auVar121._12_4_ = fStack_954 * fStack_ad4 + fVar316 * fStack_c94 + fStack_854 * fStack_a74
          ;
          auVar121._16_4_ = fStack_950 * fStack_ad0 + fVar316 * fStack_c90 + fStack_850 * fStack_a70
          ;
          auVar121._20_4_ = fStack_94c * fStack_acc + fVar316 * fStack_c8c + fStack_84c * fStack_a6c
          ;
          auVar121._24_4_ = fStack_948 * fStack_ac8 + fVar316 * fStack_c88 + fStack_848 * fStack_a68
          ;
          auVar121._28_4_ = local_800._28_4_ + auVar110._28_4_ + local_920._28_4_;
          auVar110 = vandps_avx(auVar121,auVar243);
          auVar110 = vcmpps_avx(auVar110,auVar280,1);
          auVar110 = vorps_avx(auVar110,auVar191);
          auVar155._8_4_ = 3;
          auVar155._0_8_ = 0x300000003;
          auVar155._12_4_ = 3;
          auVar155._16_4_ = 3;
          auVar155._20_4_ = 3;
          auVar155._24_4_ = 3;
          auVar155._28_4_ = 3;
          auVar192._8_4_ = 2;
          auVar192._0_8_ = 0x200000002;
          auVar192._12_4_ = 2;
          auVar192._16_4_ = 2;
          auVar192._20_4_ = 2;
          auVar192._24_4_ = 2;
          auVar192._28_4_ = 2;
          auVar110 = vblendvps_avx(auVar192,auVar155,auVar110);
          local_820 = ZEXT432(local_d24);
          local_840 = vpshufd_avx(ZEXT416(local_d24),0);
          auVar209 = vpcmpgtd_avx(auVar110._16_16_,local_840);
          auStack_830 = auVar16._16_16_;
          auVar225 = vpcmpgtd_avx(auVar110._0_16_,local_840);
          auVar156._16_16_ = auVar209;
          auVar156._0_16_ = auVar225;
          local_7e0 = vblendps_avx(ZEXT1632(auVar225),auVar156,0xf0);
          auVar110 = vandnps_avx(local_7e0,local_7c0);
          local_900._4_4_ = local_880._4_4_ + (float)local_9e0._4_4_;
          local_900._0_4_ = local_880._0_4_ + (float)local_9e0._0_4_;
          fStack_8f8 = local_880._8_4_ + fStack_9d8;
          fStack_8f4 = local_880._12_4_ + fStack_9d4;
          fStack_8f0 = local_880._16_4_ + fStack_9d0;
          fStack_8ec = local_880._20_4_ + fStack_9cc;
          fStack_8e8 = local_880._24_4_ + fStack_9c8;
          fStack_8e4 = local_880._28_4_ + fStack_9c4;
          auVar346 = auVar403;
          auVar129 = auVar377;
          local_280 = auVar112;
          while( true ) {
            auVar364 = ZEXT3264(local_aa0);
            local_440 = auVar110;
            if ((((((((auVar110 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar110 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar110 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar110 >> 0x7f,0) == '\0') &&
                  (auVar110 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar110 >> 0xbf,0) == '\0') &&
                (auVar110 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar110[0x1f]) break;
            auVar157._8_4_ = 0x7f800000;
            auVar157._0_8_ = 0x7f8000007f800000;
            auVar157._12_4_ = 0x7f800000;
            auVar157._16_4_ = 0x7f800000;
            auVar157._20_4_ = 0x7f800000;
            auVar157._24_4_ = 0x7f800000;
            auVar157._28_4_ = 0x7f800000;
            auVar11 = vblendvps_avx(auVar157,local_880,auVar110);
            auVar12 = vshufps_avx(auVar11,auVar11,0xb1);
            auVar12 = vminps_avx(auVar11,auVar12);
            auVar13 = vshufpd_avx(auVar12,auVar12,5);
            auVar12 = vminps_avx(auVar12,auVar13);
            auVar13 = vperm2f128_avx(auVar12,auVar12,1);
            auVar12 = vminps_avx(auVar12,auVar13);
            auVar11 = vcmpps_avx(auVar11,auVar12,0);
            auVar12 = auVar110 & auVar11;
            if ((((((((auVar12 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar12 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar12 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar12 >> 0x7f,0) != '\0') ||
                  (auVar12 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar12 >> 0xbf,0) != '\0') ||
                (auVar12 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar12[0x1f] < '\0') {
              auVar110 = vandps_avx(auVar11,auVar110);
            }
            uVar93 = vmovmskps_avx(auVar110);
            uVar97 = 0;
            if (uVar93 != 0) {
              for (; (uVar93 >> uVar97 & 1) == 0; uVar97 = uVar97 + 1) {
              }
            }
            uVar98 = (ulong)uVar97;
            *(undefined4 *)(local_440 + uVar98 * 4) = 0;
            fVar317 = local_1a0[uVar98];
            uVar97 = *(uint *)(local_420 + uVar98 * 4);
            fVar318 = auVar136._0_4_;
            if ((float)local_a00._0_4_ < 0.0) {
              auVar314 = ZEXT1664(auVar314._0_16_);
              fVar318 = sqrtf((float)local_a00._0_4_);
              auVar346 = auVar403;
              auVar129 = auVar377;
            }
            auVar348 = ZEXT3264(auVar129);
            auVar364 = ZEXT3264(auVar346);
            auVar225 = vminps_avx(_local_b20,_local_b40);
            auVar209 = vmaxps_avx(_local_b20,_local_b40);
            auVar206 = vminps_avx(_local_b30,_local_b50);
            auVar105 = vminps_avx(auVar225,auVar206);
            auVar225 = vmaxps_avx(_local_b30,_local_b50);
            auVar206 = vmaxps_avx(auVar209,auVar225);
            auVar205._8_4_ = 0x7fffffff;
            auVar205._0_8_ = 0x7fffffff7fffffff;
            auVar205._12_4_ = 0x7fffffff;
            auVar209 = vandps_avx(auVar105,auVar205);
            auVar225 = vandps_avx(auVar206,auVar205);
            auVar209 = vmaxps_avx(auVar209,auVar225);
            auVar225 = vmovshdup_avx(auVar209);
            auVar225 = vmaxss_avx(auVar225,auVar209);
            auVar209 = vshufpd_avx(auVar209,auVar209,1);
            auVar209 = vmaxss_avx(auVar209,auVar225);
            local_9c0 = auVar209._0_4_ * 1.9073486e-06;
            local_8a0._0_4_ = fVar318 * 1.9073486e-06;
            local_8e0._0_16_ = vshufps_avx(auVar206,auVar206,0xff);
            auVar209 = vinsertps_avx(ZEXT416(uVar97),ZEXT416((uint)fVar317),0x10);
            auVar246 = ZEXT1664(auVar209);
            lVar94 = 5;
            do {
              do {
                auVar209 = auVar246._0_16_;
                bVar100 = lVar94 == 0;
                lVar94 = lVar94 + -1;
                auVar346 = auVar364._0_32_;
                auVar129 = auVar348._0_32_;
                if (bVar100) goto LAB_00a0ad0e;
                auVar225 = vshufps_avx(auVar209,auVar209,0);
                auVar104._0_4_ = auVar225._0_4_ * (float)local_9f0._0_4_ + 0.0;
                auVar104._4_4_ = auVar225._4_4_ * (float)local_9f0._4_4_ + 0.0;
                auVar104._8_4_ = auVar225._8_4_ * fStack_9e8 + 0.0;
                auVar104._12_4_ = auVar225._12_4_ * fStack_9e4 + 0.0;
                auVar225 = vmovshdup_avx(auVar209);
                fVar247 = auVar225._0_4_;
                fVar320 = 1.0 - fVar247;
                fVar318 = fVar247 * 3.0;
                fVar317 = fVar318 + -5.0;
                fVar319 = fVar320 * fVar320;
                auVar225 = ZEXT416((uint)(fVar247 * fVar247 * -fVar320 * 0.5));
                auVar225 = vshufps_avx(auVar225,auVar225,0);
                auVar206 = ZEXT416((uint)((fVar319 * (fVar320 * 3.0 + -5.0) + 2.0) * 0.5));
                auVar206 = vshufps_avx(auVar206,auVar206,0);
                auVar105 = ZEXT416((uint)((fVar247 * fVar247 * fVar317 + 2.0) * 0.5));
                auVar105 = vshufps_avx(auVar105,auVar105,0);
                auVar137 = ZEXT416((uint)(fVar320 * fVar320 * -fVar247 * 0.5));
                auVar137 = vshufps_avx(auVar137,auVar137,0);
                auVar180._0_4_ =
                     auVar137._0_4_ * (float)local_b20._0_4_ +
                     auVar105._0_4_ * (float)local_b40._0_4_ +
                     auVar206._0_4_ * (float)local_b30._0_4_ +
                     auVar225._0_4_ * (float)local_b50._0_4_;
                auVar180._4_4_ =
                     auVar137._4_4_ * (float)local_b20._4_4_ +
                     auVar105._4_4_ * (float)local_b40._4_4_ +
                     auVar206._4_4_ * (float)local_b30._4_4_ +
                     auVar225._4_4_ * (float)local_b50._4_4_;
                auVar180._8_4_ =
                     auVar137._8_4_ * fStack_b18 +
                     auVar105._8_4_ * fStack_b38 +
                     auVar206._8_4_ * fStack_b28 + auVar225._8_4_ * fStack_b48;
                auVar180._12_4_ =
                     auVar137._12_4_ * fStack_b14 +
                     auVar105._12_4_ * fStack_b34 +
                     auVar206._12_4_ * fStack_b24 + auVar225._12_4_ * fStack_b44;
                _local_a80 = auVar180;
                auVar225 = vsubps_avx(auVar104,auVar180);
                _local_ae0 = auVar225;
                auVar225 = vdpps_avx(auVar225,auVar225,0x7f);
                fVar321 = auVar225._0_4_;
                if (fVar321 < 0.0) {
                  local_a20._0_4_ = fVar247 * 9.0;
                  local_a40._0_4_ = fVar317;
                  local_a60._0_4_ = fVar319;
                  local_8c0._0_4_ = fVar320 * -2.0;
                  fVar260 = sqrtf(fVar321);
                  fVar262 = (float)local_a20._0_4_;
                  fVar261 = (float)local_8c0._0_4_;
                  fVar317 = (float)local_a40._0_4_;
                  fVar319 = (float)local_a60._0_4_;
                }
                else {
                  auVar206 = vsqrtss_avx(auVar225,auVar225);
                  fVar260 = auVar206._0_4_;
                  fVar262 = fVar247 * 9.0;
                  fVar261 = fVar320 * -2.0;
                }
                auVar206 = ZEXT416((uint)((fVar247 * fVar247 + fVar247 * fVar261) * 0.5));
                auVar206 = vshufps_avx(auVar206,auVar206,0);
                auVar105 = ZEXT416((uint)(((fVar320 + fVar320) * (fVar318 + 2.0) +
                                          fVar320 * fVar320 * -3.0) * 0.5));
                auVar105 = vshufps_avx(auVar105,auVar105,0);
                auVar137 = ZEXT416((uint)((fVar317 * (fVar247 + fVar247) + fVar247 * fVar318) * 0.5)
                                  );
                auVar137 = vshufps_avx(auVar137,auVar137,0);
                auVar138 = ZEXT416((uint)((fVar247 * (fVar320 + fVar320) - fVar319) * 0.5));
                auVar138 = vshufps_avx(auVar138,auVar138,0);
                auVar358._0_4_ =
                     (float)local_b20._0_4_ * auVar138._0_4_ +
                     (float)local_b40._0_4_ * auVar137._0_4_ +
                     (float)local_b50._0_4_ * auVar206._0_4_ +
                     (float)local_b30._0_4_ * auVar105._0_4_;
                auVar358._4_4_ =
                     (float)local_b20._4_4_ * auVar138._4_4_ +
                     (float)local_b40._4_4_ * auVar137._4_4_ +
                     (float)local_b50._4_4_ * auVar206._4_4_ +
                     (float)local_b30._4_4_ * auVar105._4_4_;
                auVar358._8_4_ =
                     fStack_b18 * auVar138._8_4_ +
                     fStack_b38 * auVar137._8_4_ +
                     fStack_b48 * auVar206._8_4_ + fStack_b28 * auVar105._8_4_;
                auVar358._12_4_ =
                     fStack_b14 * auVar138._12_4_ +
                     fStack_b34 * auVar137._12_4_ +
                     fStack_b44 * auVar206._12_4_ + fStack_b24 * auVar105._12_4_;
                auVar138 = vpermilps_avx(ZEXT416((uint)(fVar318 + -1.0)),0);
                auVar3 = vpermilps_avx(ZEXT416((uint)(fVar247 * -9.0 + 4.0)),0);
                auVar206 = vshufps_avx(ZEXT416((uint)(fVar262 + -5.0)),
                                       ZEXT416((uint)(fVar262 + -5.0)),0);
                auVar105 = ZEXT416((uint)(fVar247 * -3.0 + 2.0));
                auVar137 = vshufps_avx(auVar105,auVar105,0);
                auVar105 = vdpps_avx(auVar358,auVar358,0x7f);
                auVar139._0_4_ =
                     (float)local_b20._0_4_ * auVar137._0_4_ +
                     (float)local_b40._0_4_ * auVar206._0_4_ +
                     (float)local_b30._0_4_ * auVar3._0_4_ + (float)local_b50._0_4_ * auVar138._0_4_
                ;
                auVar139._4_4_ =
                     (float)local_b20._4_4_ * auVar137._4_4_ +
                     (float)local_b40._4_4_ * auVar206._4_4_ +
                     (float)local_b30._4_4_ * auVar3._4_4_ + (float)local_b50._4_4_ * auVar138._4_4_
                ;
                auVar139._8_4_ =
                     fStack_b18 * auVar137._8_4_ +
                     fStack_b38 * auVar206._8_4_ +
                     fStack_b28 * auVar3._8_4_ + fStack_b48 * auVar138._8_4_;
                auVar139._12_4_ =
                     fStack_b14 * auVar137._12_4_ +
                     fStack_b34 * auVar206._12_4_ +
                     fStack_b24 * auVar3._12_4_ + fStack_b44 * auVar138._12_4_;
                auVar206 = vblendps_avx(auVar105,_DAT_01f45a50,0xe);
                auVar137 = vrsqrtss_avx(auVar206,auVar206);
                fVar318 = auVar137._0_4_;
                fVar317 = auVar105._0_4_;
                auVar137 = vdpps_avx(auVar358,auVar139,0x7f);
                auVar138 = vshufps_avx(auVar105,auVar105,0);
                auVar140._0_4_ = auVar139._0_4_ * auVar138._0_4_;
                auVar140._4_4_ = auVar139._4_4_ * auVar138._4_4_;
                auVar140._8_4_ = auVar139._8_4_ * auVar138._8_4_;
                auVar140._12_4_ = auVar139._12_4_ * auVar138._12_4_;
                auVar137 = vshufps_avx(auVar137,auVar137,0);
                auVar226._0_4_ = auVar358._0_4_ * auVar137._0_4_;
                auVar226._4_4_ = auVar358._4_4_ * auVar137._4_4_;
                auVar226._8_4_ = auVar358._8_4_ * auVar137._8_4_;
                auVar226._12_4_ = auVar358._12_4_ * auVar137._12_4_;
                auVar3 = vsubps_avx(auVar140,auVar226);
                auVar137 = vrcpss_avx(auVar206,auVar206);
                auVar206 = vmaxss_avx(ZEXT416((uint)local_9c0),
                                      ZEXT416((uint)(auVar246._0_4_ * (float)local_8a0._0_4_)));
                auVar137 = ZEXT416((uint)(auVar137._0_4_ * (2.0 - fVar317 * auVar137._0_4_)));
                auVar137 = vshufps_avx(auVar137,auVar137,0);
                uVar98 = CONCAT44(auVar358._4_4_,auVar358._0_4_);
                auVar249._0_8_ = uVar98 ^ 0x8000000080000000;
                auVar249._8_4_ = -auVar358._8_4_;
                auVar249._12_4_ = -auVar358._12_4_;
                auVar138 = ZEXT416((uint)(fVar318 * 1.5 +
                                         fVar317 * -0.5 * fVar318 * fVar318 * fVar318));
                auVar138 = vshufps_avx(auVar138,auVar138,0);
                auVar207._0_4_ = auVar138._0_4_ * auVar3._0_4_ * auVar137._0_4_;
                auVar207._4_4_ = auVar138._4_4_ * auVar3._4_4_ * auVar137._4_4_;
                auVar207._8_4_ = auVar138._8_4_ * auVar3._8_4_ * auVar137._8_4_;
                auVar207._12_4_ = auVar138._12_4_ * auVar3._12_4_ * auVar137._12_4_;
                auVar274._0_4_ = auVar358._0_4_ * auVar138._0_4_;
                auVar274._4_4_ = auVar358._4_4_ * auVar138._4_4_;
                auVar274._8_4_ = auVar358._8_4_ * auVar138._8_4_;
                auVar274._12_4_ = auVar358._12_4_ * auVar138._12_4_;
                if (fVar317 < 0.0) {
                  fVar317 = sqrtf(fVar317);
                }
                else {
                  auVar105 = vsqrtss_avx(auVar105,auVar105);
                  fVar317 = auVar105._0_4_;
                }
                auVar105 = vdpps_avx(_local_ae0,auVar274,0x7f);
                fVar317 = (local_9c0 / fVar317) * (fVar260 + 1.0) +
                          auVar206._0_4_ + fVar260 * local_9c0;
                auVar137 = vdpps_avx(auVar249,auVar274,0x7f);
                auVar138 = vdpps_avx(_local_ae0,auVar207,0x7f);
                auVar3 = vdpps_avx(_local_9f0,auVar274,0x7f);
                auVar4 = vdpps_avx(_local_ae0,auVar249,0x7f);
                fVar318 = auVar137._0_4_ + auVar138._0_4_;
                fVar319 = auVar105._0_4_;
                auVar106._0_4_ = fVar319 * fVar319;
                auVar106._4_4_ = auVar105._4_4_ * auVar105._4_4_;
                auVar106._8_4_ = auVar105._8_4_ * auVar105._8_4_;
                auVar106._12_4_ = auVar105._12_4_ * auVar105._12_4_;
                auVar138 = vsubps_avx(auVar225,auVar106);
                auVar137 = vdpps_avx(_local_ae0,_local_9f0,0x7f);
                fVar320 = auVar4._0_4_ - fVar319 * fVar318;
                fVar247 = auVar137._0_4_ - fVar319 * auVar3._0_4_;
                auVar137 = vrsqrtss_avx(auVar138,auVar138);
                fVar260 = auVar138._0_4_;
                fVar319 = auVar137._0_4_;
                fVar319 = fVar319 * 1.5 + fVar260 * -0.5 * fVar319 * fVar319 * fVar319;
                if (fVar260 < 0.0) {
                  local_a20._0_4_ = fVar320;
                  local_a40._0_4_ = fVar247;
                  local_a60._0_4_ = fVar319;
                  fVar260 = sqrtf(fVar260);
                  fVar319 = (float)local_a60._0_4_;
                  fVar320 = (float)local_a20._0_4_;
                  fVar247 = (float)local_a40._0_4_;
                }
                else {
                  auVar137 = vsqrtss_avx(auVar138,auVar138);
                  fVar260 = auVar137._0_4_;
                }
                auVar364 = ZEXT3264(auVar403);
                auVar348 = ZEXT3264(auVar377);
                auVar314 = ZEXT1664(auVar358);
                auVar4 = vpermilps_avx(_local_a80,0xff);
                auVar102 = vshufps_avx(auVar358,auVar358,0xff);
                fVar320 = fVar320 * fVar319 - auVar102._0_4_;
                auVar227._0_8_ = auVar3._0_8_ ^ 0x8000000080000000;
                auVar227._8_4_ = auVar3._8_4_ ^ 0x80000000;
                auVar227._12_4_ = auVar3._12_4_ ^ 0x80000000;
                auVar250._0_4_ = -fVar320;
                auVar250._4_4_ = 0x80000000;
                auVar250._8_4_ = 0x80000000;
                auVar250._12_4_ = 0x80000000;
                auVar137 = vinsertps_avx(auVar250,ZEXT416((uint)(fVar247 * fVar319)),0x1c);
                auVar3 = vmovsldup_avx(ZEXT416((uint)(fVar318 * fVar247 * fVar319 -
                                                     auVar3._0_4_ * fVar320)));
                auVar137 = vdivps_avx(auVar137,auVar3);
                auVar138 = vinsertps_avx(ZEXT416((uint)fVar318),auVar227,0x10);
                auVar138 = vdivps_avx(auVar138,auVar3);
                auVar3 = vmovsldup_avx(auVar105);
                auVar107 = ZEXT416((uint)(fVar260 - auVar4._0_4_));
                auVar4 = vmovsldup_avx(auVar107);
                auVar181._0_4_ = auVar3._0_4_ * auVar137._0_4_ + auVar4._0_4_ * auVar138._0_4_;
                auVar181._4_4_ = auVar3._4_4_ * auVar137._4_4_ + auVar4._4_4_ * auVar138._4_4_;
                auVar181._8_4_ = auVar3._8_4_ * auVar137._8_4_ + auVar4._8_4_ * auVar138._8_4_;
                auVar181._12_4_ = auVar3._12_4_ * auVar137._12_4_ + auVar4._12_4_ * auVar138._12_4_;
                auVar137 = vsubps_avx(auVar209,auVar181);
                auVar246 = ZEXT1664(auVar137);
                auVar182._8_4_ = 0x7fffffff;
                auVar182._0_8_ = 0x7fffffff7fffffff;
                auVar182._12_4_ = 0x7fffffff;
                auVar209 = vandps_avx(auVar105,auVar182);
              } while (fVar317 <= auVar209._0_4_);
              auVar208._8_4_ = 0x7fffffff;
              auVar208._0_8_ = 0x7fffffff7fffffff;
              auVar208._12_4_ = 0x7fffffff;
              auVar209 = vandps_avx(auVar107,auVar208);
            } while ((float)local_8e0._0_4_ * 1.9073486e-06 + auVar206._0_4_ + fVar317 <=
                     auVar209._0_4_);
            fVar317 = auVar137._0_4_ + (float)local_9a0._0_4_;
            auVar346 = auVar403;
            auVar129 = auVar377;
            if ((fVar309 <= fVar317) &&
               (fVar318 = *(float *)(ray + k * 4 + 0x100), fVar317 <= fVar318)) {
              auVar209 = vmovshdup_avx(auVar137);
              fVar319 = auVar209._0_4_;
              if ((0.0 <= fVar319) && (fVar319 <= 1.0)) {
                auVar209 = vrsqrtss_avx(auVar225,auVar225);
                fVar320 = auVar209._0_4_;
                pGVar6 = (context->scene->geometries).items[uVar92].ptr;
                if ((pGVar6->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
                  auVar209 = ZEXT416((uint)(fVar320 * 1.5 +
                                           fVar321 * -0.5 * fVar320 * fVar320 * fVar320));
                  auVar209 = vshufps_avx(auVar209,auVar209,0);
                  auVar210._0_4_ = auVar209._0_4_ * (float)local_ae0._0_4_;
                  auVar210._4_4_ = auVar209._4_4_ * (float)local_ae0._4_4_;
                  auVar210._8_4_ = auVar209._8_4_ * fStack_ad8;
                  auVar210._12_4_ = auVar209._12_4_ * fStack_ad4;
                  auVar141._0_4_ = auVar358._0_4_ + auVar102._0_4_ * auVar210._0_4_;
                  auVar141._4_4_ = auVar358._4_4_ + auVar102._4_4_ * auVar210._4_4_;
                  auVar141._8_4_ = auVar358._8_4_ + auVar102._8_4_ * auVar210._8_4_;
                  auVar141._12_4_ = auVar358._12_4_ + auVar102._12_4_ * auVar210._12_4_;
                  auVar209 = vshufps_avx(auVar210,auVar210,0xc9);
                  auVar225 = vshufps_avx(auVar358,auVar358,0xc9);
                  auVar211._0_4_ = auVar225._0_4_ * auVar210._0_4_;
                  auVar211._4_4_ = auVar225._4_4_ * auVar210._4_4_;
                  auVar211._8_4_ = auVar225._8_4_ * auVar210._8_4_;
                  auVar211._12_4_ = auVar225._12_4_ * auVar210._12_4_;
                  auVar228._0_4_ = auVar358._0_4_ * auVar209._0_4_;
                  auVar228._4_4_ = auVar358._4_4_ * auVar209._4_4_;
                  auVar228._8_4_ = auVar358._8_4_ * auVar209._8_4_;
                  auVar228._12_4_ = auVar358._12_4_ * auVar209._12_4_;
                  auVar206 = vsubps_avx(auVar228,auVar211);
                  auVar209 = vshufps_avx(auVar206,auVar206,0xc9);
                  auVar225 = vshufps_avx(auVar141,auVar141,0xc9);
                  auVar229._0_4_ = auVar225._0_4_ * auVar209._0_4_;
                  auVar229._4_4_ = auVar225._4_4_ * auVar209._4_4_;
                  auVar229._8_4_ = auVar225._8_4_ * auVar209._8_4_;
                  auVar229._12_4_ = auVar225._12_4_ * auVar209._12_4_;
                  auVar209 = vshufps_avx(auVar206,auVar206,0xd2);
                  auVar142._0_4_ = auVar141._0_4_ * auVar209._0_4_;
                  auVar142._4_4_ = auVar141._4_4_ * auVar209._4_4_;
                  auVar142._8_4_ = auVar141._8_4_ * auVar209._8_4_;
                  auVar142._12_4_ = auVar141._12_4_ * auVar209._12_4_;
                  auVar209 = vsubps_avx(auVar229,auVar142);
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (pGVar6->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                    *(float *)(ray + k * 4 + 0x100) = fVar317;
                    uVar1 = vextractps_avx(auVar209,1);
                    *(undefined4 *)(ray + k * 4 + 0x180) = uVar1;
                    uVar1 = vextractps_avx(auVar209,2);
                    *(undefined4 *)(ray + k * 4 + 0x1a0) = uVar1;
                    *(int *)(ray + k * 4 + 0x1c0) = auVar209._0_4_;
                    *(float *)(ray + k * 4 + 0x1e0) = fVar319;
                    *(undefined4 *)(ray + k * 4 + 0x200) = 0;
                    *(int *)(ray + k * 4 + 0x220) = (int)local_980;
                    *(uint *)(ray + k * 4 + 0x240) = uVar92;
                    *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
                    *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
                  }
                  else {
                    pRVar9 = context->user;
                    auStack_710 = vshufps_avx(auVar137,auVar137,0x55);
                    auStack_770 = vshufps_avx(auVar209,auVar209,0x55);
                    auStack_750 = vshufps_avx(auVar209,auVar209,0xaa);
                    auStack_730 = vshufps_avx(auVar209,auVar209,0);
                    local_780 = (RTCHitN  [16])auStack_770;
                    local_760 = auStack_750;
                    local_740 = auStack_730;
                    local_720 = auStack_710;
                    local_700 = ZEXT832(0) << 0x20;
                    local_6e0 = local_600._0_8_;
                    uStack_6d8 = local_600._8_8_;
                    uStack_6d0 = local_600._16_8_;
                    uStack_6c8 = local_600._24_8_;
                    local_6c0 = local_5e0;
                    auVar110 = vcmpps_avx(local_5e0,local_5e0,0xf);
                    local_aa8[1] = auVar110;
                    *local_aa8 = auVar110;
                    local_6a0 = pRVar9->instID[0];
                    uStack_69c = local_6a0;
                    uStack_698 = local_6a0;
                    uStack_694 = local_6a0;
                    uStack_690 = local_6a0;
                    uStack_68c = local_6a0;
                    uStack_688 = local_6a0;
                    uStack_684 = local_6a0;
                    local_680 = pRVar9->instPrimID[0];
                    uStack_67c = local_680;
                    uStack_678 = local_680;
                    uStack_674 = local_680;
                    uStack_670 = local_680;
                    uStack_66c = local_680;
                    uStack_668 = local_680;
                    uStack_664 = local_680;
                    *(float *)(ray + k * 4 + 0x100) = fVar317;
                    local_b80 = *local_ab0;
                    local_b70 = *local_ab8;
                    local_b10.valid = (int *)local_b80;
                    local_b10.geometryUserPtr = pGVar6->userPtr;
                    local_b10.context = context->user;
                    local_b10.hit = local_780;
                    local_b10.N = 8;
                    local_b10.ray = (RTCRayN *)ray;
                    if (pGVar6->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                      auVar314 = ZEXT1664(auVar358);
                      (*pGVar6->intersectionFilterN)(&local_b10);
                    }
                    auVar209 = vpcmpeqd_avx(local_b80,ZEXT816(0) << 0x40);
                    auVar225 = vpcmpeqd_avx(local_b70,ZEXT816(0) << 0x40);
                    auVar193._16_16_ = auVar225;
                    auVar193._0_16_ = auVar209;
                    auVar110 = _DAT_01f7b020 & ~auVar193;
                    if ((((((((auVar110 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                             (auVar110 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                            (auVar110 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                           SUB321(auVar110 >> 0x7f,0) != '\0') ||
                          (auVar110 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                         SUB321(auVar110 >> 0xbf,0) != '\0') ||
                        (auVar110 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                        auVar110[0x1f] < '\0') {
                      p_Var7 = context->args->filter;
                      if ((p_Var7 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar6->field_8).field_0x2 & 0x40) != 0)))) {
                        auVar314 = ZEXT1664(auVar314._0_16_);
                        (*p_Var7)(&local_b10);
                      }
                      auVar209 = vpcmpeqd_avx(local_b80,ZEXT816(0) << 0x40);
                      auVar225 = vpcmpeqd_avx(local_b70,ZEXT816(0) << 0x40);
                      auVar122._16_16_ = auVar225;
                      auVar122._0_16_ = auVar209;
                      auVar110 = _DAT_01f7b020 & ~auVar122;
                      if ((((((((auVar110 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                               || (auVar110 >> 0x3f & (undefined1  [32])0x1) !=
                                  (undefined1  [32])0x0) ||
                              (auVar110 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0)
                             || SUB321(auVar110 >> 0x7f,0) != '\0') ||
                            (auVar110 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                           SUB321(auVar110 >> 0xbf,0) != '\0') ||
                          (auVar110 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                          auVar110[0x1f] < '\0') {
                        auVar123._0_8_ = auVar209._0_8_ ^ 0xffffffffffffffff;
                        auVar123._8_4_ = auVar209._8_4_ ^ 0xffffffff;
                        auVar123._12_4_ = auVar209._12_4_ ^ 0xffffffff;
                        auVar123._16_4_ = auVar225._0_4_ ^ 0xffffffff;
                        auVar123._20_4_ = auVar225._4_4_ ^ 0xffffffff;
                        auVar123._24_4_ = auVar225._8_4_ ^ 0xffffffff;
                        auVar123._28_4_ = auVar225._12_4_ ^ 0xffffffff;
                        auVar110 = vmaskmovps_avx(auVar123,*(undefined1 (*) [32])local_b10.hit);
                        *(undefined1 (*) [32])(local_b10.ray + 0x180) = auVar110;
                        auVar110 = vmaskmovps_avx(auVar123,*(undefined1 (*) [32])
                                                            (local_b10.hit + 0x20));
                        *(undefined1 (*) [32])(local_b10.ray + 0x1a0) = auVar110;
                        auVar110 = vmaskmovps_avx(auVar123,*(undefined1 (*) [32])
                                                            (local_b10.hit + 0x40));
                        *(undefined1 (*) [32])(local_b10.ray + 0x1c0) = auVar110;
                        auVar110 = vmaskmovps_avx(auVar123,*(undefined1 (*) [32])
                                                            (local_b10.hit + 0x60));
                        *(undefined1 (*) [32])(local_b10.ray + 0x1e0) = auVar110;
                        auVar110 = vmaskmovps_avx(auVar123,*(undefined1 (*) [32])
                                                            (local_b10.hit + 0x80));
                        *(undefined1 (*) [32])(local_b10.ray + 0x200) = auVar110;
                        auVar110 = vmaskmovps_avx(auVar123,*(undefined1 (*) [32])
                                                            (local_b10.hit + 0xa0));
                        *(undefined1 (*) [32])(local_b10.ray + 0x220) = auVar110;
                        auVar110 = vmaskmovps_avx(auVar123,*(undefined1 (*) [32])
                                                            (local_b10.hit + 0xc0));
                        *(undefined1 (*) [32])(local_b10.ray + 0x240) = auVar110;
                        auVar110 = vmaskmovps_avx(auVar123,*(undefined1 (*) [32])
                                                            (local_b10.hit + 0xe0));
                        *(undefined1 (*) [32])(local_b10.ray + 0x260) = auVar110;
                        auVar110 = vmaskmovps_avx(auVar123,*(undefined1 (*) [32])
                                                            (local_b10.hit + 0x100));
                        *(undefined1 (*) [32])(local_b10.ray + 0x280) = auVar110;
                        goto LAB_00a0ad0e;
                      }
                    }
                    *(float *)(ray + k * 4 + 0x100) = fVar318;
                  }
                }
              }
            }
LAB_00a0ad0e:
            uVar1 = *(undefined4 *)(ray + k * 4 + 0x100);
            auVar328._4_4_ = uVar1;
            auVar328._0_4_ = uVar1;
            auVar328._8_4_ = uVar1;
            auVar328._12_4_ = uVar1;
            auVar328._16_4_ = uVar1;
            auVar328._20_4_ = uVar1;
            auVar328._24_4_ = uVar1;
            auVar328._28_4_ = uVar1;
            auVar246 = ZEXT3264(auVar328);
            auVar110 = vcmpps_avx(_local_900,auVar328,2);
            auVar110 = vandps_avx(auVar110,local_440);
          }
          auVar124._0_4_ = (float)local_9e0._0_4_ + (float)local_920._0_4_;
          auVar124._4_4_ = (float)local_9e0._4_4_ + (float)local_920._4_4_;
          auVar124._8_4_ = fStack_9d8 + fStack_918;
          auVar124._12_4_ = fStack_9d4 + fStack_914;
          auVar124._16_4_ = fStack_9d0 + fStack_910;
          auVar124._20_4_ = fStack_9cc + fStack_90c;
          auVar124._24_4_ = fStack_9c8 + fStack_908;
          auVar124._28_4_ = fStack_9c4 + fStack_904;
          auVar209 = vshufps_avx(auVar246._0_16_,auVar246._0_16_,0);
          auVar158._16_16_ = auVar209;
          auVar158._0_16_ = auVar209;
          auVar110 = vcmpps_avx(auVar124,auVar158,2);
          _local_920 = vandps_avx(auVar110,local_940);
          auVar125._8_4_ = 3;
          auVar125._0_8_ = 0x300000003;
          auVar125._12_4_ = 3;
          auVar125._16_4_ = 3;
          auVar125._20_4_ = 3;
          auVar125._24_4_ = 3;
          auVar125._28_4_ = 3;
          auVar159._8_4_ = 2;
          auVar159._0_8_ = 0x200000002;
          auVar159._12_4_ = 2;
          auVar159._16_4_ = 2;
          auVar159._20_4_ = 2;
          auVar159._24_4_ = 2;
          auVar159._28_4_ = 2;
          auVar110 = vblendvps_avx(auVar159,auVar125,local_800);
          auVar209 = vpcmpgtd_avx(auVar110._16_16_,local_840);
          auVar225 = vpshufd_avx(local_820._0_16_,0);
          auVar225 = vpcmpgtd_avx(auVar110._0_16_,auVar225);
          auVar160._16_16_ = auVar209;
          auVar160._0_16_ = auVar225;
          local_940 = vblendps_avx(ZEXT1632(auVar225),auVar160,0xf0);
          auVar110 = vandnps_avx(local_940,_local_920);
          local_880 = _local_3e0;
          local_900._4_4_ = (float)local_9e0._4_4_ + (float)local_3e0._4_4_;
          local_900._0_4_ = (float)local_9e0._0_4_ + (float)local_3e0._0_4_;
          fStack_8f8 = fStack_9d8 + fStack_3d8;
          fStack_8f4 = fStack_9d4 + fStack_3d4;
          fStack_8f0 = fStack_9d0 + fStack_3d0;
          fStack_8ec = fStack_9cc + fStack_3cc;
          fStack_8e8 = fStack_9c8 + fStack_3c8;
          fStack_8e4 = fStack_9c4 + fStack_3c4;
          while( true ) {
            auVar380 = ZEXT3264(auVar129);
            auVar348 = ZEXT3264(auVar346);
            local_460 = auVar110;
            if ((((((((auVar110 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar110 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar110 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar110 >> 0x7f,0) == '\0') &&
                  (auVar110 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar110 >> 0xbf,0) == '\0') &&
                (auVar110 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar110[0x1f]) break;
            auVar161._8_4_ = 0x7f800000;
            auVar161._0_8_ = 0x7f8000007f800000;
            auVar161._12_4_ = 0x7f800000;
            auVar161._16_4_ = 0x7f800000;
            auVar161._20_4_ = 0x7f800000;
            auVar161._24_4_ = 0x7f800000;
            auVar161._28_4_ = 0x7f800000;
            auVar129 = vblendvps_avx(auVar161,local_880,auVar110);
            auVar11 = vshufps_avx(auVar129,auVar129,0xb1);
            auVar11 = vminps_avx(auVar129,auVar11);
            auVar12 = vshufpd_avx(auVar11,auVar11,5);
            auVar11 = vminps_avx(auVar11,auVar12);
            auVar12 = vperm2f128_avx(auVar11,auVar11,1);
            auVar11 = vminps_avx(auVar11,auVar12);
            auVar129 = vcmpps_avx(auVar129,auVar11,0);
            auVar11 = auVar110 & auVar129;
            if ((((((((auVar11 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar11 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar11 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar11 >> 0x7f,0) != '\0') ||
                  (auVar11 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar11 >> 0xbf,0) != '\0') ||
                (auVar11 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar11[0x1f] < '\0') {
              auVar110 = vandps_avx(auVar129,auVar110);
            }
            uVar93 = vmovmskps_avx(auVar110);
            uVar97 = 0;
            if (uVar93 != 0) {
              for (; (uVar93 >> uVar97 & 1) == 0; uVar97 = uVar97 + 1) {
              }
            }
            uVar98 = (ulong)uVar97;
            *(undefined4 *)(local_460 + uVar98 * 4) = 0;
            fVar317 = local_1c0[uVar98];
            uVar97 = *(uint *)(local_3c0 + uVar98 * 4);
            fVar318 = auVar2._0_4_;
            if ((float)local_a00._0_4_ < 0.0) {
              auVar314 = ZEXT1664(auVar314._0_16_);
              fVar318 = sqrtf((float)local_a00._0_4_);
              auVar364 = ZEXT3264(local_aa0);
              auVar346 = auVar403;
            }
            auVar348 = ZEXT3264(auVar346);
            auVar225 = vminps_avx(_local_b20,_local_b40);
            auVar209 = vmaxps_avx(_local_b20,_local_b40);
            auVar206 = vminps_avx(_local_b30,_local_b50);
            auVar105 = vminps_avx(auVar225,auVar206);
            auVar225 = vmaxps_avx(_local_b30,_local_b50);
            auVar206 = vmaxps_avx(auVar209,auVar225);
            auVar212._8_4_ = 0x7fffffff;
            auVar212._0_8_ = 0x7fffffff7fffffff;
            auVar212._12_4_ = 0x7fffffff;
            auVar209 = vandps_avx(auVar105,auVar212);
            auVar225 = vandps_avx(auVar206,auVar212);
            auVar209 = vmaxps_avx(auVar209,auVar225);
            auVar225 = vmovshdup_avx(auVar209);
            auVar225 = vmaxss_avx(auVar225,auVar209);
            auVar209 = vshufpd_avx(auVar209,auVar209,1);
            auVar209 = vmaxss_avx(auVar209,auVar225);
            local_9c0 = auVar209._0_4_ * 1.9073486e-06;
            local_8a0._0_4_ = fVar318 * 1.9073486e-06;
            local_8e0._0_16_ = vshufps_avx(auVar206,auVar206,0xff);
            auVar209 = vinsertps_avx(ZEXT416(uVar97),ZEXT416((uint)fVar317),0x10);
            auVar246 = ZEXT1664(auVar209);
            lVar94 = 5;
            do {
              do {
                auVar209 = auVar246._0_16_;
                bVar100 = lVar94 == 0;
                lVar94 = lVar94 + -1;
                auVar346 = auVar348._0_32_;
                if (bVar100) goto LAB_00a0ba2f;
                auVar225 = vshufps_avx(auVar209,auVar209,0);
                auVar108._0_4_ = auVar225._0_4_ * (float)local_9f0._0_4_ + 0.0;
                auVar108._4_4_ = auVar225._4_4_ * (float)local_9f0._4_4_ + 0.0;
                auVar108._8_4_ = auVar225._8_4_ * fStack_9e8 + 0.0;
                auVar108._12_4_ = auVar225._12_4_ * fStack_9e4 + 0.0;
                auVar225 = vmovshdup_avx(auVar209);
                fVar247 = auVar225._0_4_;
                fVar320 = 1.0 - fVar247;
                fVar318 = fVar247 * 3.0;
                fVar317 = fVar318 + -5.0;
                fVar319 = fVar320 * fVar320;
                auVar225 = ZEXT416((uint)(fVar247 * fVar247 * -fVar320 * 0.5));
                auVar225 = vshufps_avx(auVar225,auVar225,0);
                auVar206 = ZEXT416((uint)((fVar319 * (fVar320 * 3.0 + -5.0) + 2.0) * 0.5));
                auVar206 = vshufps_avx(auVar206,auVar206,0);
                auVar105 = ZEXT416((uint)((fVar247 * fVar247 * fVar317 + 2.0) * 0.5));
                auVar105 = vshufps_avx(auVar105,auVar105,0);
                auVar137 = ZEXT416((uint)(fVar320 * fVar320 * -fVar247 * 0.5));
                auVar137 = vshufps_avx(auVar137,auVar137,0);
                auVar183._0_4_ =
                     auVar137._0_4_ * (float)local_b20._0_4_ +
                     auVar105._0_4_ * (float)local_b40._0_4_ +
                     auVar206._0_4_ * (float)local_b30._0_4_ +
                     auVar225._0_4_ * (float)local_b50._0_4_;
                auVar183._4_4_ =
                     auVar137._4_4_ * (float)local_b20._4_4_ +
                     auVar105._4_4_ * (float)local_b40._4_4_ +
                     auVar206._4_4_ * (float)local_b30._4_4_ +
                     auVar225._4_4_ * (float)local_b50._4_4_;
                auVar183._8_4_ =
                     auVar137._8_4_ * fStack_b18 +
                     auVar105._8_4_ * fStack_b38 +
                     auVar206._8_4_ * fStack_b28 + auVar225._8_4_ * fStack_b48;
                auVar183._12_4_ =
                     auVar137._12_4_ * fStack_b14 +
                     auVar105._12_4_ * fStack_b34 +
                     auVar206._12_4_ * fStack_b24 + auVar225._12_4_ * fStack_b44;
                _local_a80 = auVar183;
                auVar225 = vsubps_avx(auVar108,auVar183);
                _local_ae0 = auVar225;
                auVar225 = vdpps_avx(auVar225,auVar225,0x7f);
                fVar321 = auVar225._0_4_;
                if (fVar321 < 0.0) {
                  local_a20._0_4_ = fVar247 * 9.0;
                  local_a40._0_4_ = fVar317;
                  local_a60._0_4_ = fVar319;
                  local_8c0._0_4_ = fVar320 * -2.0;
                  fVar260 = sqrtf(fVar321);
                  fVar317 = (float)local_a40._0_4_;
                  fVar262 = (float)local_a20._0_4_;
                  fVar261 = (float)local_8c0._0_4_;
                  fVar319 = (float)local_a60._0_4_;
                }
                else {
                  auVar206 = vsqrtss_avx(auVar225,auVar225);
                  fVar260 = auVar206._0_4_;
                  fVar262 = fVar247 * 9.0;
                  fVar261 = fVar320 * -2.0;
                }
                auVar206 = ZEXT416((uint)((fVar247 * fVar247 + fVar247 * fVar261) * 0.5));
                auVar206 = vshufps_avx(auVar206,auVar206,0);
                auVar105 = ZEXT416((uint)(((fVar320 + fVar320) * (fVar318 + 2.0) +
                                          fVar320 * fVar320 * -3.0) * 0.5));
                auVar105 = vshufps_avx(auVar105,auVar105,0);
                auVar137 = ZEXT416((uint)((fVar317 * (fVar247 + fVar247) + fVar247 * fVar318) * 0.5)
                                  );
                auVar137 = vshufps_avx(auVar137,auVar137,0);
                auVar138 = ZEXT416((uint)((fVar247 * (fVar320 + fVar320) - fVar319) * 0.5));
                auVar138 = vshufps_avx(auVar138,auVar138,0);
                auVar359._0_4_ =
                     (float)local_b20._0_4_ * auVar138._0_4_ +
                     (float)local_b40._0_4_ * auVar137._0_4_ +
                     (float)local_b50._0_4_ * auVar206._0_4_ +
                     (float)local_b30._0_4_ * auVar105._0_4_;
                auVar359._4_4_ =
                     (float)local_b20._4_4_ * auVar138._4_4_ +
                     (float)local_b40._4_4_ * auVar137._4_4_ +
                     (float)local_b50._4_4_ * auVar206._4_4_ +
                     (float)local_b30._4_4_ * auVar105._4_4_;
                auVar359._8_4_ =
                     fStack_b18 * auVar138._8_4_ +
                     fStack_b38 * auVar137._8_4_ +
                     fStack_b48 * auVar206._8_4_ + fStack_b28 * auVar105._8_4_;
                auVar359._12_4_ =
                     fStack_b14 * auVar138._12_4_ +
                     fStack_b34 * auVar137._12_4_ +
                     fStack_b44 * auVar206._12_4_ + fStack_b24 * auVar105._12_4_;
                auVar138 = vpermilps_avx(ZEXT416((uint)(fVar318 + -1.0)),0);
                auVar3 = vpermilps_avx(ZEXT416((uint)(fVar247 * -9.0 + 4.0)),0);
                auVar206 = vshufps_avx(ZEXT416((uint)(fVar262 + -5.0)),
                                       ZEXT416((uint)(fVar262 + -5.0)),0);
                auVar105 = ZEXT416((uint)(fVar247 * -3.0 + 2.0));
                auVar137 = vshufps_avx(auVar105,auVar105,0);
                auVar105 = vdpps_avx(auVar359,auVar359,0x7f);
                auVar143._0_4_ =
                     (float)local_b20._0_4_ * auVar137._0_4_ +
                     (float)local_b40._0_4_ * auVar206._0_4_ +
                     (float)local_b30._0_4_ * auVar3._0_4_ + (float)local_b50._0_4_ * auVar138._0_4_
                ;
                auVar143._4_4_ =
                     (float)local_b20._4_4_ * auVar137._4_4_ +
                     (float)local_b40._4_4_ * auVar206._4_4_ +
                     (float)local_b30._4_4_ * auVar3._4_4_ + (float)local_b50._4_4_ * auVar138._4_4_
                ;
                auVar143._8_4_ =
                     fStack_b18 * auVar137._8_4_ +
                     fStack_b38 * auVar206._8_4_ +
                     fStack_b28 * auVar3._8_4_ + fStack_b48 * auVar138._8_4_;
                auVar143._12_4_ =
                     fStack_b14 * auVar137._12_4_ +
                     fStack_b34 * auVar206._12_4_ +
                     fStack_b24 * auVar3._12_4_ + fStack_b44 * auVar138._12_4_;
                auVar206 = vblendps_avx(auVar105,_DAT_01f45a50,0xe);
                auVar137 = vrsqrtss_avx(auVar206,auVar206);
                fVar318 = auVar137._0_4_;
                fVar317 = auVar105._0_4_;
                auVar137 = vdpps_avx(auVar359,auVar143,0x7f);
                auVar138 = vshufps_avx(auVar105,auVar105,0);
                auVar144._0_4_ = auVar143._0_4_ * auVar138._0_4_;
                auVar144._4_4_ = auVar143._4_4_ * auVar138._4_4_;
                auVar144._8_4_ = auVar143._8_4_ * auVar138._8_4_;
                auVar144._12_4_ = auVar143._12_4_ * auVar138._12_4_;
                auVar137 = vshufps_avx(auVar137,auVar137,0);
                auVar230._0_4_ = auVar359._0_4_ * auVar137._0_4_;
                auVar230._4_4_ = auVar359._4_4_ * auVar137._4_4_;
                auVar230._8_4_ = auVar359._8_4_ * auVar137._8_4_;
                auVar230._12_4_ = auVar359._12_4_ * auVar137._12_4_;
                auVar3 = vsubps_avx(auVar144,auVar230);
                auVar137 = vrcpss_avx(auVar206,auVar206);
                auVar206 = vmaxss_avx(ZEXT416((uint)local_9c0),
                                      ZEXT416((uint)(auVar246._0_4_ * (float)local_8a0._0_4_)));
                auVar137 = ZEXT416((uint)(auVar137._0_4_ * (2.0 - fVar317 * auVar137._0_4_)));
                auVar137 = vshufps_avx(auVar137,auVar137,0);
                uVar98 = CONCAT44(auVar359._4_4_,auVar359._0_4_);
                auVar251._0_8_ = uVar98 ^ 0x8000000080000000;
                auVar251._8_4_ = -auVar359._8_4_;
                auVar251._12_4_ = -auVar359._12_4_;
                auVar138 = ZEXT416((uint)(fVar318 * 1.5 +
                                         fVar317 * -0.5 * fVar318 * fVar318 * fVar318));
                auVar138 = vshufps_avx(auVar138,auVar138,0);
                auVar213._0_4_ = auVar138._0_4_ * auVar3._0_4_ * auVar137._0_4_;
                auVar213._4_4_ = auVar138._4_4_ * auVar3._4_4_ * auVar137._4_4_;
                auVar213._8_4_ = auVar138._8_4_ * auVar3._8_4_ * auVar137._8_4_;
                auVar213._12_4_ = auVar138._12_4_ * auVar3._12_4_ * auVar137._12_4_;
                auVar275._0_4_ = auVar359._0_4_ * auVar138._0_4_;
                auVar275._4_4_ = auVar359._4_4_ * auVar138._4_4_;
                auVar275._8_4_ = auVar359._8_4_ * auVar138._8_4_;
                auVar275._12_4_ = auVar359._12_4_ * auVar138._12_4_;
                if (fVar317 < 0.0) {
                  fVar317 = sqrtf(fVar317);
                }
                else {
                  auVar105 = vsqrtss_avx(auVar105,auVar105);
                  fVar317 = auVar105._0_4_;
                }
                auVar105 = vdpps_avx(_local_ae0,auVar275,0x7f);
                fVar317 = (local_9c0 / fVar317) * (fVar260 + 1.0) +
                          auVar206._0_4_ + fVar260 * local_9c0;
                auVar137 = vdpps_avx(auVar251,auVar275,0x7f);
                auVar138 = vdpps_avx(_local_ae0,auVar213,0x7f);
                auVar3 = vdpps_avx(_local_9f0,auVar275,0x7f);
                auVar4 = vdpps_avx(_local_ae0,auVar251,0x7f);
                fVar318 = auVar137._0_4_ + auVar138._0_4_;
                fVar319 = auVar105._0_4_;
                auVar109._0_4_ = fVar319 * fVar319;
                auVar109._4_4_ = auVar105._4_4_ * auVar105._4_4_;
                auVar109._8_4_ = auVar105._8_4_ * auVar105._8_4_;
                auVar109._12_4_ = auVar105._12_4_ * auVar105._12_4_;
                auVar138 = vsubps_avx(auVar225,auVar109);
                auVar137 = vdpps_avx(_local_ae0,_local_9f0,0x7f);
                fVar320 = auVar4._0_4_ - fVar319 * fVar318;
                fVar247 = auVar137._0_4_ - fVar319 * auVar3._0_4_;
                auVar137 = vrsqrtss_avx(auVar138,auVar138);
                fVar260 = auVar138._0_4_;
                fVar319 = auVar137._0_4_;
                fVar319 = fVar319 * 1.5 + fVar260 * -0.5 * fVar319 * fVar319 * fVar319;
                if (fVar260 < 0.0) {
                  local_a20._0_4_ = fVar320;
                  local_a40._0_4_ = fVar247;
                  local_a60._0_4_ = fVar319;
                  fVar260 = sqrtf(fVar260);
                  fVar319 = (float)local_a60._0_4_;
                  fVar320 = (float)local_a20._0_4_;
                  fVar247 = (float)local_a40._0_4_;
                }
                else {
                  auVar137 = vsqrtss_avx(auVar138,auVar138);
                  fVar260 = auVar137._0_4_;
                }
                auVar348 = ZEXT3264(auVar403);
                auVar364 = ZEXT3264(local_aa0);
                auVar314 = ZEXT1664(auVar359);
                auVar4 = vpermilps_avx(_local_a80,0xff);
                auVar102 = vshufps_avx(auVar359,auVar359,0xff);
                fVar320 = fVar320 * fVar319 - auVar102._0_4_;
                auVar231._0_8_ = auVar3._0_8_ ^ 0x8000000080000000;
                auVar231._8_4_ = auVar3._8_4_ ^ 0x80000000;
                auVar231._12_4_ = auVar3._12_4_ ^ 0x80000000;
                auVar252._0_4_ = -fVar320;
                auVar252._4_4_ = 0x80000000;
                auVar252._8_4_ = 0x80000000;
                auVar252._12_4_ = 0x80000000;
                auVar137 = vinsertps_avx(auVar252,ZEXT416((uint)(fVar247 * fVar319)),0x1c);
                auVar3 = vmovsldup_avx(ZEXT416((uint)(fVar318 * fVar247 * fVar319 -
                                                     auVar3._0_4_ * fVar320)));
                auVar137 = vdivps_avx(auVar137,auVar3);
                auVar138 = vinsertps_avx(ZEXT416((uint)fVar318),auVar231,0x10);
                auVar138 = vdivps_avx(auVar138,auVar3);
                auVar3 = vmovsldup_avx(auVar105);
                auVar107 = ZEXT416((uint)(fVar260 - auVar4._0_4_));
                auVar4 = vmovsldup_avx(auVar107);
                auVar184._0_4_ = auVar3._0_4_ * auVar137._0_4_ + auVar4._0_4_ * auVar138._0_4_;
                auVar184._4_4_ = auVar3._4_4_ * auVar137._4_4_ + auVar4._4_4_ * auVar138._4_4_;
                auVar184._8_4_ = auVar3._8_4_ * auVar137._8_4_ + auVar4._8_4_ * auVar138._8_4_;
                auVar184._12_4_ = auVar3._12_4_ * auVar137._12_4_ + auVar4._12_4_ * auVar138._12_4_;
                auVar137 = vsubps_avx(auVar209,auVar184);
                auVar246 = ZEXT1664(auVar137);
                auVar185._8_4_ = 0x7fffffff;
                auVar185._0_8_ = 0x7fffffff7fffffff;
                auVar185._12_4_ = 0x7fffffff;
                auVar209 = vandps_avx(auVar105,auVar185);
              } while (fVar317 <= auVar209._0_4_);
              auVar214._8_4_ = 0x7fffffff;
              auVar214._0_8_ = 0x7fffffff7fffffff;
              auVar214._12_4_ = 0x7fffffff;
              auVar209 = vandps_avx(auVar107,auVar214);
            } while ((float)local_8e0._0_4_ * 1.9073486e-06 + auVar206._0_4_ + fVar317 <=
                     auVar209._0_4_);
            fVar317 = auVar137._0_4_ + (float)local_9a0._0_4_;
            auVar346 = auVar403;
            if ((fVar309 <= fVar317) &&
               (fVar318 = *(float *)(ray + k * 4 + 0x100), fVar317 <= fVar318)) {
              auVar209 = vmovshdup_avx(auVar137);
              fVar319 = auVar209._0_4_;
              if ((0.0 <= fVar319) && (fVar319 <= 1.0)) {
                auVar209 = vrsqrtss_avx(auVar225,auVar225);
                fVar320 = auVar209._0_4_;
                pGVar6 = (context->scene->geometries).items[uVar92].ptr;
                if ((pGVar6->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
                  auVar209 = ZEXT416((uint)(fVar320 * 1.5 +
                                           fVar321 * -0.5 * fVar320 * fVar320 * fVar320));
                  auVar209 = vshufps_avx(auVar209,auVar209,0);
                  auVar215._0_4_ = auVar209._0_4_ * (float)local_ae0._0_4_;
                  auVar215._4_4_ = auVar209._4_4_ * (float)local_ae0._4_4_;
                  auVar215._8_4_ = auVar209._8_4_ * fStack_ad8;
                  auVar215._12_4_ = auVar209._12_4_ * fStack_ad4;
                  auVar145._0_4_ = auVar359._0_4_ + auVar102._0_4_ * auVar215._0_4_;
                  auVar145._4_4_ = auVar359._4_4_ + auVar102._4_4_ * auVar215._4_4_;
                  auVar145._8_4_ = auVar359._8_4_ + auVar102._8_4_ * auVar215._8_4_;
                  auVar145._12_4_ = auVar359._12_4_ + auVar102._12_4_ * auVar215._12_4_;
                  auVar209 = vshufps_avx(auVar215,auVar215,0xc9);
                  auVar225 = vshufps_avx(auVar359,auVar359,0xc9);
                  auVar216._0_4_ = auVar225._0_4_ * auVar215._0_4_;
                  auVar216._4_4_ = auVar225._4_4_ * auVar215._4_4_;
                  auVar216._8_4_ = auVar225._8_4_ * auVar215._8_4_;
                  auVar216._12_4_ = auVar225._12_4_ * auVar215._12_4_;
                  auVar232._0_4_ = auVar359._0_4_ * auVar209._0_4_;
                  auVar232._4_4_ = auVar359._4_4_ * auVar209._4_4_;
                  auVar232._8_4_ = auVar359._8_4_ * auVar209._8_4_;
                  auVar232._12_4_ = auVar359._12_4_ * auVar209._12_4_;
                  auVar206 = vsubps_avx(auVar232,auVar216);
                  auVar209 = vshufps_avx(auVar206,auVar206,0xc9);
                  auVar225 = vshufps_avx(auVar145,auVar145,0xc9);
                  auVar233._0_4_ = auVar225._0_4_ * auVar209._0_4_;
                  auVar233._4_4_ = auVar225._4_4_ * auVar209._4_4_;
                  auVar233._8_4_ = auVar225._8_4_ * auVar209._8_4_;
                  auVar233._12_4_ = auVar225._12_4_ * auVar209._12_4_;
                  auVar209 = vshufps_avx(auVar206,auVar206,0xd2);
                  auVar146._0_4_ = auVar145._0_4_ * auVar209._0_4_;
                  auVar146._4_4_ = auVar145._4_4_ * auVar209._4_4_;
                  auVar146._8_4_ = auVar145._8_4_ * auVar209._8_4_;
                  auVar146._12_4_ = auVar145._12_4_ * auVar209._12_4_;
                  auVar209 = vsubps_avx(auVar233,auVar146);
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (pGVar6->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                    *(float *)(ray + k * 4 + 0x100) = fVar317;
                    uVar1 = vextractps_avx(auVar209,1);
                    *(undefined4 *)(ray + k * 4 + 0x180) = uVar1;
                    uVar1 = vextractps_avx(auVar209,2);
                    *(undefined4 *)(ray + k * 4 + 0x1a0) = uVar1;
                    *(int *)(ray + k * 4 + 0x1c0) = auVar209._0_4_;
                    *(float *)(ray + k * 4 + 0x1e0) = fVar319;
                    *(undefined4 *)(ray + k * 4 + 0x200) = 0;
                    *(int *)(ray + k * 4 + 0x220) = (int)local_980;
                    *(uint *)(ray + k * 4 + 0x240) = uVar92;
                    *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
                    *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
                  }
                  else {
                    pRVar9 = context->user;
                    auStack_710 = vshufps_avx(auVar137,auVar137,0x55);
                    auStack_770 = vshufps_avx(auVar209,auVar209,0x55);
                    auStack_750 = vshufps_avx(auVar209,auVar209,0xaa);
                    auStack_730 = vshufps_avx(auVar209,auVar209,0);
                    local_780 = (RTCHitN  [16])auStack_770;
                    local_760 = auStack_750;
                    local_740 = auStack_730;
                    local_720 = auStack_710;
                    local_700 = ZEXT832(0) << 0x20;
                    local_6e0 = local_600._0_8_;
                    uStack_6d8 = local_600._8_8_;
                    uStack_6d0 = local_600._16_8_;
                    uStack_6c8 = local_600._24_8_;
                    local_6c0 = local_5e0;
                    auVar110 = vcmpps_avx(local_5e0,local_5e0,0xf);
                    local_aa8[1] = auVar110;
                    *local_aa8 = auVar110;
                    local_6a0 = pRVar9->instID[0];
                    uStack_69c = local_6a0;
                    uStack_698 = local_6a0;
                    uStack_694 = local_6a0;
                    uStack_690 = local_6a0;
                    uStack_68c = local_6a0;
                    uStack_688 = local_6a0;
                    uStack_684 = local_6a0;
                    local_680 = pRVar9->instPrimID[0];
                    uStack_67c = local_680;
                    uStack_678 = local_680;
                    uStack_674 = local_680;
                    uStack_670 = local_680;
                    uStack_66c = local_680;
                    uStack_668 = local_680;
                    uStack_664 = local_680;
                    *(float *)(ray + k * 4 + 0x100) = fVar317;
                    local_b80 = *local_ab0;
                    local_b70 = *local_ab8;
                    local_b10.valid = (int *)local_b80;
                    local_b10.geometryUserPtr = pGVar6->userPtr;
                    local_b10.context = context->user;
                    local_b10.hit = local_780;
                    local_b10.N = 8;
                    local_b10.ray = (RTCRayN *)ray;
                    if (pGVar6->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                      auVar314 = ZEXT1664(auVar359);
                      (*pGVar6->intersectionFilterN)(&local_b10);
                      auVar364 = ZEXT3264(local_aa0);
                    }
                    auVar209 = vpcmpeqd_avx(local_b80,ZEXT816(0) << 0x40);
                    auVar225 = vpcmpeqd_avx(local_b70,ZEXT816(0) << 0x40);
                    auVar194._16_16_ = auVar225;
                    auVar194._0_16_ = auVar209;
                    auVar110 = _DAT_01f7b020 & ~auVar194;
                    if ((((((((auVar110 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                             (auVar110 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                            (auVar110 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                           SUB321(auVar110 >> 0x7f,0) != '\0') ||
                          (auVar110 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                         SUB321(auVar110 >> 0xbf,0) != '\0') ||
                        (auVar110 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                        auVar110[0x1f] < '\0') {
                      p_Var7 = context->args->filter;
                      if ((p_Var7 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar6->field_8).field_0x2 & 0x40) != 0)))) {
                        auVar314 = ZEXT1664(auVar314._0_16_);
                        (*p_Var7)(&local_b10);
                        auVar364 = ZEXT3264(local_aa0);
                      }
                      auVar209 = vpcmpeqd_avx(local_b80,ZEXT816(0) << 0x40);
                      auVar225 = vpcmpeqd_avx(local_b70,ZEXT816(0) << 0x40);
                      auVar126._16_16_ = auVar225;
                      auVar126._0_16_ = auVar209;
                      auVar110 = _DAT_01f7b020 & ~auVar126;
                      if ((((((((auVar110 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                               || (auVar110 >> 0x3f & (undefined1  [32])0x1) !=
                                  (undefined1  [32])0x0) ||
                              (auVar110 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0)
                             || SUB321(auVar110 >> 0x7f,0) != '\0') ||
                            (auVar110 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                           SUB321(auVar110 >> 0xbf,0) != '\0') ||
                          (auVar110 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                          auVar110[0x1f] < '\0') {
                        auVar127._0_8_ = auVar209._0_8_ ^ 0xffffffffffffffff;
                        auVar127._8_4_ = auVar209._8_4_ ^ 0xffffffff;
                        auVar127._12_4_ = auVar209._12_4_ ^ 0xffffffff;
                        auVar127._16_4_ = auVar225._0_4_ ^ 0xffffffff;
                        auVar127._20_4_ = auVar225._4_4_ ^ 0xffffffff;
                        auVar127._24_4_ = auVar225._8_4_ ^ 0xffffffff;
                        auVar127._28_4_ = auVar225._12_4_ ^ 0xffffffff;
                        auVar110 = vmaskmovps_avx(auVar127,*(undefined1 (*) [32])local_b10.hit);
                        *(undefined1 (*) [32])(local_b10.ray + 0x180) = auVar110;
                        auVar110 = vmaskmovps_avx(auVar127,*(undefined1 (*) [32])
                                                            (local_b10.hit + 0x20));
                        *(undefined1 (*) [32])(local_b10.ray + 0x1a0) = auVar110;
                        auVar110 = vmaskmovps_avx(auVar127,*(undefined1 (*) [32])
                                                            (local_b10.hit + 0x40));
                        *(undefined1 (*) [32])(local_b10.ray + 0x1c0) = auVar110;
                        auVar110 = vmaskmovps_avx(auVar127,*(undefined1 (*) [32])
                                                            (local_b10.hit + 0x60));
                        *(undefined1 (*) [32])(local_b10.ray + 0x1e0) = auVar110;
                        auVar110 = vmaskmovps_avx(auVar127,*(undefined1 (*) [32])
                                                            (local_b10.hit + 0x80));
                        *(undefined1 (*) [32])(local_b10.ray + 0x200) = auVar110;
                        auVar110 = vmaskmovps_avx(auVar127,*(undefined1 (*) [32])
                                                            (local_b10.hit + 0xa0));
                        *(undefined1 (*) [32])(local_b10.ray + 0x220) = auVar110;
                        auVar110 = vmaskmovps_avx(auVar127,*(undefined1 (*) [32])
                                                            (local_b10.hit + 0xc0));
                        *(undefined1 (*) [32])(local_b10.ray + 0x240) = auVar110;
                        auVar110 = vmaskmovps_avx(auVar127,*(undefined1 (*) [32])
                                                            (local_b10.hit + 0xe0));
                        *(undefined1 (*) [32])(local_b10.ray + 0x260) = auVar110;
                        auVar110 = vmaskmovps_avx(auVar127,*(undefined1 (*) [32])
                                                            (local_b10.hit + 0x100));
                        *(undefined1 (*) [32])(local_b10.ray + 0x280) = auVar110;
                        goto LAB_00a0ba2f;
                      }
                    }
                    *(float *)(ray + k * 4 + 0x100) = fVar318;
                  }
                }
              }
            }
LAB_00a0ba2f:
            uVar1 = *(undefined4 *)(ray + k * 4 + 0x100);
            auVar329._4_4_ = uVar1;
            auVar329._0_4_ = uVar1;
            auVar329._8_4_ = uVar1;
            auVar329._12_4_ = uVar1;
            auVar329._16_4_ = uVar1;
            auVar329._20_4_ = uVar1;
            auVar329._24_4_ = uVar1;
            auVar329._28_4_ = uVar1;
            auVar246 = ZEXT3264(auVar329);
            auVar110 = vcmpps_avx(_local_900,auVar329,2);
            auVar110 = vandps_avx(auVar110,local_460);
            auVar129 = auVar377;
          }
          auVar110 = vandps_avx(local_7e0,local_7c0);
          auVar129 = vandps_avx(local_940,_local_920);
          auVar195._0_4_ = (float)local_9e0._0_4_ + local_420._0_4_;
          auVar195._4_4_ = (float)local_9e0._4_4_ + local_420._4_4_;
          auVar195._8_4_ = fStack_9d8 + local_420._8_4_;
          auVar195._12_4_ = fStack_9d4 + local_420._12_4_;
          auVar195._16_4_ = fStack_9d0 + local_420._16_4_;
          auVar195._20_4_ = fStack_9cc + local_420._20_4_;
          auVar195._24_4_ = fStack_9c8 + local_420._24_4_;
          auVar195._28_4_ = fStack_9c4 + local_420._28_4_;
          auVar209 = vshufps_avx(auVar246._0_16_,auVar246._0_16_,0);
          auVar244._16_16_ = auVar209;
          auVar244._0_16_ = auVar209;
          auVar346 = vcmpps_avx(auVar195,auVar244,2);
          auVar110 = vandps_avx(auVar346,auVar110);
          auVar258._0_4_ = (float)local_9e0._0_4_ + local_3e0._0_4_;
          auVar258._4_4_ = (float)local_9e0._4_4_ + local_3e0._4_4_;
          auVar258._8_4_ = fStack_9d8 + local_3e0._8_4_;
          auVar258._12_4_ = fStack_9d4 + local_3e0._12_4_;
          auVar258._16_4_ = fStack_9d0 + local_3e0._16_4_;
          auVar258._20_4_ = fStack_9cc + local_3e0._20_4_;
          auVar258._24_4_ = fStack_9c8 + local_3e0._24_4_;
          auVar258._28_4_ = fStack_9c4 + local_3e0._28_4_;
          auVar346 = vcmpps_avx(auVar258,auVar244,2);
          auVar129 = vandps_avx(auVar346,auVar129);
          auVar129 = vorps_avx(auVar110,auVar129);
          if ((((((((auVar129 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar129 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar129 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar129 >> 0x7f,0) != '\0') ||
                (auVar129 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar129 >> 0xbf,0) != '\0') ||
              (auVar129 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar129[0x1f] < '\0') {
            *(undefined1 (*) [32])(auStack_180 + uVar96 * 0x60) = auVar129;
            auVar110 = vblendvps_avx(_local_3e0,_local_420,auVar110);
            *(undefined1 (*) [32])(auStack_160 + uVar96 * 0x60) = auVar110;
            uVar98 = vmovlps_avx(local_790);
            (&uStack_140)[uVar96 * 0xc] = uVar98;
            auStack_138[uVar96 * 0x18] = local_d24 + 1;
            uVar96 = (ulong)((int)uVar96 + 1);
          }
          auVar246 = ZEXT3264(CONCAT428(0x3f800000,
                                        CONCAT424(0x3f800000,
                                                  CONCAT420(0x3f800000,
                                                            CONCAT416(0x3f800000,
                                                                      CONCAT412(0x3f800000,
                                                                                CONCAT48(0x3f800000,
                                                                                                                                                                                  
                                                  0x3f8000003f800000)))))));
          fVar134 = (float)local_9e0._0_4_;
          fVar165 = (float)local_9e0._4_4_;
          fVar168 = fStack_9d8;
          fVar171 = fStack_9d4;
          fVar173 = fStack_9d0;
          fVar175 = fStack_9cc;
          fVar177 = fStack_9c8;
          fVar271 = fStack_9c4;
        }
      }
    }
    while( true ) {
      uVar97 = (uint)uVar96;
      if (uVar97 == 0) {
        uVar1 = *(undefined4 *)(ray + k * 4 + 0x100);
        auVar130._4_4_ = uVar1;
        auVar130._0_4_ = uVar1;
        auVar130._8_4_ = uVar1;
        auVar130._12_4_ = uVar1;
        auVar130._16_4_ = uVar1;
        auVar130._20_4_ = uVar1;
        auVar130._24_4_ = uVar1;
        auVar130._28_4_ = uVar1;
        auVar110 = vcmpps_avx(local_340,auVar130,2);
        uVar92 = vmovmskps_avx(auVar110);
        uVar92 = (uint)uVar99 & uVar92;
        goto LAB_00a09098;
      }
      uVar96 = (ulong)(uVar97 - 1);
      lVar94 = uVar96 * 0x60;
      auVar110 = *(undefined1 (*) [32])(auStack_160 + lVar94);
      auVar128._0_4_ = fVar134 + auVar110._0_4_;
      auVar128._4_4_ = fVar165 + auVar110._4_4_;
      auVar128._8_4_ = fVar168 + auVar110._8_4_;
      auVar128._12_4_ = fVar171 + auVar110._12_4_;
      auVar128._16_4_ = fVar173 + auVar110._16_4_;
      auVar128._20_4_ = fVar175 + auVar110._20_4_;
      auVar128._24_4_ = fVar177 + auVar110._24_4_;
      auVar128._28_4_ = fVar271 + auVar110._28_4_;
      uVar1 = *(undefined4 *)(ray + k * 4 + 0x100);
      auVar222._4_4_ = uVar1;
      auVar222._0_4_ = uVar1;
      auVar222._8_4_ = uVar1;
      auVar222._12_4_ = uVar1;
      auVar222._16_4_ = uVar1;
      auVar222._20_4_ = uVar1;
      auVar222._24_4_ = uVar1;
      auVar222._28_4_ = uVar1;
      auVar346 = vcmpps_avx(auVar128,auVar222,2);
      auVar129 = vandps_avx(auVar346,*(undefined1 (*) [32])(auStack_180 + lVar94));
      _local_780 = auVar129;
      auVar346 = *(undefined1 (*) [32])(auStack_180 + lVar94) & auVar346;
      if ((((((((auVar346 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar346 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar346 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar346 >> 0x7f,0) != '\0') ||
            (auVar346 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar346 >> 0xbf,0) != '\0') ||
          (auVar346 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar346[0x1f] < '\0') break;
      uVar96 = (ulong)(uVar97 - 1);
    }
    auVar196._8_4_ = 0x7f800000;
    auVar196._0_8_ = 0x7f8000007f800000;
    auVar196._12_4_ = 0x7f800000;
    auVar196._16_4_ = 0x7f800000;
    auVar196._20_4_ = 0x7f800000;
    auVar196._24_4_ = 0x7f800000;
    auVar196._28_4_ = 0x7f800000;
    auVar110 = vblendvps_avx(auVar196,auVar110,auVar129);
    auVar346 = vshufps_avx(auVar110,auVar110,0xb1);
    auVar346 = vminps_avx(auVar110,auVar346);
    auVar11 = vshufpd_avx(auVar346,auVar346,5);
    auVar346 = vminps_avx(auVar346,auVar11);
    auVar11 = vperm2f128_avx(auVar346,auVar346,1);
    auVar346 = vminps_avx(auVar346,auVar11);
    auVar110 = vcmpps_avx(auVar110,auVar346,0);
    auVar346 = auVar129 & auVar110;
    if ((((((((auVar346 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar346 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar346 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar346 >> 0x7f,0) != '\0') ||
          (auVar346 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar346 >> 0xbf,0) != '\0') ||
        (auVar346 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
        auVar346[0x1f] < '\0') {
      auVar129 = vandps_avx(auVar110,auVar129);
    }
    auVar147._8_8_ = 0;
    auVar147._0_8_ = (&uStack_140)[uVar96 * 0xc];
    local_d24 = auStack_138[uVar96 * 0x18];
    uVar95 = vmovmskps_avx(auVar129);
    uVar93 = 0;
    if (uVar95 != 0) {
      for (; (uVar95 >> uVar93 & 1) == 0; uVar93 = uVar93 + 1) {
      }
    }
    *(undefined4 *)(local_780 + (ulong)uVar93 * 4) = 0;
    *(undefined1 (*) [32])(auStack_180 + lVar94) = _local_780;
    uVar95 = uVar97 - 1;
    if ((((((((_local_780 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (_local_780 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (_local_780 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(_local_780 >> 0x7f,0) != '\0') ||
          (_local_780 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(_local_780 >> 0xbf,0) != '\0') ||
        (_local_780 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
        local_780[0x1f] < '\0') {
      uVar95 = uVar97;
    }
    auVar209 = vshufps_avx(auVar147,auVar147,0);
    auVar225 = vshufps_avx(auVar147,auVar147,0x55);
    auVar225 = vsubps_avx(auVar225,auVar209);
    local_420._4_4_ = auVar209._4_4_ + auVar225._4_4_ * 0.14285715;
    local_420._0_4_ = auVar209._0_4_ + auVar225._0_4_ * 0.0;
    fStack_418 = auVar209._8_4_ + auVar225._8_4_ * 0.2857143;
    fStack_414 = auVar209._12_4_ + auVar225._12_4_ * 0.42857146;
    fStack_410 = auVar209._0_4_ + auVar225._0_4_ * 0.5714286;
    fStack_40c = auVar209._4_4_ + auVar225._4_4_ * 0.71428573;
    fStack_408 = auVar209._8_4_ + auVar225._8_4_ * 0.8571429;
    fStack_404 = auVar209._12_4_ + auVar225._12_4_;
    local_790._8_8_ = 0;
    local_790._0_8_ = *(ulong *)(local_420 + (ulong)uVar93 * 4);
    uVar96 = (ulong)uVar95;
    auVar110 = auVar348._0_32_;
  } while( true );
}

Assistant:

static __forceinline void intersect_t(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID));

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }

          Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }